

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float fVar7;
  undefined4 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  Primitive PVar18;
  Geometry *pGVar19;
  __int_type_conflict _Var20;
  long lVar21;
  long lVar22;
  RTCRayQueryContext *pRVar23;
  RTCFilterFunctionN p_Var24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  ulong uVar97;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  byte bVar105;
  uint uVar106;
  ulong uVar107;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  long lVar108;
  uint uVar109;
  uint uVar110;
  long lVar111;
  ulong uVar112;
  byte bVar113;
  bool bVar114;
  float fVar115;
  float fVar139;
  float fVar140;
  __m128 a;
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  float fVar141;
  float fVar176;
  float fVar180;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar142;
  float fVar143;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  float fVar187;
  float fVar189;
  float fVar191;
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  float fVar177;
  float fVar181;
  float fVar184;
  undefined1 auVar163 [32];
  float fVar178;
  float fVar182;
  float fVar185;
  undefined1 auVar164 [32];
  float fVar179;
  float fVar183;
  float fVar186;
  float fVar188;
  float fVar190;
  float fVar192;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar193;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  float fVar216;
  float fVar217;
  float fVar219;
  float fVar220;
  float fVar221;
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar218;
  float fVar222;
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar223;
  float fVar245;
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  float fVar243;
  float fVar244;
  float fVar246;
  float fVar247;
  undefined1 auVar237 [32];
  float fVar248;
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar249;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar264 [64];
  float fVar271;
  float fVar288;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [28];
  float fVar286;
  float fVar287;
  float fVar289;
  float fVar290;
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  float fVar291;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  float fVar292;
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  float fVar304;
  float fVar308;
  undefined1 auVar296 [28];
  float fVar302;
  float fVar303;
  float fVar305;
  float fVar306;
  undefined1 auVar297 [32];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  float fVar307;
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  float fVar309;
  undefined1 auVar310 [16];
  undefined1 auVar311 [28];
  float fVar318;
  float fVar319;
  float fVar321;
  float fVar322;
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  float fVar320;
  float fVar323;
  float fVar324;
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  undefined1 auVar327 [32];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  undefined1 auVar332 [64];
  float s;
  float fVar343;
  float fVar344;
  undefined1 auVar334 [16];
  float fVar348;
  float fVar351;
  float fVar354;
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  float fVar333;
  undefined1 auVar338 [32];
  float fVar345;
  float fVar346;
  float fVar347;
  float fVar349;
  float fVar350;
  float fVar352;
  float fVar353;
  float fVar355;
  float fVar356;
  float fVar357;
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [64];
  float fVar358;
  float fVar369;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  float fVar375;
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [64];
  float fVar376;
  float fVar377;
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  float fVar388;
  float fVar389;
  float fVar391;
  float fVar392;
  float fVar393;
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  float fVar390;
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar397 [16];
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar404;
  float fVar407;
  float fVar415;
  float fVar418;
  float fVar421;
  undefined1 auVar398 [32];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  float fVar405;
  float fVar406;
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar411;
  float fVar412;
  float fVar413;
  float fVar414;
  float fVar416;
  float fVar417;
  float fVar419;
  float fVar420;
  float fVar422;
  float fVar423;
  float fVar424;
  undefined1 auVar402 [32];
  undefined1 auVar403 [32];
  float fVar425;
  float fVar426;
  undefined1 auVar427 [16];
  float fVar431;
  float fVar432;
  float fVar436;
  float fVar437;
  float fVar438;
  undefined1 auVar428 [32];
  undefined1 auVar429 [32];
  float fVar433;
  float fVar434;
  float fVar435;
  undefined1 auVar430 [32];
  undefined1 auVar439 [16];
  undefined1 auVar440 [32];
  undefined1 auVar441 [32];
  undefined1 auVar442 [32];
  float fVar443;
  float fVar444;
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_d64;
  undefined1 local_ca0 [8];
  float fStack_c98;
  float fStack_c94;
  float fStack_c90;
  float fStack_c8c;
  float fStack_c88;
  undefined1 local_c70 [8];
  float fStack_c68;
  float fStack_c64;
  undefined1 local_c00 [8];
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  undefined1 local_ba0 [16];
  undefined1 local_b90 [16];
  undefined1 local_b70 [8];
  float fStack_b68;
  float fStack_b64;
  undefined1 local_b60 [8];
  float fStack_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float fStack_b48;
  undefined1 (*local_b30) [16];
  undefined1 (*local_b28) [16];
  undefined1 (*local_b20) [32];
  ulong local_b18;
  RTCFilterFunctionNArguments local_b10;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  float fStack_ac4;
  undefined1 local_ac0 [8];
  float fStack_ab8;
  float fStack_ab4;
  undefined1 auStack_ab0 [16];
  undefined1 local_aa0 [8];
  float fStack_a98;
  float fStack_a94;
  undefined1 auStack_a90 [16];
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [8];
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  float local_9a0;
  float fStack_99c;
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [16];
  Primitive *local_970;
  ulong local_968;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  float fStack_944;
  undefined1 local_940 [8];
  float fStack_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [16];
  undefined1 auStack_850 [16];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7b0 [16];
  RTCHitN local_7a0 [16];
  undefined1 auStack_790 [16];
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [16];
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined1 local_730 [16];
  undefined1 local_720 [32];
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6e0 [32];
  uint local_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  uint uStack_6b0;
  uint uStack_6ac;
  uint uStack_6a8;
  uint uStack_6a4;
  uint local_6a0;
  uint uStack_69c;
  uint uStack_698;
  uint uStack_694;
  uint uStack_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  float fStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  
  PVar18 = prim[1];
  uVar107 = (ulong)(byte)PVar18;
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 4 + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 4 + 10)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 5 + 6)));
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 5 + 10)));
  auVar198 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 6 + 6)));
  lVar108 = uVar107 * 0x25;
  auVar252 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 6 + 10)));
  auVar227 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 0xf + 6)));
  auVar119 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 0xf + 10)));
  auVar149 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 6)));
  auVar150 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar18 * 0x10 + 10)));
  fVar7 = *(float *)(prim + lVar108 + 0x12);
  auVar147 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar147 = vinsertps_avx(auVar147,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar33 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar147 = vsubps_avx(auVar147,*(undefined1 (*) [16])(prim + lVar108 + 6));
  local_c70._4_4_ = fVar7 * auVar147._4_4_;
  local_c70._0_4_ = fVar7 * auVar147._0_4_;
  fStack_c68 = fVar7 * auVar147._8_4_;
  fStack_c64 = fVar7 * auVar147._12_4_;
  auVar334._0_4_ = fVar7 * auVar33._0_4_;
  auVar334._4_4_ = fVar7 * auVar33._4_4_;
  auVar334._8_4_ = fVar7 * auVar33._8_4_;
  auVar334._12_4_ = fVar7 * auVar33._12_4_;
  auVar147 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 0x11 + 6)));
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 0x11 + 10)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 0x1a + 6)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 0x1a + 10)));
  auVar359._16_16_ = auVar35;
  auVar359._0_16_ = auVar34;
  auVar206._16_16_ = auVar144;
  auVar206._0_16_ = auVar36;
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 0x1b + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 0x1b + 10)));
  auVar237._16_16_ = auVar252;
  auVar237._0_16_ = auVar198;
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 0x1c + 6)));
  auVar124._16_16_ = auVar119;
  auVar124._0_16_ = auVar227;
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar107 * 0x1c + 10)));
  auVar206 = vcvtdq2ps_avx(auVar206);
  auVar25 = vcvtdq2ps_avx(auVar237);
  auVar297._16_16_ = auVar150;
  auVar297._0_16_ = auVar149;
  auVar26 = vcvtdq2ps_avx(auVar297);
  auVar312._16_16_ = auVar33;
  auVar312._0_16_ = auVar147;
  auVar27 = vcvtdq2ps_avx(auVar312);
  auVar380._16_16_ = auVar38;
  auVar380._0_16_ = auVar37;
  auVar277._16_16_ = auVar35;
  auVar277._0_16_ = auVar34;
  auVar298._16_16_ = auVar144;
  auVar298._0_16_ = auVar36;
  auVar147 = vshufps_avx(auVar334,auVar334,0x55);
  auVar33 = vshufps_avx(auVar334,auVar334,0xaa);
  fVar248 = auVar33._0_4_;
  fVar246 = auVar33._4_4_;
  fVar247 = auVar33._8_4_;
  fVar266 = auVar33._12_4_;
  fVar223 = auVar147._0_4_;
  fVar243 = auVar147._4_4_;
  fVar244 = auVar147._8_4_;
  fVar245 = auVar147._12_4_;
  auVar144 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar108 + 0x16)) *
                           *(float *)(prim + lVar108 + 0x1a)));
  _local_aa0 = ZEXT1632(auVar144);
  auVar28 = vcvtdq2ps_avx(auVar359);
  auVar29 = vcvtdq2ps_avx(auVar124);
  auVar30 = vcvtdq2ps_avx(auVar380);
  auVar31 = vcvtdq2ps_avx(auVar277);
  auVar32 = vcvtdq2ps_avx(auVar298);
  auVar147 = vshufps_avx(auVar334,auVar334,0);
  fVar7 = auVar147._0_4_;
  fVar142 = auVar147._4_4_;
  fVar177 = auVar147._8_4_;
  fVar181 = auVar147._12_4_;
  auVar398._0_4_ = auVar28._0_4_ * fVar7 + fVar223 * auVar206._0_4_ + fVar248 * auVar25._0_4_;
  auVar398._4_4_ = auVar28._4_4_ * fVar142 + fVar243 * auVar206._4_4_ + fVar246 * auVar25._4_4_;
  auVar398._8_4_ = auVar28._8_4_ * fVar177 + fVar244 * auVar206._8_4_ + fVar247 * auVar25._8_4_;
  auVar398._12_4_ = auVar28._12_4_ * fVar181 + fVar245 * auVar206._12_4_ + fVar266 * auVar25._12_4_;
  auVar398._16_4_ = auVar28._16_4_ * fVar7 + fVar223 * auVar206._16_4_ + fVar248 * auVar25._16_4_;
  auVar398._20_4_ = auVar28._20_4_ * fVar142 + fVar243 * auVar206._20_4_ + fVar246 * auVar25._20_4_;
  auVar398._24_4_ = auVar28._24_4_ * fVar177 + fVar244 * auVar206._24_4_ + fVar247 * auVar25._24_4_;
  auVar398._28_4_ = auVar38._12_4_ + 0.0;
  auVar381._0_4_ = fVar7 * auVar29._0_4_ + fVar223 * auVar26._0_4_ + fVar248 * auVar27._0_4_;
  auVar381._4_4_ = fVar142 * auVar29._4_4_ + fVar243 * auVar26._4_4_ + fVar246 * auVar27._4_4_;
  auVar381._8_4_ = fVar177 * auVar29._8_4_ + fVar244 * auVar26._8_4_ + fVar247 * auVar27._8_4_;
  auVar381._12_4_ = fVar181 * auVar29._12_4_ + fVar245 * auVar26._12_4_ + fVar266 * auVar27._12_4_;
  auVar381._16_4_ = fVar7 * auVar29._16_4_ + fVar223 * auVar26._16_4_ + fVar248 * auVar27._16_4_;
  auVar381._20_4_ = fVar142 * auVar29._20_4_ + fVar243 * auVar26._20_4_ + fVar246 * auVar27._20_4_;
  auVar381._24_4_ = fVar177 * auVar29._24_4_ + fVar244 * auVar26._24_4_ + fVar247 * auVar27._24_4_;
  auVar381._28_4_ = 0;
  auVar278._0_4_ = fVar223 * auVar31._0_4_ + fVar248 * auVar32._0_4_ + fVar7 * auVar30._0_4_;
  auVar278._4_4_ = fVar243 * auVar31._4_4_ + fVar246 * auVar32._4_4_ + fVar142 * auVar30._4_4_;
  auVar278._8_4_ = fVar244 * auVar31._8_4_ + fVar247 * auVar32._8_4_ + fVar177 * auVar30._8_4_;
  auVar278._12_4_ = fVar245 * auVar31._12_4_ + fVar266 * auVar32._12_4_ + fVar181 * auVar30._12_4_;
  auVar278._16_4_ = fVar223 * auVar31._16_4_ + fVar248 * auVar32._16_4_ + fVar7 * auVar30._16_4_;
  auVar278._20_4_ = fVar243 * auVar31._20_4_ + fVar246 * auVar32._20_4_ + fVar142 * auVar30._20_4_;
  auVar278._24_4_ = fVar244 * auVar31._24_4_ + fVar247 * auVar32._24_4_ + fVar177 * auVar30._24_4_;
  auVar278._28_4_ = auVar38._12_4_ + 0.0 + 0.0;
  auVar147 = vshufps_avx(_local_c70,_local_c70,0x55);
  auVar33 = vshufps_avx(_local_c70,_local_c70,0xaa);
  fVar223 = auVar33._0_4_;
  fVar243 = auVar33._4_4_;
  fVar244 = auVar33._8_4_;
  fVar245 = auVar33._12_4_;
  fVar7 = auVar147._0_4_;
  fVar142 = auVar147._4_4_;
  fVar177 = auVar147._8_4_;
  fVar181 = auVar147._12_4_;
  fVar248 = auVar32._28_4_ + auVar25._28_4_;
  auVar147._8_8_ = 0;
  auVar147._0_8_ = *(ulong *)(prim + uVar107 * 7 + 6);
  auVar147 = vpmovsxwd_avx(auVar147);
  _local_ac0 = ZEXT1632(auVar147);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar107 * 7 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar107 * 0xb + 6);
  auVar34 = vpmovsxwd_avx(auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar107 * 0xb + 0xe);
  auVar35 = vpmovsxwd_avx(auVar35);
  auVar36 = vshufps_avx(_local_c70,_local_c70,0);
  fVar246 = auVar36._0_4_;
  fVar247 = auVar36._4_4_;
  fVar249 = auVar36._8_4_;
  fVar265 = auVar36._12_4_;
  auVar207._0_4_ = fVar246 * auVar28._0_4_ + auVar206._0_4_ * fVar7 + fVar223 * auVar25._0_4_;
  auVar207._4_4_ = fVar247 * auVar28._4_4_ + auVar206._4_4_ * fVar142 + fVar243 * auVar25._4_4_;
  auVar207._8_4_ = fVar249 * auVar28._8_4_ + auVar206._8_4_ * fVar177 + fVar244 * auVar25._8_4_;
  auVar207._12_4_ = fVar265 * auVar28._12_4_ + auVar206._12_4_ * fVar181 + fVar245 * auVar25._12_4_;
  auVar207._16_4_ = fVar246 * auVar28._16_4_ + auVar206._16_4_ * fVar7 + fVar223 * auVar25._16_4_;
  auVar207._20_4_ = fVar247 * auVar28._20_4_ + auVar206._20_4_ * fVar142 + fVar243 * auVar25._20_4_;
  auVar207._24_4_ = fVar249 * auVar28._24_4_ + auVar206._24_4_ * fVar177 + fVar244 * auVar25._24_4_;
  auVar207._28_4_ = fVar245 + fVar248;
  auVar159._0_4_ = fVar246 * auVar29._0_4_ + fVar223 * auVar27._0_4_ + auVar26._0_4_ * fVar7;
  auVar159._4_4_ = fVar247 * auVar29._4_4_ + fVar243 * auVar27._4_4_ + auVar26._4_4_ * fVar142;
  auVar159._8_4_ = fVar249 * auVar29._8_4_ + fVar244 * auVar27._8_4_ + auVar26._8_4_ * fVar177;
  auVar159._12_4_ = fVar265 * auVar29._12_4_ + fVar245 * auVar27._12_4_ + auVar26._12_4_ * fVar181;
  auVar159._16_4_ = fVar246 * auVar29._16_4_ + fVar223 * auVar27._16_4_ + auVar26._16_4_ * fVar7;
  auVar159._20_4_ = fVar247 * auVar29._20_4_ + fVar243 * auVar27._20_4_ + auVar26._20_4_ * fVar142;
  auVar159._24_4_ = fVar249 * auVar29._24_4_ + fVar244 * auVar27._24_4_ + auVar26._24_4_ * fVar177;
  auVar159._28_4_ = auVar29._28_4_ + fVar266 + 0.0;
  auVar299._8_4_ = 0x7fffffff;
  auVar299._0_8_ = 0x7fffffff7fffffff;
  auVar299._12_4_ = 0x7fffffff;
  auVar299._16_4_ = 0x7fffffff;
  auVar299._20_4_ = 0x7fffffff;
  auVar299._24_4_ = 0x7fffffff;
  auVar299._28_4_ = 0x7fffffff;
  auVar125._0_4_ = fVar246 * auVar30._0_4_ + auVar31._0_4_ * fVar7 + fVar223 * auVar32._0_4_;
  auVar125._4_4_ = fVar247 * auVar30._4_4_ + auVar31._4_4_ * fVar142 + fVar243 * auVar32._4_4_;
  auVar125._8_4_ = fVar249 * auVar30._8_4_ + auVar31._8_4_ * fVar177 + fVar244 * auVar32._8_4_;
  auVar125._12_4_ = fVar265 * auVar30._12_4_ + auVar31._12_4_ * fVar181 + fVar245 * auVar32._12_4_;
  auVar125._16_4_ = fVar246 * auVar30._16_4_ + auVar31._16_4_ * fVar7 + fVar223 * auVar32._16_4_;
  auVar125._20_4_ = fVar247 * auVar30._20_4_ + auVar31._20_4_ * fVar142 + fVar243 * auVar32._20_4_;
  auVar125._24_4_ = fVar249 * auVar30._24_4_ + auVar31._24_4_ * fVar177 + fVar244 * auVar32._24_4_;
  auVar125._28_4_ = fVar248 + fVar181 + fVar245;
  auVar206 = vandps_avx(auVar398,auVar299);
  auVar360._8_4_ = 0x219392ef;
  auVar360._0_8_ = 0x219392ef219392ef;
  auVar360._12_4_ = 0x219392ef;
  auVar360._16_4_ = 0x219392ef;
  auVar360._20_4_ = 0x219392ef;
  auVar360._24_4_ = 0x219392ef;
  auVar360._28_4_ = 0x219392ef;
  auVar206 = vcmpps_avx(auVar206,auVar360,1);
  auVar25 = vblendvps_avx(auVar398,auVar360,auVar206);
  auVar206 = vandps_avx(auVar381,auVar299);
  auVar206 = vcmpps_avx(auVar206,auVar360,1);
  auVar26 = vblendvps_avx(auVar381,auVar360,auVar206);
  auVar206 = vandps_avx(auVar278,auVar299);
  auVar206 = vcmpps_avx(auVar206,auVar360,1);
  auVar27 = vrcpps_avx(auVar25);
  auVar206 = vblendvps_avx(auVar278,auVar360,auVar206);
  auVar361._8_4_ = 0x3f800000;
  auVar361._0_8_ = 0x3f8000003f800000;
  auVar361._12_4_ = 0x3f800000;
  auVar361._16_4_ = 0x3f800000;
  auVar361._20_4_ = 0x3f800000;
  auVar361._24_4_ = 0x3f800000;
  auVar361._28_4_ = 0x3f800000;
  fVar223 = auVar27._0_4_;
  fVar243 = auVar27._4_4_;
  auVar28._4_4_ = fVar243 * auVar25._4_4_;
  auVar28._0_4_ = fVar223 * auVar25._0_4_;
  fVar244 = auVar27._8_4_;
  auVar28._8_4_ = fVar244 * auVar25._8_4_;
  fVar245 = auVar27._12_4_;
  auVar28._12_4_ = fVar245 * auVar25._12_4_;
  fVar248 = auVar27._16_4_;
  auVar28._16_4_ = fVar248 * auVar25._16_4_;
  fVar246 = auVar27._20_4_;
  auVar28._20_4_ = fVar246 * auVar25._20_4_;
  fVar247 = auVar27._24_4_;
  auVar28._24_4_ = fVar247 * auVar25._24_4_;
  auVar28._28_4_ = auVar25._28_4_;
  auVar29 = vsubps_avx(auVar361,auVar28);
  fVar223 = fVar223 + fVar223 * auVar29._0_4_;
  fVar243 = fVar243 + fVar243 * auVar29._4_4_;
  fVar244 = fVar244 + fVar244 * auVar29._8_4_;
  fVar245 = fVar245 + fVar245 * auVar29._12_4_;
  fVar248 = fVar248 + fVar248 * auVar29._16_4_;
  fVar246 = fVar246 + fVar246 * auVar29._20_4_;
  fVar247 = fVar247 + fVar247 * auVar29._24_4_;
  auVar28 = vrcpps_avx(auVar26);
  fVar249 = auVar28._0_4_;
  fVar265 = auVar28._4_4_;
  auVar25._4_4_ = fVar265 * auVar26._4_4_;
  auVar25._0_4_ = fVar249 * auVar26._0_4_;
  fVar266 = auVar28._8_4_;
  auVar25._8_4_ = fVar266 * auVar26._8_4_;
  fVar267 = auVar28._12_4_;
  auVar25._12_4_ = fVar267 * auVar26._12_4_;
  fVar268 = auVar28._16_4_;
  auVar25._16_4_ = fVar268 * auVar26._16_4_;
  fVar269 = auVar28._20_4_;
  auVar25._20_4_ = fVar269 * auVar26._20_4_;
  fVar270 = auVar28._24_4_;
  auVar25._24_4_ = fVar270 * auVar26._24_4_;
  auVar25._28_4_ = auVar26._28_4_;
  auVar26 = vsubps_avx(auVar361,auVar25);
  auVar25 = vrcpps_avx(auVar206);
  fVar249 = fVar249 + fVar249 * auVar26._0_4_;
  fVar265 = fVar265 + fVar265 * auVar26._4_4_;
  fVar266 = fVar266 + fVar266 * auVar26._8_4_;
  fVar267 = fVar267 + fVar267 * auVar26._12_4_;
  fVar268 = fVar268 + fVar268 * auVar26._16_4_;
  fVar269 = fVar269 + fVar269 * auVar26._20_4_;
  fVar270 = fVar270 + fVar270 * auVar26._24_4_;
  fVar271 = auVar25._0_4_;
  fVar286 = auVar25._4_4_;
  auVar30._4_4_ = fVar286 * auVar206._4_4_;
  auVar30._0_4_ = fVar271 * auVar206._0_4_;
  fVar287 = auVar25._8_4_;
  auVar30._8_4_ = fVar287 * auVar206._8_4_;
  fVar288 = auVar25._12_4_;
  auVar30._12_4_ = fVar288 * auVar206._12_4_;
  fVar289 = auVar25._16_4_;
  auVar30._16_4_ = fVar289 * auVar206._16_4_;
  fVar290 = auVar25._20_4_;
  auVar30._20_4_ = fVar290 * auVar206._20_4_;
  fVar291 = auVar25._24_4_;
  auVar30._24_4_ = fVar291 * auVar206._24_4_;
  auVar30._28_4_ = auVar206._28_4_;
  auVar206 = vsubps_avx(auVar361,auVar30);
  fVar271 = fVar271 + fVar271 * auVar206._0_4_;
  fVar286 = fVar286 + fVar286 * auVar206._4_4_;
  fVar287 = fVar287 + fVar287 * auVar206._8_4_;
  fVar288 = fVar288 + fVar288 * auVar206._12_4_;
  fVar289 = fVar289 + fVar289 * auVar206._16_4_;
  fVar290 = fVar290 + fVar290 * auVar206._20_4_;
  fVar291 = fVar291 + fVar291 * auVar206._24_4_;
  auVar36 = vpermilps_avx(auVar144,0);
  auVar313._16_16_ = auVar33;
  auVar313._0_16_ = auVar147;
  auVar206 = vcvtdq2ps_avx(auVar313);
  auVar325._16_16_ = auVar35;
  auVar325._0_16_ = auVar34;
  auVar25 = vcvtdq2ps_avx(auVar325);
  auVar25 = vsubps_avx(auVar25,auVar206);
  fVar7 = auVar36._0_4_;
  fVar142 = auVar36._4_4_;
  fVar177 = auVar36._8_4_;
  fVar181 = auVar36._12_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar107 * 9 + 6);
  auVar147 = vpmovsxwd_avx(auVar36);
  auVar314._0_4_ = auVar25._0_4_ * fVar7 + auVar206._0_4_;
  auVar314._4_4_ = auVar25._4_4_ * fVar142 + auVar206._4_4_;
  auVar314._8_4_ = auVar25._8_4_ * fVar177 + auVar206._8_4_;
  auVar314._12_4_ = auVar25._12_4_ * fVar181 + auVar206._12_4_;
  auVar314._16_4_ = auVar25._16_4_ * fVar7 + auVar206._16_4_;
  auVar314._20_4_ = auVar25._20_4_ * fVar142 + auVar206._20_4_;
  auVar314._24_4_ = auVar25._24_4_ * fVar177 + auVar206._24_4_;
  auVar314._28_4_ = auVar25._28_4_ + auVar206._28_4_;
  auVar144._8_8_ = 0;
  auVar144._0_8_ = *(ulong *)(prim + uVar107 * 9 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar144);
  auVar326._16_16_ = auVar33;
  auVar326._0_16_ = auVar147;
  auVar198._8_8_ = 0;
  auVar198._0_8_ = *(ulong *)(prim + uVar107 * 0xd + 6);
  auVar147 = vpmovsxwd_avx(auVar198);
  auVar252._8_8_ = 0;
  auVar252._0_8_ = *(ulong *)(prim + uVar107 * 0xd + 0xe);
  auVar33 = vpmovsxwd_avx(auVar252);
  auVar206 = vcvtdq2ps_avx(auVar326);
  auVar335._16_16_ = auVar33;
  auVar335._0_16_ = auVar147;
  auVar25 = vcvtdq2ps_avx(auVar335);
  auVar25 = vsubps_avx(auVar25,auVar206);
  auVar327._0_4_ = auVar206._0_4_ + auVar25._0_4_ * fVar7;
  auVar327._4_4_ = auVar206._4_4_ + auVar25._4_4_ * fVar142;
  auVar327._8_4_ = auVar206._8_4_ + auVar25._8_4_ * fVar177;
  auVar327._12_4_ = auVar206._12_4_ + auVar25._12_4_ * fVar181;
  auVar327._16_4_ = auVar206._16_4_ + auVar25._16_4_ * fVar7;
  auVar327._20_4_ = auVar206._20_4_ + auVar25._20_4_ * fVar142;
  auVar327._24_4_ = auVar206._24_4_ + auVar25._24_4_ * fVar177;
  auVar327._28_4_ = auVar206._28_4_ + auVar25._28_4_;
  auVar227._8_8_ = 0;
  auVar227._0_8_ = *(ulong *)(prim + uVar107 * 0x12 + 6);
  auVar147 = vpmovsxwd_avx(auVar227);
  auVar119._8_8_ = 0;
  auVar119._0_8_ = *(ulong *)(prim + uVar107 * 0x12 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar119);
  auVar336._16_16_ = auVar33;
  auVar336._0_16_ = auVar147;
  auVar206 = vcvtdq2ps_avx(auVar336);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + uVar107 * 0x16 + 6);
  auVar147 = vpmovsxwd_avx(auVar149);
  auVar150._8_8_ = 0;
  auVar150._0_8_ = *(ulong *)(prim + uVar107 * 0x16 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar150);
  auVar362._16_16_ = auVar33;
  auVar362._0_16_ = auVar147;
  auVar25 = vcvtdq2ps_avx(auVar362);
  auVar25 = vsubps_avx(auVar25,auVar206);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar107 * 0x14 + 6);
  auVar147 = vpmovsxwd_avx(auVar37);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar107 * 0x14 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar38);
  auVar337._0_4_ = auVar206._0_4_ + auVar25._0_4_ * fVar7;
  auVar337._4_4_ = auVar206._4_4_ + auVar25._4_4_ * fVar142;
  auVar337._8_4_ = auVar206._8_4_ + auVar25._8_4_ * fVar177;
  auVar337._12_4_ = auVar206._12_4_ + auVar25._12_4_ * fVar181;
  auVar337._16_4_ = auVar206._16_4_ + auVar25._16_4_ * fVar7;
  auVar337._20_4_ = auVar206._20_4_ + auVar25._20_4_ * fVar142;
  auVar337._24_4_ = auVar206._24_4_ + auVar25._24_4_ * fVar177;
  auVar337._28_4_ = auVar206._28_4_ + auVar25._28_4_;
  auVar363._16_16_ = auVar33;
  auVar363._0_16_ = auVar147;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar107 * 0x18 + 6);
  auVar147 = vpmovsxwd_avx(auVar9);
  auVar206 = vcvtdq2ps_avx(auVar363);
  auVar121._8_8_ = 0;
  auVar121._0_8_ = *(ulong *)(prim + uVar107 * 0x18 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar121);
  auVar382._16_16_ = auVar33;
  auVar382._0_16_ = auVar147;
  auVar25 = vcvtdq2ps_avx(auVar382);
  auVar25 = vsubps_avx(auVar25,auVar206);
  auVar364._0_4_ = auVar206._0_4_ + auVar25._0_4_ * fVar7;
  auVar364._4_4_ = auVar206._4_4_ + auVar25._4_4_ * fVar142;
  auVar364._8_4_ = auVar206._8_4_ + auVar25._8_4_ * fVar177;
  auVar364._12_4_ = auVar206._12_4_ + auVar25._12_4_ * fVar181;
  auVar364._16_4_ = auVar206._16_4_ + auVar25._16_4_ * fVar7;
  auVar364._20_4_ = auVar206._20_4_ + auVar25._20_4_ * fVar142;
  auVar364._24_4_ = auVar206._24_4_ + auVar25._24_4_ * fVar177;
  auVar364._28_4_ = auVar206._28_4_ + auVar25._28_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar107 * 0x1d + 6);
  auVar147 = vpmovsxwd_avx(auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar107 * 0x1d + 0xe);
  auVar33 = vpmovsxwd_avx(auVar11);
  auVar383._16_16_ = auVar33;
  auVar383._0_16_ = auVar147;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar107 * 0x21 + 6);
  auVar147 = vpmovsxwd_avx(auVar12);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar107 * 0x21 + 0xe);
  auVar33 = vpmovsxwd_avx(auVar13);
  auVar399._16_16_ = auVar33;
  auVar399._0_16_ = auVar147;
  auVar206 = vcvtdq2ps_avx(auVar383);
  auVar25 = vcvtdq2ps_avx(auVar399);
  auVar25 = vsubps_avx(auVar25,auVar206);
  auVar384._0_4_ = auVar206._0_4_ + auVar25._0_4_ * fVar7;
  auVar384._4_4_ = auVar206._4_4_ + auVar25._4_4_ * fVar142;
  auVar384._8_4_ = auVar206._8_4_ + auVar25._8_4_ * fVar177;
  auVar384._12_4_ = auVar206._12_4_ + auVar25._12_4_ * fVar181;
  auVar384._16_4_ = auVar206._16_4_ + auVar25._16_4_ * fVar7;
  auVar384._20_4_ = auVar206._20_4_ + auVar25._20_4_ * fVar142;
  auVar384._24_4_ = auVar206._24_4_ + auVar25._24_4_ * fVar177;
  auVar384._28_4_ = auVar206._28_4_ + auVar25._28_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar107 * 0x1f + 6);
  auVar147 = vpmovsxwd_avx(auVar14);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar107 * 0x1f + 0xe);
  auVar33 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar107 * 0x23 + 6);
  auVar34 = vpmovsxwd_avx(auVar16);
  auVar400._16_16_ = auVar33;
  auVar400._0_16_ = auVar147;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar107 * 0x23 + 0xe);
  auVar147 = vpmovsxwd_avx(auVar17);
  auVar428._16_16_ = auVar147;
  auVar428._0_16_ = auVar34;
  auVar206 = vcvtdq2ps_avx(auVar400);
  auVar25 = vcvtdq2ps_avx(auVar428);
  auVar25 = vsubps_avx(auVar25,auVar206);
  auVar401._0_4_ = auVar206._0_4_ + auVar25._0_4_ * fVar7;
  auVar401._4_4_ = auVar206._4_4_ + auVar25._4_4_ * fVar142;
  auVar401._8_4_ = auVar206._8_4_ + auVar25._8_4_ * fVar177;
  auVar401._12_4_ = auVar206._12_4_ + auVar25._12_4_ * fVar181;
  auVar401._16_4_ = auVar206._16_4_ + auVar25._16_4_ * fVar7;
  auVar401._20_4_ = auVar206._20_4_ + auVar25._20_4_ * fVar142;
  auVar401._24_4_ = auVar206._24_4_ + auVar25._24_4_ * fVar177;
  auVar401._28_4_ = auVar206._28_4_ + fVar181;
  auVar206 = vsubps_avx(auVar314,auVar207);
  auVar293._0_4_ = fVar223 * auVar206._0_4_;
  auVar293._4_4_ = fVar243 * auVar206._4_4_;
  auVar293._8_4_ = fVar244 * auVar206._8_4_;
  auVar293._12_4_ = fVar245 * auVar206._12_4_;
  auVar31._16_4_ = fVar248 * auVar206._16_4_;
  auVar31._0_16_ = auVar293;
  auVar31._20_4_ = fVar246 * auVar206._20_4_;
  auVar31._24_4_ = fVar247 * auVar206._24_4_;
  auVar31._28_4_ = auVar206._28_4_;
  auVar206 = vsubps_avx(auVar327,auVar207);
  auVar224._0_4_ = fVar223 * auVar206._0_4_;
  auVar224._4_4_ = fVar243 * auVar206._4_4_;
  auVar224._8_4_ = fVar244 * auVar206._8_4_;
  auVar224._12_4_ = fVar245 * auVar206._12_4_;
  auVar32._16_4_ = fVar248 * auVar206._16_4_;
  auVar32._0_16_ = auVar224;
  auVar32._20_4_ = fVar246 * auVar206._20_4_;
  auVar32._24_4_ = fVar247 * auVar206._24_4_;
  auVar32._28_4_ = auVar27._28_4_ + auVar29._28_4_;
  auVar206 = vsubps_avx(auVar337,auVar159);
  auVar194._0_4_ = fVar249 * auVar206._0_4_;
  auVar194._4_4_ = fVar265 * auVar206._4_4_;
  auVar194._8_4_ = fVar266 * auVar206._8_4_;
  auVar194._12_4_ = fVar267 * auVar206._12_4_;
  auVar27._16_4_ = fVar268 * auVar206._16_4_;
  auVar27._0_16_ = auVar194;
  auVar27._20_4_ = fVar269 * auVar206._20_4_;
  auVar27._24_4_ = fVar270 * auVar206._24_4_;
  auVar27._28_4_ = auVar206._28_4_;
  auVar206 = vsubps_avx(auVar364,auVar159);
  auVar250._0_4_ = fVar249 * auVar206._0_4_;
  auVar250._4_4_ = fVar265 * auVar206._4_4_;
  auVar250._8_4_ = fVar266 * auVar206._8_4_;
  auVar250._12_4_ = fVar267 * auVar206._12_4_;
  auVar29._16_4_ = fVar268 * auVar206._16_4_;
  auVar29._0_16_ = auVar250;
  auVar29._20_4_ = fVar269 * auVar206._20_4_;
  auVar29._24_4_ = fVar270 * auVar206._24_4_;
  auVar29._28_4_ = auVar28._28_4_ + auVar26._28_4_;
  auVar206 = vsubps_avx(auVar384,auVar125);
  auVar145._0_4_ = fVar271 * auVar206._0_4_;
  auVar145._4_4_ = fVar286 * auVar206._4_4_;
  auVar145._8_4_ = fVar287 * auVar206._8_4_;
  auVar145._12_4_ = fVar288 * auVar206._12_4_;
  auVar26._16_4_ = fVar289 * auVar206._16_4_;
  auVar26._0_16_ = auVar145;
  auVar26._20_4_ = fVar290 * auVar206._20_4_;
  auVar26._24_4_ = fVar291 * auVar206._24_4_;
  auVar26._28_4_ = auVar206._28_4_;
  auVar206 = vsubps_avx(auVar401,auVar125);
  auVar116._0_4_ = fVar271 * auVar206._0_4_;
  auVar116._4_4_ = fVar286 * auVar206._4_4_;
  auVar116._8_4_ = fVar287 * auVar206._8_4_;
  auVar116._12_4_ = fVar288 * auVar206._12_4_;
  auVar39._16_4_ = fVar289 * auVar206._16_4_;
  auVar39._0_16_ = auVar116;
  auVar39._20_4_ = fVar290 * auVar206._20_4_;
  auVar39._24_4_ = fVar291 * auVar206._24_4_;
  auVar39._28_4_ = auVar206._28_4_;
  auVar147 = vpminsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar33 = vpminsd_avx(auVar293,auVar224);
  auVar328._16_16_ = auVar147;
  auVar328._0_16_ = auVar33;
  auVar147 = vpminsd_avx(auVar27._16_16_,auVar29._16_16_);
  auVar33 = vpminsd_avx(auVar194,auVar250);
  auVar338._16_16_ = auVar147;
  auVar338._0_16_ = auVar33;
  auVar206 = vmaxps_avx(auVar328,auVar338);
  auVar147 = vpminsd_avx(auVar26._16_16_,auVar39._16_16_);
  auVar33 = vpminsd_avx(auVar145,auVar116);
  auVar429._16_16_ = auVar147;
  auVar429._0_16_ = auVar33;
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar440._4_4_ = uVar8;
  auVar440._0_4_ = uVar8;
  auVar440._8_4_ = uVar8;
  auVar440._12_4_ = uVar8;
  auVar440._16_4_ = uVar8;
  auVar440._20_4_ = uVar8;
  auVar440._24_4_ = uVar8;
  auVar440._28_4_ = uVar8;
  auVar25 = vmaxps_avx(auVar429,auVar440);
  auVar206 = vmaxps_avx(auVar206,auVar25);
  local_380._4_4_ = auVar206._4_4_ * 0.99999964;
  local_380._0_4_ = auVar206._0_4_ * 0.99999964;
  local_380._8_4_ = auVar206._8_4_ * 0.99999964;
  local_380._12_4_ = auVar206._12_4_ * 0.99999964;
  local_380._16_4_ = auVar206._16_4_ * 0.99999964;
  local_380._20_4_ = auVar206._20_4_ * 0.99999964;
  local_380._24_4_ = auVar206._24_4_ * 0.99999964;
  local_380._28_4_ = auVar206._28_4_;
  auVar147 = vpmaxsd_avx(auVar31._16_16_,auVar32._16_16_);
  auVar33 = vpmaxsd_avx(auVar293,auVar224);
  auVar238._16_16_ = auVar147;
  auVar238._0_16_ = auVar33;
  auVar147 = vpmaxsd_avx(auVar27._16_16_,auVar29._16_16_);
  auVar33 = vpmaxsd_avx(auVar194,auVar250);
  auVar208._16_16_ = auVar147;
  auVar208._0_16_ = auVar33;
  auVar206 = vminps_avx(auVar238,auVar208);
  auVar147 = vpmaxsd_avx(auVar26._16_16_,auVar39._16_16_);
  auVar33 = vpmaxsd_avx(auVar145,auVar116);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar160._4_4_ = uVar8;
  auVar160._0_4_ = uVar8;
  auVar160._8_4_ = uVar8;
  auVar160._12_4_ = uVar8;
  auVar160._16_4_ = uVar8;
  auVar160._20_4_ = uVar8;
  auVar160._24_4_ = uVar8;
  auVar160._28_4_ = uVar8;
  auVar126._16_16_ = auVar147;
  auVar126._0_16_ = auVar33;
  auVar25 = vminps_avx(auVar126,auVar160);
  auVar206 = vminps_avx(auVar206,auVar25);
  auVar40._4_4_ = auVar206._4_4_ * 1.0000004;
  auVar40._0_4_ = auVar206._0_4_ * 1.0000004;
  auVar40._8_4_ = auVar206._8_4_ * 1.0000004;
  auVar40._12_4_ = auVar206._12_4_ * 1.0000004;
  auVar40._16_4_ = auVar206._16_4_ * 1.0000004;
  auVar40._20_4_ = auVar206._20_4_ * 1.0000004;
  auVar40._24_4_ = auVar206._24_4_ * 1.0000004;
  auVar40._28_4_ = auVar206._28_4_;
  auVar206 = vcmpps_avx(local_380,auVar40,2);
  auVar147 = vpshufd_avx(ZEXT116((byte)PVar18),0);
  auVar161._16_16_ = auVar147;
  auVar161._0_16_ = auVar147;
  auVar25 = vcvtdq2ps_avx(auVar161);
  auVar25 = vcmpps_avx(_DAT_01f7b060,auVar25,1);
  auVar206 = vandps_avx(auVar206,auVar25);
  auVar162._16_16_ = mm_lookupmask_ps._240_16_;
  auVar162._0_16_ = mm_lookupmask_ps._240_16_;
  uVar110 = vmovmskps_avx(auVar206);
  local_5c0 = vblendps_avx(auVar162,ZEXT832(0) << 0x20,0x80);
  local_b20 = (undefined1 (*) [32])&local_6c0;
  uVar109 = 1 << ((byte)k & 0x1f);
  local_b28 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar109 & 0xf) << 4));
  local_b30 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)((int)uVar109 >> 4) * 0x10);
  local_970 = prim;
LAB_00b3c888:
  local_968 = (ulong)uVar110;
  if (local_968 == 0) {
LAB_00b3f6b2:
    return local_968 != 0;
  }
  lVar108 = 0;
  if (local_968 != 0) {
    for (; (uVar110 >> lVar108 & 1) == 0; lVar108 = lVar108 + 1) {
    }
  }
  local_b18 = (ulong)*(uint *)(local_970 + 2);
  pGVar19 = (context->scene->geometries).items[local_b18].ptr;
  uVar107 = (ulong)*(uint *)(*(long *)&pGVar19->field_0x58 +
                            (ulong)*(uint *)(local_970 + lVar108 * 4 + 6) *
                            pGVar19[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                            _M_i);
  fVar7 = (pGVar19->time_range).lower;
  fVar7 = pGVar19->fnumTimeSegments *
          ((*(float *)(ray + k * 4 + 0xe0) - fVar7) / ((pGVar19->time_range).upper - fVar7));
  auVar147 = vroundss_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),9);
  auVar147 = vminss_avx(auVar147,ZEXT416((uint)(pGVar19->fnumTimeSegments + -1.0)));
  auVar147 = vmaxss_avx(ZEXT816(0) << 0x20,auVar147);
  fVar7 = fVar7 - auVar147._0_4_;
  _Var20 = pGVar19[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar111 = (long)(int)auVar147._0_4_ * 0x38;
  lVar21 = *(long *)(_Var20 + lVar111);
  lVar22 = *(long *)(_Var20 + 0x10 + lVar111);
  auVar147 = vshufps_avx(ZEXT416((uint)(1.0 - fVar7)),ZEXT416((uint)(1.0 - fVar7)),0);
  pfVar1 = (float *)(lVar21 + lVar22 * uVar107);
  fVar223 = auVar147._0_4_;
  fVar243 = auVar147._4_4_;
  fVar244 = auVar147._8_4_;
  fVar245 = auVar147._12_4_;
  pfVar2 = (float *)(lVar21 + lVar22 * (uVar107 + 1));
  pfVar3 = (float *)(lVar21 + lVar22 * (uVar107 + 2));
  pfVar4 = (float *)(lVar21 + lVar22 * (uVar107 + 3));
  lVar21 = *(long *)(_Var20 + 0x38 + lVar111);
  lVar22 = *(long *)(_Var20 + 0x48 + lVar111);
  auVar147 = vshufps_avx(ZEXT416((uint)fVar7),ZEXT416((uint)fVar7),0);
  pfVar5 = (float *)(lVar21 + uVar107 * lVar22);
  fVar248 = auVar147._0_4_;
  fVar246 = auVar147._4_4_;
  fVar247 = auVar147._8_4_;
  fVar249 = auVar147._12_4_;
  pfVar6 = (float *)(lVar21 + (uVar107 + 1) * lVar22);
  auVar251._0_4_ = fVar248 * *pfVar5 + fVar223 * *pfVar1;
  auVar251._4_4_ = fVar246 * pfVar5[1] + fVar243 * pfVar1[1];
  auVar251._8_4_ = fVar247 * pfVar5[2] + fVar244 * pfVar1[2];
  auVar251._12_4_ = fVar249 * pfVar5[3] + fVar245 * pfVar1[3];
  auVar147 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x1c);
  auVar33 = vinsertps_avx(auVar147,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  fVar7 = *(float *)(ray + k * 4 + 0x80);
  auVar397._4_4_ = fVar7;
  auVar397._0_4_ = fVar7;
  auVar397._8_4_ = fVar7;
  auVar397._12_4_ = fVar7;
  fStack_870 = fVar7;
  _local_880 = auVar397;
  fStack_86c = fVar7;
  fStack_868 = fVar7;
  fStack_864 = fVar7;
  fVar142 = *(float *)(ray + k * 4 + 0xa0);
  auVar427._4_4_ = fVar142;
  auVar427._0_4_ = fVar142;
  auVar427._8_4_ = fVar142;
  auVar427._12_4_ = fVar142;
  fStack_910 = fVar142;
  _local_920 = auVar427;
  fStack_90c = fVar142;
  fStack_908 = fVar142;
  fStack_904 = fVar142;
  auVar272._0_4_ = fVar223 * *pfVar2 + fVar248 * *pfVar6;
  auVar272._4_4_ = fVar243 * pfVar2[1] + fVar246 * pfVar6[1];
  auVar272._8_4_ = fVar244 * pfVar2[2] + fVar247 * pfVar6[2];
  auVar272._12_4_ = fVar245 * pfVar2[3] + fVar249 * pfVar6[3];
  auVar147 = vunpcklps_avx(auVar397,auVar427);
  fVar177 = *(float *)(ray + k * 4 + 0xc0);
  auVar439._4_4_ = fVar177;
  auVar439._0_4_ = fVar177;
  auVar439._8_4_ = fVar177;
  auVar439._12_4_ = fVar177;
  fStack_890 = fVar177;
  _local_8a0 = auVar439;
  fStack_88c = fVar177;
  fStack_888 = fVar177;
  fStack_884 = fVar177;
  _local_9d0 = vinsertps_avx(auVar147,auVar439,0x28);
  auVar368 = ZEXT1664(_local_9d0);
  auVar117._0_4_ = (auVar251._0_4_ + auVar272._0_4_) * 0.5;
  auVar117._4_4_ = (auVar251._4_4_ + auVar272._4_4_) * 0.5;
  auVar117._8_4_ = (auVar251._8_4_ + auVar272._8_4_) * 0.5;
  auVar117._12_4_ = (auVar251._12_4_ + auVar272._12_4_) * 0.5;
  auVar147 = vsubps_avx(auVar117,auVar33);
  auVar147 = vdpps_avx(auVar147,_local_9d0,0x7f);
  local_9e0 = vdpps_avx(_local_9d0,_local_9d0,0x7f);
  pfVar1 = (float *)(lVar21 + (uVar107 + 2) * lVar22);
  auVar225._0_4_ = fVar223 * *pfVar3 + fVar248 * *pfVar1;
  auVar225._4_4_ = fVar243 * pfVar3[1] + fVar246 * pfVar1[1];
  auVar225._8_4_ = fVar244 * pfVar3[2] + fVar247 * pfVar1[2];
  auVar225._12_4_ = fVar245 * pfVar3[3] + fVar249 * pfVar1[3];
  auVar34 = vrcpss_avx(local_9e0,local_9e0);
  fVar181 = auVar147._0_4_ * (2.0 - local_9e0._0_4_ * auVar34._0_4_) * auVar34._0_4_;
  auVar332 = ZEXT464((uint)fVar181);
  auVar34 = vshufps_avx(ZEXT416((uint)fVar181),ZEXT416((uint)fVar181),0);
  auVar294._0_4_ = auVar33._0_4_ + local_9d0._0_4_ * auVar34._0_4_;
  auVar294._4_4_ = auVar33._4_4_ + local_9d0._4_4_ * auVar34._4_4_;
  auVar294._8_4_ = auVar33._8_4_ + local_9d0._8_4_ * auVar34._8_4_;
  auVar294._12_4_ = auVar33._12_4_ + local_9d0._12_4_ * auVar34._12_4_;
  auVar147 = vblendps_avx(auVar294,_DAT_01f45a50,8);
  auVar33 = vsubps_avx(auVar251,auVar147);
  auVar144 = vsubps_avx(auVar225,auVar147);
  pfVar1 = (float *)(lVar21 + lVar22 * (uVar107 + 3));
  auVar146._0_4_ = fVar223 * *pfVar4 + fVar248 * *pfVar1;
  auVar146._4_4_ = fVar243 * pfVar4[1] + fVar246 * pfVar1[1];
  auVar146._8_4_ = fVar244 * pfVar4[2] + fVar247 * pfVar1[2];
  auVar146._12_4_ = fVar245 * pfVar4[3] + fVar249 * pfVar1[3];
  auVar35 = vsubps_avx(auVar272,auVar147);
  _local_b70 = vsubps_avx(auVar146,auVar147);
  auVar147 = vshufps_avx(auVar33,auVar33,0);
  register0x00001250 = auVar147;
  _local_4c0 = auVar147;
  auVar147 = vshufps_avx(auVar33,auVar33,0x55);
  register0x00001250 = auVar147;
  _local_1e0 = auVar147;
  auVar147 = vshufps_avx(auVar33,auVar33,0xaa);
  register0x00001250 = auVar147;
  _local_200 = auVar147;
  _local_aa0 = auVar33;
  auVar147 = vshufps_avx(auVar33,auVar33,0xff);
  register0x00001290 = auVar147;
  _local_220 = auVar147;
  auVar147 = vshufps_avx(auVar35,auVar35,0);
  register0x00001290 = auVar147;
  _local_4e0 = auVar147;
  auVar147 = vshufps_avx(auVar35,auVar35,0x55);
  register0x00001290 = auVar147;
  _local_500 = auVar147;
  auVar147 = vshufps_avx(auVar35,auVar35,0xaa);
  register0x00001290 = auVar147;
  _local_520 = auVar147;
  _local_ac0 = auVar35;
  auVar147 = vshufps_avx(auVar35,auVar35,0xff);
  register0x00001290 = auVar147;
  _local_240 = auVar147;
  auVar33 = vshufps_avx(auVar144,auVar144,0);
  auVar147 = vshufps_avx(auVar144,auVar144,0x55);
  register0x00001290 = auVar147;
  _local_540 = auVar147;
  auVar147 = vshufps_avx(auVar144,auVar144,0xaa);
  register0x00001290 = auVar147;
  _local_560 = auVar147;
  auVar147 = vshufps_avx(auVar144,auVar144,0xff);
  register0x00001290 = auVar147;
  _local_580 = auVar147;
  auVar35 = vshufps_avx(_local_b70,_local_b70,0);
  auVar36 = vshufps_avx(_local_b70,_local_b70,0x55);
  auVar147 = vshufps_avx(_local_b70,_local_b70,0xaa);
  register0x00001290 = auVar147;
  _local_5a0 = auVar147;
  auVar147 = vshufps_avx(_local_b70,_local_b70,0xff);
  register0x00001290 = auVar147;
  _local_260 = auVar147;
  auVar147 = ZEXT416((uint)(fVar7 * fVar7 + fVar142 * fVar142 + fVar177 * fVar177));
  auVar147 = vshufps_avx(auVar147,auVar147,0);
  local_280._16_16_ = auVar147;
  local_280._0_16_ = auVar147;
  auVar264 = ZEXT3264(local_280);
  fVar7 = *(float *)(ray + k * 4 + 0x60);
  local_980 = ZEXT416((uint)fVar181);
  auVar147 = vshufps_avx(ZEXT416((uint)(fVar7 - fVar181)),ZEXT416((uint)(fVar7 - fVar181)),0);
  local_360._16_16_ = auVar147;
  local_360._0_16_ = auVar147;
  auVar147 = vpshufd_avx(ZEXT416(*(uint *)(local_970 + 2)),0);
  local_600._16_16_ = auVar147;
  local_600._0_16_ = auVar147;
  auVar147 = vpshufd_avx(ZEXT416(*(uint *)(local_970 + lVar108 * 4 + 6)),0);
  local_620._16_16_ = auVar147;
  local_620._0_16_ = auVar147;
  register0x00001210 = auVar34;
  _local_9c0 = auVar34;
  uVar110 = 0;
  bVar113 = 0;
  local_d64 = 1;
  auVar127._8_4_ = 0x7fffffff;
  auVar127._0_8_ = 0x7fffffff7fffffff;
  auVar127._12_4_ = 0x7fffffff;
  auVar127._16_4_ = 0x7fffffff;
  auVar127._20_4_ = 0x7fffffff;
  auVar127._24_4_ = 0x7fffffff;
  auVar127._28_4_ = 0x7fffffff;
  local_5e0 = vandps_avx(local_280,auVar127);
  auVar147 = vsqrtss_avx(local_9e0,local_9e0);
  auVar34 = vsqrtss_avx(local_9e0,local_9e0);
  local_7b0 = ZEXT816(0x3f80000000000000);
  do {
    auVar279._8_4_ = 0x3f800000;
    auVar279._0_8_ = 0x3f8000003f800000;
    auVar279._12_4_ = 0x3f800000;
    auVar279._16_4_ = 0x3f800000;
    auVar279._20_4_ = 0x3f800000;
    auVar279._24_4_ = 0x3f800000;
    auVar279._28_4_ = 0x3f800000;
    auVar198 = vmovshdup_avx(local_7b0);
    auVar227 = vsubps_avx(auVar198,local_7b0);
    auVar198 = vshufps_avx(local_7b0,local_7b0,0);
    local_a80._16_16_ = auVar198;
    local_a80._0_16_ = auVar198;
    auVar252 = vshufps_avx(auVar227,auVar227,0);
    local_8e0._16_16_ = auVar252;
    local_8e0._0_16_ = auVar252;
    fVar141 = auVar252._0_4_;
    fVar176 = auVar252._4_4_;
    fVar180 = auVar252._8_4_;
    fVar184 = auVar252._12_4_;
    fVar115 = auVar198._0_4_;
    auVar239._0_4_ = fVar115 + fVar141 * 0.0;
    fVar139 = auVar198._4_4_;
    auVar239._4_4_ = fVar139 + fVar176 * 0.14285715;
    fVar140 = auVar198._8_4_;
    auVar239._8_4_ = fVar140 + fVar180 * 0.2857143;
    fStack_ac4 = auVar198._12_4_;
    auVar239._12_4_ = fStack_ac4 + fVar184 * 0.42857146;
    auVar239._16_4_ = fVar115 + fVar141 * 0.5714286;
    auVar239._20_4_ = fVar139 + fVar176 * 0.71428573;
    auVar239._24_4_ = fVar140 + fVar180 * 0.8571429;
    auVar239._28_4_ = fStack_ac4 + fVar184;
    auVar206 = vsubps_avx(auVar279,auVar239);
    local_ae0._4_4_ = auVar239._4_4_ * auVar239._4_4_;
    local_ae0._0_4_ = auVar239._0_4_ * auVar239._0_4_;
    fStack_ad8 = auVar239._8_4_ * auVar239._8_4_;
    fStack_ad4 = auVar239._12_4_ * auVar239._12_4_;
    fStack_ad0 = auVar239._16_4_ * auVar239._16_4_;
    fStack_acc = auVar239._20_4_ * auVar239._20_4_;
    fStack_ac8 = auVar239._24_4_ * auVar239._24_4_;
    fVar246 = auVar239._0_4_ * 3.0;
    fVar247 = auVar239._4_4_ * 3.0;
    fVar249 = auVar239._8_4_ * 3.0;
    fVar265 = auVar239._12_4_ * 3.0;
    fVar266 = auVar239._16_4_ * 3.0;
    fVar267 = auVar239._20_4_ * 3.0;
    fVar268 = auVar239._24_4_ * 3.0;
    fVar324 = auVar264._28_4_ + -5.0;
    fVar142 = auVar206._0_4_;
    auVar342._0_4_ = fVar142 * fVar142;
    fVar177 = auVar206._4_4_;
    auVar342._4_4_ = fVar177 * fVar177;
    fVar181 = auVar206._8_4_;
    auVar342._8_4_ = fVar181 * fVar181;
    fVar223 = auVar206._12_4_;
    auVar342._12_4_ = fVar223 * fVar223;
    fVar243 = auVar206._16_4_;
    auVar342._16_4_ = fVar243 * fVar243;
    fVar244 = auVar206._20_4_;
    auVar342._20_4_ = fVar244 * fVar244;
    fVar245 = auVar206._24_4_;
    auVar342._28_36_ = auVar332._28_36_;
    auVar342._24_4_ = fVar245 * fVar245;
    fVar248 = auVar206._28_4_;
    fVar269 = (auVar342._0_4_ * (fVar142 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar270 = (auVar342._4_4_ * (fVar177 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar271 = (auVar342._8_4_ * (fVar181 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar286 = (auVar342._12_4_ * (fVar223 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar287 = (auVar342._16_4_ * (fVar243 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar288 = (auVar342._20_4_ * (fVar244 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar289 = (auVar342._24_4_ * (fVar245 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar290 = -fVar142 * auVar239._0_4_ * auVar239._0_4_ * 0.5;
    fVar291 = -fVar177 * auVar239._4_4_ * auVar239._4_4_ * 0.5;
    fVar344 = -fVar181 * auVar239._8_4_ * auVar239._8_4_ * 0.5;
    fVar346 = -fVar223 * auVar239._12_4_ * auVar239._12_4_ * 0.5;
    fVar348 = -fVar243 * auVar239._16_4_ * auVar239._16_4_ * 0.5;
    fVar351 = -fVar244 * auVar239._20_4_ * auVar239._20_4_ * 0.5;
    fVar354 = -fVar245 * auVar239._24_4_ * auVar239._24_4_ * 0.5;
    fVar353 = auVar35._0_4_;
    fVar356 = auVar35._4_4_;
    fVar407 = auVar35._8_4_;
    fVar411 = auVar35._12_4_;
    fVar376 = auVar36._0_4_;
    fVar443 = auVar36._4_4_;
    fVar444 = auVar36._8_4_;
    fVar350 = auVar36._12_4_;
    fVar425 = auVar33._0_4_;
    fVar307 = auVar33._4_4_;
    fVar432 = auVar33._8_4_;
    fVar434 = auVar33._12_4_;
    fVar375 = auVar368._28_4_ + fVar434;
    fVar426 = (auVar239._0_4_ * auVar239._0_4_ * (fVar246 + -5.0) + 2.0) * 0.5;
    fVar431 = (auVar239._4_4_ * auVar239._4_4_ * (fVar247 + -5.0) + 2.0) * 0.5;
    fVar433 = (auVar239._8_4_ * auVar239._8_4_ * (fVar249 + -5.0) + 2.0) * 0.5;
    fVar435 = (auVar239._12_4_ * auVar239._12_4_ * (fVar265 + -5.0) + 2.0) * 0.5;
    fVar436 = (auVar239._16_4_ * auVar239._16_4_ * (fVar266 + -5.0) + 2.0) * 0.5;
    fVar437 = (auVar239._20_4_ * auVar239._20_4_ * (fVar267 + -5.0) + 2.0) * 0.5;
    fVar438 = (auVar239._24_4_ * auVar239._24_4_ * (fVar268 + -5.0) + 2.0) * 0.5;
    fVar424 = -auVar239._28_4_;
    fVar394 = -auVar239._0_4_ * fVar142 * fVar142 * 0.5;
    fVar404 = -auVar239._4_4_ * fVar177 * fVar177 * 0.5;
    fVar408 = -auVar239._8_4_ * fVar181 * fVar181 * 0.5;
    fVar412 = -auVar239._12_4_ * fVar223 * fVar223 * 0.5;
    fVar415 = -auVar239._16_4_ * fVar243 * fVar243 * 0.5;
    fVar418 = -auVar239._20_4_ * fVar244 * fVar244 * 0.5;
    fVar421 = -auVar239._24_4_ * fVar245 * fVar245 * 0.5;
    fVar333 = fVar394 * (float)local_4c0._0_4_ +
              fVar426 * (float)local_4e0._0_4_ + fVar353 * fVar290 + fVar425 * fVar269;
    fVar343 = fVar404 * (float)local_4c0._4_4_ +
              fVar431 * (float)local_4e0._4_4_ + fVar356 * fVar291 + fVar307 * fVar270;
    fVar345 = fVar408 * fStack_4b8 + fVar433 * fStack_4d8 + fVar407 * fVar344 + fVar432 * fVar271;
    fVar347 = fVar412 * fStack_4b4 + fVar435 * fStack_4d4 + fVar411 * fVar346 + fVar434 * fVar286;
    fVar349 = fVar415 * fStack_4b0 + fVar436 * fStack_4d0 + fVar353 * fVar348 + fVar425 * fVar287;
    fVar352 = fVar418 * fStack_4ac + fVar437 * fStack_4cc + fVar356 * fVar351 + fVar307 * fVar288;
    fVar355 = fVar421 * fStack_4a8 + fVar438 * fStack_4c8 + fVar407 * fVar354 + fVar432 * fVar289;
    fVar357 = fVar434 + 2.0 + -fVar248 + fVar375;
    local_9a0 = (float)local_1e0._0_4_ * fVar394 +
                fVar426 * (float)local_500._0_4_ +
                fVar376 * fVar290 + fVar269 * (float)local_540._0_4_;
    fStack_99c = (float)local_1e0._4_4_ * fVar404 +
                 fVar431 * (float)local_500._4_4_ +
                 fVar443 * fVar291 + fVar270 * (float)local_540._4_4_;
    fStack_998 = fStack_1d8 * fVar408 +
                 fVar433 * fStack_4f8 + fVar444 * fVar344 + fVar271 * fStack_538;
    fStack_994 = fStack_1d4 * fVar412 +
                 fVar435 * fStack_4f4 + fVar350 * fVar346 + fVar286 * fStack_534;
    fStack_990 = fStack_1d0 * fVar415 +
                 fVar436 * fStack_4f0 + fVar376 * fVar348 + fVar287 * fStack_530;
    fStack_98c = fStack_1cc * fVar418 +
                 fVar437 * fStack_4ec + fVar443 * fVar351 + fVar288 * fStack_52c;
    fStack_988 = fStack_1c8 * fVar421 +
                 fVar438 * fStack_4e8 + fVar444 * fVar354 + fVar289 * fStack_528;
    fStack_984 = fVar357 + fVar375 + fVar350 + fVar434;
    fVar193 = (float)local_200._0_4_ * fVar394 +
              fVar426 * (float)local_520._0_4_ +
              fVar290 * (float)local_5a0._0_4_ + fVar269 * (float)local_560._0_4_;
    fVar216 = (float)local_200._4_4_ * fVar404 +
              fVar431 * (float)local_520._4_4_ +
              fVar291 * (float)local_5a0._4_4_ + fVar270 * (float)local_560._4_4_;
    fVar217 = fStack_1f8 * fVar408 +
              fVar433 * fStack_518 + fVar344 * fStack_598 + fVar271 * fStack_558;
    fVar218 = fStack_1f4 * fVar412 +
              fVar435 * fStack_514 + fVar346 * fStack_594 + fVar286 * fStack_554;
    fVar219 = fStack_1f0 * fVar415 +
              fVar436 * fStack_510 + fVar348 * fStack_590 + fVar287 * fStack_550;
    fVar220 = fStack_1ec * fVar418 +
              fVar437 * fStack_50c + fVar351 * fStack_58c + fVar288 * fStack_54c;
    fVar221 = fStack_1e8 * fVar421 +
              fVar438 * fStack_508 + fVar354 * fStack_588 + fVar289 * fStack_548;
    fVar222 = fStack_984 + fVar350 + fVar434 + fVar411 + fVar434;
    local_900._0_4_ =
         (float)local_220._0_4_ * fVar394 +
         (float)local_240._0_4_ * fVar426 +
         fVar290 * (float)local_260._0_4_ + fVar269 * (float)local_580._0_4_;
    local_900._4_4_ =
         (float)local_220._4_4_ * fVar404 +
         (float)local_240._4_4_ * fVar431 +
         fVar291 * (float)local_260._4_4_ + fVar270 * (float)local_580._4_4_;
    local_900._8_4_ =
         fStack_218 * fVar408 + fStack_238 * fVar433 + fVar344 * fStack_258 + fVar271 * fStack_578;
    local_900._12_4_ =
         fStack_214 * fVar412 + fStack_234 * fVar435 + fVar346 * fStack_254 + fVar286 * fStack_574;
    local_900._16_4_ =
         fStack_210 * fVar415 + fStack_230 * fVar436 + fVar348 * fStack_250 + fVar287 * fStack_570;
    local_900._20_4_ =
         fStack_20c * fVar418 + fStack_22c * fVar437 + fVar351 * fStack_24c + fVar288 * fStack_56c;
    local_900._24_4_ =
         fStack_208 * fVar421 + fStack_228 * fVar438 + fVar354 * fStack_248 + fVar289 * fStack_568;
    local_900._28_4_ = fStack_984 + fVar434 + 2.0 + -fVar248 + -3.0;
    auVar41._4_4_ = (fVar177 + fVar177) * auVar239._4_4_;
    auVar41._0_4_ = (fVar142 + fVar142) * auVar239._0_4_;
    auVar41._8_4_ = (fVar181 + fVar181) * auVar239._8_4_;
    auVar41._12_4_ = (fVar223 + fVar223) * auVar239._12_4_;
    auVar41._16_4_ = (fVar243 + fVar243) * auVar239._16_4_;
    auVar41._20_4_ = (fVar244 + fVar244) * auVar239._20_4_;
    auVar41._24_4_ = (fVar245 + fVar245) * auVar239._24_4_;
    auVar41._28_4_ = auVar239._28_4_ + auVar239._28_4_;
    auVar206 = vsubps_avx(auVar41,auVar342._0_32_);
    fVar291 = auVar264._28_4_ + 2.0;
    auVar42._4_4_ = (fVar177 + fVar177) * (fVar247 + 2.0);
    auVar42._0_4_ = (fVar142 + fVar142) * (fVar246 + 2.0);
    auVar42._8_4_ = (fVar181 + fVar181) * (fVar249 + 2.0);
    auVar42._12_4_ = (fVar223 + fVar223) * (fVar265 + 2.0);
    auVar42._16_4_ = (fVar243 + fVar243) * (fVar266 + 2.0);
    auVar42._20_4_ = (fVar244 + fVar244) * (fVar267 + 2.0);
    auVar42._24_4_ = (fVar245 + fVar245) * (fVar268 + 2.0);
    auVar42._28_4_ = fVar291;
    auVar43._4_4_ = fVar177 * fVar177 * 3.0;
    auVar43._0_4_ = fVar142 * fVar142 * 3.0;
    auVar43._8_4_ = fVar181 * fVar181 * 3.0;
    auVar43._12_4_ = fVar223 * fVar223 * 3.0;
    auVar43._16_4_ = fVar243 * fVar243 * 3.0;
    auVar43._20_4_ = fVar244 * fVar244 * 3.0;
    auVar43._24_4_ = fVar245 * fVar245 * 3.0;
    auVar43._28_4_ = fVar248;
    auVar25 = vsubps_avx(auVar42,auVar43);
    auVar26 = vsubps_avx(_local_ae0,auVar41);
    fVar351 = auVar206._0_4_ * 0.5;
    fVar354 = auVar206._4_4_ * 0.5;
    fVar375 = auVar206._8_4_ * 0.5;
    fVar394 = auVar206._12_4_ * 0.5;
    fVar404 = auVar206._16_4_ * 0.5;
    fVar408 = auVar206._20_4_ * 0.5;
    fVar412 = auVar206._24_4_ * 0.5;
    fVar286 = (auVar239._0_4_ * fVar246 + (auVar239._0_4_ + auVar239._0_4_) * (fVar246 + -5.0)) *
              0.5;
    fVar287 = (auVar239._4_4_ * fVar247 + (auVar239._4_4_ + auVar239._4_4_) * (fVar247 + -5.0)) *
              0.5;
    fVar288 = (auVar239._8_4_ * fVar249 + (auVar239._8_4_ + auVar239._8_4_) * (fVar249 + -5.0)) *
              0.5;
    fVar289 = (auVar239._12_4_ * fVar265 + (auVar239._12_4_ + auVar239._12_4_) * (fVar265 + -5.0)) *
              0.5;
    fVar344 = (auVar239._16_4_ * fVar266 + (auVar239._16_4_ + auVar239._16_4_) * (fVar266 + -5.0)) *
              0.5;
    fVar346 = (auVar239._20_4_ * fVar267 + (auVar239._20_4_ + auVar239._20_4_) * (fVar267 + -5.0)) *
              0.5;
    fVar348 = (auVar239._24_4_ * fVar268 + (auVar239._24_4_ + auVar239._24_4_) * (fVar268 + -5.0)) *
              0.5;
    fVar142 = auVar25._0_4_ * 0.5;
    fVar177 = auVar25._4_4_ * 0.5;
    fVar181 = auVar25._8_4_ * 0.5;
    fVar223 = auVar25._12_4_ * 0.5;
    fVar243 = auVar25._16_4_ * 0.5;
    fVar244 = auVar25._20_4_ * 0.5;
    fVar247 = auVar25._24_4_ * 0.5;
    fVar245 = auVar26._0_4_ * 0.5;
    fVar246 = auVar26._4_4_ * 0.5;
    fVar249 = auVar26._8_4_ * 0.5;
    fVar265 = auVar26._12_4_ * 0.5;
    fVar266 = auVar26._16_4_ * 0.5;
    fVar267 = auVar26._20_4_ * 0.5;
    fVar271 = auVar26._24_4_ * 0.5;
    fVar291 = fVar291 + auVar239._28_4_ + fVar324 + auVar25._28_4_ + auVar26._28_4_;
    auVar198 = vpermilps_avx(ZEXT416((uint)(auVar227._0_4_ * 0.04761905)),0);
    fVar269 = auVar198._0_4_;
    fVar309 = fVar269 * (fVar351 * (float)local_4c0._0_4_ +
                        fVar286 * (float)local_4e0._0_4_ + fVar142 * fVar425 + fVar245 * fVar353);
    fVar270 = auVar198._4_4_;
    fVar318 = fVar270 * (fVar354 * (float)local_4c0._4_4_ +
                        fVar287 * (float)local_4e0._4_4_ + fVar177 * fVar307 + fVar246 * fVar356);
    auVar44._4_4_ = fVar318;
    auVar44._0_4_ = fVar309;
    fVar290 = auVar198._8_4_;
    fVar319 = fVar290 * (fVar375 * fStack_4b8 +
                        fVar288 * fStack_4d8 + fVar181 * fVar432 + fVar249 * fVar407);
    auVar44._8_4_ = fVar319;
    fVar268 = auVar198._12_4_;
    fVar320 = fVar268 * (fVar394 * fStack_4b4 +
                        fVar289 * fStack_4d4 + fVar223 * fVar434 + fVar265 * fVar411);
    auVar44._12_4_ = fVar320;
    fVar321 = fVar269 * (fVar404 * fStack_4b0 +
                        fVar344 * fStack_4d0 + fVar243 * fVar425 + fVar266 * fVar353);
    auVar44._16_4_ = fVar321;
    fVar322 = fVar270 * (fVar408 * fStack_4ac +
                        fVar346 * fStack_4cc + fVar244 * fVar307 + fVar267 * fVar356);
    auVar44._20_4_ = fVar322;
    fVar323 = fVar290 * (fVar412 * fStack_4a8 +
                        fVar348 * fStack_4c8 + fVar247 * fVar432 + fVar271 * fVar407);
    auVar44._24_4_ = fVar323;
    auVar44._28_4_ = fVar248 + fVar248 + auVar206._28_4_ + fVar248 + fVar248 + fVar324;
    fVar377 = fVar269 * ((float)local_1e0._0_4_ * fVar351 +
                        fVar286 * (float)local_500._0_4_ +
                        fVar142 * (float)local_540._0_4_ + fVar245 * fVar376);
    fVar388 = fVar270 * ((float)local_1e0._4_4_ * fVar354 +
                        fVar287 * (float)local_500._4_4_ +
                        fVar177 * (float)local_540._4_4_ + fVar246 * fVar443);
    auVar45._4_4_ = fVar388;
    auVar45._0_4_ = fVar377;
    fVar389 = fVar290 * (fStack_1d8 * fVar375 +
                        fVar288 * fStack_4f8 + fVar181 * fStack_538 + fVar249 * fVar444);
    auVar45._8_4_ = fVar389;
    fVar390 = fVar268 * (fStack_1d4 * fVar394 +
                        fVar289 * fStack_4f4 + fVar223 * fStack_534 + fVar265 * fVar350);
    auVar45._12_4_ = fVar390;
    fVar391 = fVar269 * (fStack_1d0 * fVar404 +
                        fVar344 * fStack_4f0 + fVar243 * fStack_530 + fVar266 * fVar376);
    auVar45._16_4_ = fVar391;
    fVar392 = fVar270 * (fStack_1cc * fVar408 +
                        fVar346 * fStack_4ec + fVar244 * fStack_52c + fVar267 * fVar443);
    auVar45._20_4_ = fVar392;
    fVar393 = fVar290 * (fStack_1c8 * fVar412 +
                        fVar348 * fStack_4e8 + fVar247 * fStack_528 + fVar271 * fVar444);
    auVar45._24_4_ = fVar393;
    auVar45._28_4_ = fStack_1e4;
    fVar395 = fVar269 * ((float)local_200._0_4_ * fVar351 +
                        fVar142 * (float)local_560._0_4_ + fVar245 * (float)local_5a0._0_4_ +
                        fVar286 * (float)local_520._0_4_);
    fVar405 = fVar270 * ((float)local_200._4_4_ * fVar354 +
                        fVar177 * (float)local_560._4_4_ + fVar246 * (float)local_5a0._4_4_ +
                        fVar287 * (float)local_520._4_4_);
    auVar46._4_4_ = fVar405;
    auVar46._0_4_ = fVar395;
    fVar409 = fVar290 * (fStack_1f8 * fVar375 +
                        fVar181 * fStack_558 + fVar249 * fStack_598 + fVar288 * fStack_518);
    auVar46._8_4_ = fVar409;
    fVar413 = fVar268 * (fStack_1f4 * fVar394 +
                        fVar223 * fStack_554 + fVar265 * fStack_594 + fVar289 * fStack_514);
    auVar46._12_4_ = fVar413;
    fVar416 = fVar269 * (fStack_1f0 * fVar404 +
                        fVar243 * fStack_550 + fVar266 * fStack_590 + fVar344 * fStack_510);
    auVar46._16_4_ = fVar416;
    fVar419 = fVar270 * (fStack_1ec * fVar408 +
                        fVar244 * fStack_54c + fVar267 * fStack_58c + fVar346 * fStack_50c);
    auVar46._20_4_ = fVar419;
    fVar422 = fVar290 * (fStack_1e8 * fVar412 +
                        fVar247 * fStack_548 + fVar271 * fStack_588 + fVar348 * fStack_508);
    auVar46._24_4_ = fVar422;
    auVar46._28_4_ = fVar424;
    fVar245 = fVar269 * ((float)local_220._0_4_ * fVar351 +
                        (float)local_240._0_4_ * fVar286 +
                        fVar142 * (float)local_580._0_4_ + (float)local_260._0_4_ * fVar245);
    fVar248 = fVar270 * ((float)local_220._4_4_ * fVar354 +
                        (float)local_240._4_4_ * fVar287 +
                        fVar177 * (float)local_580._4_4_ + (float)local_260._4_4_ * fVar246);
    auVar47._4_4_ = fVar248;
    auVar47._0_4_ = fVar245;
    fVar246 = fVar290 * (fStack_218 * fVar375 +
                        fStack_238 * fVar288 + fVar181 * fStack_578 + fStack_258 * fVar249);
    auVar47._8_4_ = fVar246;
    fVar268 = fVar268 * (fStack_214 * fVar394 +
                        fStack_234 * fVar289 + fVar223 * fStack_574 + fStack_254 * fVar265);
    auVar47._12_4_ = fVar268;
    fVar269 = fVar269 * (fStack_210 * fVar404 +
                        fStack_230 * fVar344 + fVar243 * fStack_570 + fStack_250 * fVar266);
    auVar47._16_4_ = fVar269;
    fVar270 = fVar270 * (fStack_20c * fVar408 +
                        fStack_22c * fVar346 + fVar244 * fStack_56c + fStack_24c * fVar267);
    auVar47._20_4_ = fVar270;
    fVar290 = fVar290 * (fStack_208 * fVar412 +
                        fStack_228 * fVar348 + fVar247 * fStack_568 + fStack_248 * fVar271);
    auVar47._24_4_ = fVar290;
    auVar47._28_4_ = fVar291;
    auVar102._4_4_ = fStack_99c;
    auVar102._0_4_ = local_9a0;
    auVar102._8_4_ = fStack_998;
    auVar102._12_4_ = fStack_994;
    auVar102._16_4_ = fStack_990;
    auVar102._20_4_ = fStack_98c;
    auVar102._24_4_ = fStack_988;
    auVar102._28_4_ = fStack_984;
    auVar206 = vperm2f128_avx(auVar102,auVar102,1);
    auVar206 = vshufps_avx(auVar206,auVar102,0x30);
    auVar27 = vshufps_avx(auVar102,auVar206,0x29);
    auVar98._4_4_ = fVar216;
    auVar98._0_4_ = fVar193;
    auVar98._8_4_ = fVar217;
    auVar98._12_4_ = fVar218;
    auVar98._16_4_ = fVar219;
    auVar98._20_4_ = fVar220;
    auVar98._24_4_ = fVar221;
    auVar98._28_4_ = fVar222;
    auVar206 = vperm2f128_avx(auVar98,auVar98,1);
    auVar206 = vshufps_avx(auVar206,auVar98,0x30);
    auVar28 = vshufps_avx(auVar98,auVar206,0x29);
    auVar25 = vsubps_avx(local_900,auVar47);
    auVar206 = vperm2f128_avx(auVar25,auVar25,1);
    auVar206 = vshufps_avx(auVar206,auVar25,0x30);
    auVar29 = vshufps_avx(auVar25,auVar206,0x29);
    local_2a0 = vsubps_avx(auVar27,auVar102);
    auVar32 = vsubps_avx(auVar28,auVar98);
    fVar177 = local_2a0._0_4_;
    fVar247 = local_2a0._4_4_;
    auVar48._4_4_ = fVar405 * fVar247;
    auVar48._0_4_ = fVar395 * fVar177;
    fVar271 = local_2a0._8_4_;
    auVar48._8_4_ = fVar409 * fVar271;
    fVar346 = local_2a0._12_4_;
    auVar48._12_4_ = fVar413 * fVar346;
    fVar412 = local_2a0._16_4_;
    auVar48._16_4_ = fVar416 * fVar412;
    fVar407 = local_2a0._20_4_;
    auVar48._20_4_ = fVar419 * fVar407;
    fVar431 = local_2a0._24_4_;
    auVar48._24_4_ = fVar422 * fVar431;
    auVar48._28_4_ = auVar25._28_4_;
    fVar181 = auVar32._0_4_;
    fVar249 = auVar32._4_4_;
    auVar49._4_4_ = fVar388 * fVar249;
    auVar49._0_4_ = fVar377 * fVar181;
    fVar286 = auVar32._8_4_;
    auVar49._8_4_ = fVar389 * fVar286;
    fVar348 = auVar32._12_4_;
    auVar49._12_4_ = fVar390 * fVar348;
    fVar324 = auVar32._16_4_;
    auVar49._16_4_ = fVar391 * fVar324;
    fVar411 = auVar32._20_4_;
    auVar49._20_4_ = fVar392 * fVar411;
    fVar432 = auVar32._24_4_;
    auVar49._24_4_ = fVar393 * fVar432;
    auVar49._28_4_ = auVar206._28_4_;
    auVar31 = vsubps_avx(auVar49,auVar48);
    auVar100._4_4_ = fVar343;
    auVar100._0_4_ = fVar333;
    auVar100._8_4_ = fVar345;
    auVar100._12_4_ = fVar347;
    auVar100._16_4_ = fVar349;
    auVar100._20_4_ = fVar352;
    auVar100._24_4_ = fVar355;
    auVar100._28_4_ = fVar357;
    auVar206 = vperm2f128_avx(auVar100,auVar100,1);
    auVar206 = vshufps_avx(auVar206,auVar100,0x30);
    auVar30 = vshufps_avx(auVar100,auVar206,0x29);
    local_2c0 = vsubps_avx(auVar30,auVar100);
    auVar50._4_4_ = fVar249 * fVar318;
    auVar50._0_4_ = fVar181 * fVar309;
    auVar50._8_4_ = fVar286 * fVar319;
    auVar50._12_4_ = fVar348 * fVar320;
    auVar50._16_4_ = fVar324 * fVar321;
    auVar50._20_4_ = fVar411 * fVar322;
    auVar50._24_4_ = fVar432 * fVar323;
    auVar50._28_4_ = auVar206._28_4_;
    fVar223 = local_2c0._0_4_;
    fVar265 = local_2c0._4_4_;
    auVar51._4_4_ = fVar405 * fVar265;
    auVar51._0_4_ = fVar395 * fVar223;
    fVar287 = local_2c0._8_4_;
    auVar51._8_4_ = fVar409 * fVar287;
    fVar351 = local_2c0._12_4_;
    auVar51._12_4_ = fVar413 * fVar351;
    fVar376 = local_2c0._16_4_;
    auVar51._16_4_ = fVar416 * fVar376;
    fVar415 = local_2c0._20_4_;
    auVar51._20_4_ = fVar419 * fVar415;
    fVar433 = local_2c0._24_4_;
    auVar51._24_4_ = fVar422 * fVar433;
    auVar51._28_4_ = fStack_984;
    auVar39 = vsubps_avx(auVar51,auVar50);
    auVar52._4_4_ = fVar388 * fVar265;
    auVar52._0_4_ = fVar377 * fVar223;
    auVar52._8_4_ = fVar389 * fVar287;
    auVar52._12_4_ = fVar390 * fVar351;
    auVar52._16_4_ = fVar391 * fVar376;
    auVar52._20_4_ = fVar392 * fVar415;
    auVar52._24_4_ = fVar393 * fVar433;
    auVar52._28_4_ = fStack_984;
    auVar53._4_4_ = fVar247 * fVar318;
    auVar53._0_4_ = fVar177 * fVar309;
    auVar53._8_4_ = fVar271 * fVar319;
    auVar53._12_4_ = fVar346 * fVar320;
    auVar53._16_4_ = fVar412 * fVar321;
    auVar53._20_4_ = fVar407 * fVar322;
    auVar53._24_4_ = fVar431 * fVar323;
    auVar53._28_4_ = fVar357;
    auVar40 = vsubps_avx(auVar53,auVar52);
    fVar142 = auVar40._28_4_;
    auVar240._0_4_ = fVar223 * fVar223 + fVar177 * fVar177 + fVar181 * fVar181;
    auVar240._4_4_ = fVar265 * fVar265 + fVar247 * fVar247 + fVar249 * fVar249;
    auVar240._8_4_ = fVar287 * fVar287 + fVar271 * fVar271 + fVar286 * fVar286;
    auVar240._12_4_ = fVar351 * fVar351 + fVar346 * fVar346 + fVar348 * fVar348;
    auVar240._16_4_ = fVar376 * fVar376 + fVar412 * fVar412 + fVar324 * fVar324;
    auVar240._20_4_ = fVar415 * fVar415 + fVar407 * fVar407 + fVar411 * fVar411;
    auVar240._24_4_ = fVar433 * fVar433 + fVar431 * fVar431 + fVar432 * fVar432;
    auVar240._28_4_ = fVar142 + fVar142 + auVar31._28_4_;
    auVar206 = vrcpps_avx(auVar240);
    fVar344 = auVar206._0_4_;
    fVar394 = auVar206._4_4_;
    auVar54._4_4_ = fVar394 * auVar240._4_4_;
    auVar54._0_4_ = fVar344 * auVar240._0_4_;
    fVar404 = auVar206._8_4_;
    auVar54._8_4_ = fVar404 * auVar240._8_4_;
    fVar408 = auVar206._12_4_;
    auVar54._12_4_ = fVar408 * auVar240._12_4_;
    fVar350 = auVar206._16_4_;
    auVar54._16_4_ = fVar350 * auVar240._16_4_;
    fVar353 = auVar206._20_4_;
    auVar54._20_4_ = fVar353 * auVar240._20_4_;
    fVar356 = auVar206._24_4_;
    auVar54._24_4_ = fVar356 * auVar240._24_4_;
    auVar54._28_4_ = fVar357;
    auVar209._8_4_ = 0x3f800000;
    auVar209._0_8_ = 0x3f8000003f800000;
    auVar209._12_4_ = 0x3f800000;
    auVar209._16_4_ = 0x3f800000;
    auVar209._20_4_ = 0x3f800000;
    auVar209._24_4_ = 0x3f800000;
    auVar209._28_4_ = 0x3f800000;
    auVar124 = vsubps_avx(auVar209,auVar54);
    fVar344 = fVar344 + fVar344 * auVar124._0_4_;
    fVar394 = fVar394 + fVar394 * auVar124._4_4_;
    fVar404 = fVar404 + fVar404 * auVar124._8_4_;
    fVar408 = fVar408 + fVar408 * auVar124._12_4_;
    fVar350 = fVar350 + fVar350 * auVar124._16_4_;
    fVar353 = fVar353 + fVar353 * auVar124._20_4_;
    fVar356 = fVar356 + fVar356 * auVar124._24_4_;
    auVar25 = vperm2f128_avx(auVar45,auVar45,1);
    auVar25 = vshufps_avx(auVar25,auVar45,0x30);
    local_a00 = vshufps_avx(auVar45,auVar25,0x29);
    auVar25 = vperm2f128_avx(auVar46,auVar46,1);
    auVar25 = vshufps_avx(auVar25,auVar46,0x30);
    auVar26 = vshufps_avx(auVar46,auVar25,0x29);
    fVar396 = auVar26._0_4_;
    fVar406 = auVar26._4_4_;
    auVar55._4_4_ = fVar406 * fVar247;
    auVar55._0_4_ = fVar396 * fVar177;
    fVar410 = auVar26._8_4_;
    auVar55._8_4_ = fVar410 * fVar271;
    fVar414 = auVar26._12_4_;
    auVar55._12_4_ = fVar414 * fVar346;
    fVar417 = auVar26._16_4_;
    auVar55._16_4_ = fVar417 * fVar412;
    fVar420 = auVar26._20_4_;
    auVar55._20_4_ = fVar420 * fVar407;
    fVar423 = auVar26._24_4_;
    auVar55._24_4_ = fVar423 * fVar431;
    auVar55._28_4_ = auVar25._28_4_;
    fVar243 = local_a00._0_4_;
    fVar266 = local_a00._4_4_;
    auVar56._4_4_ = fVar249 * fVar266;
    auVar56._0_4_ = fVar181 * fVar243;
    fVar288 = local_a00._8_4_;
    auVar56._8_4_ = fVar286 * fVar288;
    fVar354 = local_a00._12_4_;
    auVar56._12_4_ = fVar348 * fVar354;
    fVar443 = local_a00._16_4_;
    auVar56._16_4_ = fVar324 * fVar443;
    fVar418 = local_a00._20_4_;
    auVar56._20_4_ = fVar411 * fVar418;
    fVar434 = local_a00._24_4_;
    auVar56._24_4_ = fVar432 * fVar434;
    auVar56._28_4_ = fStack_1e4;
    auVar125 = vsubps_avx(auVar56,auVar55);
    auVar25 = vperm2f128_avx(auVar44,auVar44,1);
    auVar25 = vshufps_avx(auVar25,auVar44,0x30);
    local_a20 = vshufps_avx(auVar44,auVar25,0x29);
    fVar244 = local_a20._0_4_;
    fVar267 = local_a20._4_4_;
    auVar57._4_4_ = fVar249 * fVar267;
    auVar57._0_4_ = fVar181 * fVar244;
    fVar289 = local_a20._8_4_;
    auVar57._8_4_ = fVar286 * fVar289;
    fVar375 = local_a20._12_4_;
    auVar57._12_4_ = fVar348 * fVar375;
    fVar444 = local_a20._16_4_;
    auVar57._16_4_ = fVar324 * fVar444;
    fVar421 = local_a20._20_4_;
    auVar57._20_4_ = fVar411 * fVar421;
    fVar435 = local_a20._24_4_;
    auVar57._24_4_ = fVar432 * fVar435;
    auVar57._28_4_ = auVar25._28_4_;
    auVar58._4_4_ = fVar406 * fVar265;
    auVar58._0_4_ = fVar396 * fVar223;
    auVar58._8_4_ = fVar410 * fVar287;
    auVar58._12_4_ = fVar414 * fVar351;
    auVar58._16_4_ = fVar417 * fVar376;
    auVar58._20_4_ = fVar420 * fVar415;
    uVar109 = auVar26._28_4_;
    auVar58._24_4_ = fVar423 * fVar433;
    auVar58._28_4_ = uVar109;
    auVar25 = vsubps_avx(auVar58,auVar57);
    auVar59._4_4_ = fVar265 * fVar266;
    auVar59._0_4_ = fVar223 * fVar243;
    auVar59._8_4_ = fVar287 * fVar288;
    auVar59._12_4_ = fVar351 * fVar354;
    auVar59._16_4_ = fVar376 * fVar443;
    auVar59._20_4_ = fVar415 * fVar418;
    auVar59._24_4_ = fVar433 * fVar434;
    auVar59._28_4_ = uVar109;
    auVar60._4_4_ = fVar247 * fVar267;
    auVar60._0_4_ = fVar177 * fVar244;
    auVar60._8_4_ = fVar271 * fVar289;
    auVar60._12_4_ = fVar346 * fVar375;
    auVar60._16_4_ = fVar412 * fVar444;
    auVar60._20_4_ = fVar407 * fVar421;
    auVar60._24_4_ = fVar431 * fVar435;
    auVar60._28_4_ = fStack_1c4;
    auVar126 = vsubps_avx(auVar60,auVar59);
    auVar61._4_4_ =
         fVar394 * (auVar31._4_4_ * auVar31._4_4_ +
                   auVar40._4_4_ * auVar40._4_4_ + auVar39._4_4_ * auVar39._4_4_);
    auVar61._0_4_ =
         fVar344 * (auVar31._0_4_ * auVar31._0_4_ +
                   auVar40._0_4_ * auVar40._0_4_ + auVar39._0_4_ * auVar39._0_4_);
    auVar61._8_4_ =
         fVar404 * (auVar31._8_4_ * auVar31._8_4_ +
                   auVar40._8_4_ * auVar40._8_4_ + auVar39._8_4_ * auVar39._8_4_);
    auVar61._12_4_ =
         fVar408 * (auVar31._12_4_ * auVar31._12_4_ +
                   auVar40._12_4_ * auVar40._12_4_ + auVar39._12_4_ * auVar39._12_4_);
    auVar61._16_4_ =
         fVar350 * (auVar31._16_4_ * auVar31._16_4_ +
                   auVar40._16_4_ * auVar40._16_4_ + auVar39._16_4_ * auVar39._16_4_);
    auVar61._20_4_ =
         fVar353 * (auVar31._20_4_ * auVar31._20_4_ +
                   auVar40._20_4_ * auVar40._20_4_ + auVar39._20_4_ * auVar39._20_4_);
    auVar61._24_4_ =
         fVar356 * (auVar31._24_4_ * auVar31._24_4_ +
                   auVar40._24_4_ * auVar40._24_4_ + auVar39._24_4_ * auVar39._24_4_);
    auVar61._28_4_ = auVar31._28_4_ + fVar142 + auVar39._28_4_;
    auVar62._4_4_ =
         (auVar125._4_4_ * auVar125._4_4_ +
         auVar25._4_4_ * auVar25._4_4_ + auVar126._4_4_ * auVar126._4_4_) * fVar394;
    auVar62._0_4_ =
         (auVar125._0_4_ * auVar125._0_4_ +
         auVar25._0_4_ * auVar25._0_4_ + auVar126._0_4_ * auVar126._0_4_) * fVar344;
    auVar62._8_4_ =
         (auVar125._8_4_ * auVar125._8_4_ +
         auVar25._8_4_ * auVar25._8_4_ + auVar126._8_4_ * auVar126._8_4_) * fVar404;
    auVar62._12_4_ =
         (auVar125._12_4_ * auVar125._12_4_ +
         auVar25._12_4_ * auVar25._12_4_ + auVar126._12_4_ * auVar126._12_4_) * fVar408;
    auVar62._16_4_ =
         (auVar125._16_4_ * auVar125._16_4_ +
         auVar25._16_4_ * auVar25._16_4_ + auVar126._16_4_ * auVar126._16_4_) * fVar350;
    auVar62._20_4_ =
         (auVar125._20_4_ * auVar125._20_4_ +
         auVar25._20_4_ * auVar25._20_4_ + auVar126._20_4_ * auVar126._20_4_) * fVar353;
    auVar62._24_4_ =
         (auVar125._24_4_ * auVar125._24_4_ +
         auVar25._24_4_ * auVar25._24_4_ + auVar126._24_4_ * auVar126._24_4_) * fVar356;
    auVar62._28_4_ = auVar206._28_4_ + auVar124._28_4_;
    auVar206 = vmaxps_avx(auVar61,auVar62);
    auVar25 = vperm2f128_avx(local_900,local_900,1);
    auVar25 = vshufps_avx(auVar25,local_900,0x30);
    auVar31 = vshufps_avx(local_900,auVar25,0x29);
    auVar163._0_4_ = (float)local_900._0_4_ + fVar245;
    auVar163._4_4_ = local_900._4_4_ + fVar248;
    auVar163._8_4_ = local_900._8_4_ + fVar246;
    auVar163._12_4_ = local_900._12_4_ + fVar268;
    auVar163._16_4_ = local_900._16_4_ + fVar269;
    auVar163._20_4_ = local_900._20_4_ + fVar270;
    auVar163._24_4_ = local_900._24_4_ + fVar290;
    auVar163._28_4_ = local_900._28_4_ + fVar291;
    auVar25 = vmaxps_avx(local_900,auVar163);
    auVar26 = vmaxps_avx(auVar29,auVar31);
    auVar25 = vmaxps_avx(auVar25,auVar26);
    auVar26 = vrsqrtps_avx(auVar240);
    fVar142 = auVar26._0_4_;
    fVar245 = auVar26._4_4_;
    fVar248 = auVar26._8_4_;
    fVar246 = auVar26._12_4_;
    fVar268 = auVar26._16_4_;
    fVar269 = auVar26._20_4_;
    fVar270 = auVar26._24_4_;
    auVar63._4_4_ = fVar245 * fVar245 * fVar245 * auVar240._4_4_ * 0.5;
    auVar63._0_4_ = fVar142 * fVar142 * fVar142 * auVar240._0_4_ * 0.5;
    auVar63._8_4_ = fVar248 * fVar248 * fVar248 * auVar240._8_4_ * 0.5;
    auVar63._12_4_ = fVar246 * fVar246 * fVar246 * auVar240._12_4_ * 0.5;
    auVar63._16_4_ = fVar268 * fVar268 * fVar268 * auVar240._16_4_ * 0.5;
    auVar63._20_4_ = fVar269 * fVar269 * fVar269 * auVar240._20_4_ * 0.5;
    auVar63._24_4_ = fVar270 * fVar270 * fVar270 * auVar240._24_4_ * 0.5;
    auVar63._28_4_ = auVar240._28_4_;
    auVar64._4_4_ = fVar245 * 1.5;
    auVar64._0_4_ = fVar142 * 1.5;
    auVar64._8_4_ = fVar248 * 1.5;
    auVar64._12_4_ = fVar246 * 1.5;
    auVar64._16_4_ = fVar268 * 1.5;
    auVar64._20_4_ = fVar269 * 1.5;
    auVar64._24_4_ = fVar270 * 1.5;
    auVar64._28_4_ = auVar26._28_4_;
    local_640 = vsubps_avx(auVar64,auVar63);
    local_a40 = vsubps_avx(ZEXT832(0) << 0x20,auVar102);
    auVar99._4_4_ = fVar216;
    auVar99._0_4_ = fVar193;
    auVar99._8_4_ = fVar217;
    auVar99._12_4_ = fVar218;
    auVar99._16_4_ = fVar219;
    auVar99._20_4_ = fVar220;
    auVar99._24_4_ = fVar221;
    auVar99._28_4_ = fVar222;
    local_a60 = vsubps_avx(ZEXT832(0) << 0x20,auVar99);
    fVar245 = local_a60._0_4_;
    fVar268 = local_a60._4_4_;
    fVar290 = local_a60._8_4_;
    fVar394 = local_a60._12_4_;
    fVar350 = local_a60._16_4_;
    fVar425 = local_a60._20_4_;
    fVar436 = local_a60._24_4_;
    fVar358 = local_a40._0_4_;
    fVar369 = local_a40._4_4_;
    fVar370 = local_a40._8_4_;
    fVar371 = local_a40._12_4_;
    fVar372 = local_a40._16_4_;
    fVar373 = local_a40._20_4_;
    fVar374 = local_a40._24_4_;
    auVar101._4_4_ = fVar343;
    auVar101._0_4_ = fVar333;
    auVar101._8_4_ = fVar345;
    auVar101._12_4_ = fVar347;
    auVar101._16_4_ = fVar349;
    auVar101._20_4_ = fVar352;
    auVar101._24_4_ = fVar355;
    auVar101._28_4_ = fVar357;
    auVar39 = vsubps_avx(ZEXT832(0) << 0x20,auVar101);
    fVar248 = auVar39._0_4_;
    fVar269 = auVar39._4_4_;
    fVar291 = auVar39._8_4_;
    fVar404 = auVar39._12_4_;
    fVar353 = auVar39._16_4_;
    fVar426 = auVar39._20_4_;
    fVar437 = auVar39._24_4_;
    auVar339._0_4_ =
         (float)local_880._0_4_ * fVar248 +
         fVar358 * (float)local_920._0_4_ + (float)local_8a0._0_4_ * fVar245;
    auVar339._4_4_ =
         (float)local_880._4_4_ * fVar269 +
         fVar369 * (float)local_920._4_4_ + (float)local_8a0._4_4_ * fVar268;
    auVar339._8_4_ = fStack_878 * fVar291 + fVar370 * fStack_918 + fStack_898 * fVar290;
    auVar339._12_4_ = fStack_874 * fVar404 + fVar371 * fStack_914 + fStack_894 * fVar394;
    auVar339._16_4_ = fStack_870 * fVar353 + fVar372 * fStack_910 + fStack_890 * fVar350;
    auVar339._20_4_ = fStack_86c * fVar426 + fVar373 * fStack_90c + fStack_88c * fVar425;
    auVar339._24_4_ = fStack_868 * fVar437 + fVar374 * fStack_908 + fStack_888 * fVar436;
    auVar339._28_4_ = auVar126._28_4_ + auVar26._28_4_ + auVar240._28_4_;
    auVar402._0_4_ = fVar248 * fVar248 + fVar358 * fVar358 + fVar245 * fVar245;
    auVar402._4_4_ = fVar269 * fVar269 + fVar369 * fVar369 + fVar268 * fVar268;
    auVar402._8_4_ = fVar291 * fVar291 + fVar370 * fVar370 + fVar290 * fVar290;
    auVar402._12_4_ = fVar404 * fVar404 + fVar371 * fVar371 + fVar394 * fVar394;
    auVar402._16_4_ = fVar353 * fVar353 + fVar372 * fVar372 + fVar350 * fVar350;
    auVar402._20_4_ = fVar426 * fVar426 + fVar373 * fVar373 + fVar425 * fVar425;
    auVar402._24_4_ = fVar437 * fVar437 + fVar374 * fVar374 + fVar436 * fVar436;
    auVar402._28_4_ = fStack_1c4 + fStack_1c4 + auVar126._28_4_;
    fVar246 = local_640._0_4_;
    fVar270 = local_640._4_4_;
    fVar344 = local_640._8_4_;
    fVar408 = local_640._12_4_;
    fVar356 = local_640._16_4_;
    fVar307 = local_640._20_4_;
    fVar438 = local_640._24_4_;
    auVar125 = local_2c0;
    local_660._0_4_ =
         (float)local_880._0_4_ * fVar223 * fVar246 +
         fVar177 * fVar246 * (float)local_920._0_4_ + fVar181 * fVar246 * (float)local_8a0._0_4_;
    local_660._4_4_ =
         (float)local_880._4_4_ * fVar265 * fVar270 +
         fVar247 * fVar270 * (float)local_920._4_4_ + fVar249 * fVar270 * (float)local_8a0._4_4_;
    local_660._8_4_ =
         fStack_878 * fVar287 * fVar344 +
         fVar271 * fVar344 * fStack_918 + fVar286 * fVar344 * fStack_898;
    local_660._12_4_ =
         fStack_874 * fVar351 * fVar408 +
         fVar346 * fVar408 * fStack_914 + fVar348 * fVar408 * fStack_894;
    local_660._16_4_ =
         fStack_870 * fVar376 * fVar356 +
         fVar412 * fVar356 * fStack_910 + fVar324 * fVar356 * fStack_890;
    local_660._20_4_ =
         fStack_86c * fVar415 * fVar307 +
         fVar407 * fVar307 * fStack_90c + fVar411 * fVar307 * fStack_88c;
    local_660._24_4_ =
         fStack_868 * fVar433 * fVar438 +
         fVar431 * fVar438 * fStack_908 + fVar432 * fVar438 * fStack_888;
    local_660._28_4_ = fStack_864 + fStack_904 + fStack_884;
    auVar368 = ZEXT864(0) << 0x20;
    fVar142 = fStack_864 + fStack_904 + fStack_884;
    local_680._0_4_ =
         fVar248 * fVar223 * fVar246 + fVar358 * fVar177 * fVar246 + fVar181 * fVar246 * fVar245;
    local_680._4_4_ =
         fVar269 * fVar265 * fVar270 + fVar369 * fVar247 * fVar270 + fVar249 * fVar270 * fVar268;
    local_680._8_4_ =
         fVar291 * fVar287 * fVar344 + fVar370 * fVar271 * fVar344 + fVar286 * fVar344 * fVar290;
    local_680._12_4_ =
         fVar404 * fVar351 * fVar408 + fVar371 * fVar346 * fVar408 + fVar348 * fVar408 * fVar394;
    local_680._16_4_ =
         fVar353 * fVar376 * fVar356 + fVar372 * fVar412 * fVar356 + fVar324 * fVar356 * fVar350;
    local_680._20_4_ =
         fVar426 * fVar415 * fVar307 + fVar373 * fVar407 * fVar307 + fVar411 * fVar307 * fVar425;
    local_680._24_4_ =
         fVar437 * fVar433 * fVar438 + fVar374 * fVar431 * fVar438 + fVar432 * fVar438 * fVar436;
    local_680._28_4_ = fStack_904 + fVar142;
    auVar65._4_4_ = local_660._4_4_ * local_680._4_4_;
    auVar65._0_4_ = local_660._0_4_ * local_680._0_4_;
    auVar65._8_4_ = local_660._8_4_ * local_680._8_4_;
    auVar65._12_4_ = local_660._12_4_ * local_680._12_4_;
    auVar65._16_4_ = local_660._16_4_ * local_680._16_4_;
    auVar65._20_4_ = local_660._20_4_ * local_680._20_4_;
    auVar65._24_4_ = local_660._24_4_ * local_680._24_4_;
    auVar65._28_4_ = fVar142;
    auVar39 = vsubps_avx(auVar339,auVar65);
    auVar66._4_4_ = local_680._4_4_ * local_680._4_4_;
    auVar66._0_4_ = local_680._0_4_ * local_680._0_4_;
    auVar66._8_4_ = local_680._8_4_ * local_680._8_4_;
    auVar66._12_4_ = local_680._12_4_ * local_680._12_4_;
    auVar66._16_4_ = local_680._16_4_ * local_680._16_4_;
    auVar66._20_4_ = local_680._20_4_ * local_680._20_4_;
    auVar66._24_4_ = local_680._24_4_ * local_680._24_4_;
    auVar66._28_4_ = fStack_904;
    auVar40 = vsubps_avx(auVar402,auVar66);
    auVar26 = vsqrtps_avx(auVar206);
    fVar142 = (auVar26._0_4_ + auVar25._0_4_) * 1.0000002;
    fVar178 = (auVar26._4_4_ + auVar25._4_4_) * 1.0000002;
    fVar182 = (auVar26._8_4_ + auVar25._8_4_) * 1.0000002;
    fVar185 = (auVar26._12_4_ + auVar25._12_4_) * 1.0000002;
    fVar187 = (auVar26._16_4_ + auVar25._16_4_) * 1.0000002;
    fVar189 = (auVar26._20_4_ + auVar25._20_4_) * 1.0000002;
    fVar191 = (auVar26._24_4_ + auVar25._24_4_) * 1.0000002;
    auVar67._4_4_ = fVar178 * fVar178;
    auVar67._0_4_ = fVar142 * fVar142;
    auVar67._8_4_ = fVar182 * fVar182;
    auVar67._12_4_ = fVar185 * fVar185;
    auVar67._16_4_ = fVar187 * fVar187;
    auVar67._20_4_ = fVar189 * fVar189;
    auVar67._24_4_ = fVar191 * fVar191;
    auVar67._28_4_ = auVar26._28_4_ + auVar25._28_4_;
    local_3e0._0_4_ = auVar39._0_4_ + auVar39._0_4_;
    local_3e0._4_4_ = auVar39._4_4_ + auVar39._4_4_;
    local_3e0._8_4_ = auVar39._8_4_ + auVar39._8_4_;
    local_3e0._12_4_ = auVar39._12_4_ + auVar39._12_4_;
    local_3e0._16_4_ = auVar39._16_4_ + auVar39._16_4_;
    local_3e0._20_4_ = auVar39._20_4_ + auVar39._20_4_;
    local_3e0._24_4_ = auVar39._24_4_ + auVar39._24_4_;
    fVar142 = auVar39._28_4_;
    local_3e0._28_4_ = fVar142 + fVar142;
    auVar25 = vsubps_avx(auVar40,auVar67);
    auVar68._4_4_ = local_660._4_4_ * local_660._4_4_;
    auVar68._0_4_ = local_660._0_4_ * local_660._0_4_;
    auVar68._8_4_ = local_660._8_4_ * local_660._8_4_;
    auVar68._12_4_ = local_660._12_4_ * local_660._12_4_;
    auVar68._16_4_ = local_660._16_4_ * local_660._16_4_;
    auVar68._20_4_ = local_660._20_4_ * local_660._20_4_;
    auVar68._24_4_ = local_660._24_4_ * local_660._24_4_;
    auVar68._28_4_ = fVar142;
    auVar39 = vsubps_avx(local_280,auVar68);
    auVar69._4_4_ = local_3e0._4_4_ * local_3e0._4_4_;
    auVar69._0_4_ = local_3e0._0_4_ * local_3e0._0_4_;
    auVar69._8_4_ = local_3e0._8_4_ * local_3e0._8_4_;
    auVar69._12_4_ = local_3e0._12_4_ * local_3e0._12_4_;
    auVar69._16_4_ = local_3e0._16_4_ * local_3e0._16_4_;
    auVar69._20_4_ = local_3e0._20_4_ * local_3e0._20_4_;
    auVar69._24_4_ = local_3e0._24_4_ * local_3e0._24_4_;
    auVar69._28_4_ = local_280._28_4_;
    fVar142 = auVar39._0_4_;
    fVar178 = auVar39._4_4_;
    fVar182 = auVar39._8_4_;
    fVar185 = auVar39._12_4_;
    fVar187 = auVar39._16_4_;
    fVar189 = auVar39._20_4_;
    fVar191 = auVar39._24_4_;
    auVar70._4_4_ = auVar25._4_4_ * fVar178 * 4.0;
    auVar70._0_4_ = auVar25._0_4_ * fVar142 * 4.0;
    auVar70._8_4_ = auVar25._8_4_ * fVar182 * 4.0;
    auVar70._12_4_ = auVar25._12_4_ * fVar185 * 4.0;
    auVar70._16_4_ = auVar25._16_4_ * fVar187 * 4.0;
    auVar70._20_4_ = auVar25._20_4_ * fVar189 * 4.0;
    auVar70._24_4_ = auVar25._24_4_ * fVar191 * 4.0;
    auVar70._28_4_ = 0x40800000;
    auVar124 = vsubps_avx(auVar69,auVar70);
    auVar206 = vcmpps_avx(auVar124,ZEXT832(0) << 0x20,5);
    auVar128._8_4_ = 0x7fffffff;
    auVar128._0_8_ = 0x7fffffff7fffffff;
    auVar128._12_4_ = 0x7fffffff;
    auVar128._16_4_ = 0x7fffffff;
    auVar128._20_4_ = 0x7fffffff;
    auVar128._24_4_ = 0x7fffffff;
    auVar128._28_4_ = 0x7fffffff;
    local_2e0 = vandps_avx(auVar68,auVar128);
    local_340._0_4_ = fVar142 + fVar142;
    local_340._4_4_ = fVar178 + fVar178;
    local_340._8_4_ = fVar182 + fVar182;
    local_340._12_4_ = fVar185 + fVar185;
    local_340._16_4_ = fVar187 + fVar187;
    local_340._20_4_ = fVar189 + fVar189;
    local_340._24_4_ = fVar191 + fVar191;
    local_340._28_4_ = auVar39._28_4_ + auVar39._28_4_;
    local_300 = vandps_avx(auVar39,auVar128);
    uVar107 = CONCAT44(local_3e0._4_4_,local_3e0._0_4_);
    local_320._0_8_ = uVar107 ^ 0x8000000080000000;
    local_320._8_4_ = -local_3e0._8_4_;
    local_320._12_4_ = -local_3e0._12_4_;
    local_320._16_4_ = -local_3e0._16_4_;
    local_320._20_4_ = -local_3e0._20_4_;
    local_320._24_4_ = -local_3e0._24_4_;
    local_320._28_4_ = -local_3e0._28_4_;
    if ((((((((auVar206 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar206 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar206 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar206 >> 0x7f,0) == '\0') &&
          (auVar206 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar206 >> 0xbf,0) == '\0') &&
        (auVar206 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar206[0x1f])
    {
      auVar264 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      auVar164._8_4_ = 0xff800000;
      auVar164._0_8_ = 0xff800000ff800000;
      auVar164._12_4_ = 0xff800000;
      auVar164._16_4_ = 0xff800000;
      auVar164._20_4_ = 0xff800000;
      auVar164._24_4_ = 0xff800000;
      auVar164._28_4_ = 0xff800000;
    }
    else {
      auVar159 = vsqrtps_avx(auVar124);
      auVar39 = vrcpps_avx(local_340);
      auVar126 = vcmpps_avx(auVar124,ZEXT832(0) << 0x20,5);
      auVar368 = ZEXT3264(auVar126);
      fVar143 = auVar39._0_4_;
      fVar179 = auVar39._4_4_;
      auVar71._4_4_ = local_340._4_4_ * fVar179;
      auVar71._0_4_ = local_340._0_4_ * fVar143;
      fVar183 = auVar39._8_4_;
      auVar71._8_4_ = local_340._8_4_ * fVar183;
      fVar186 = auVar39._12_4_;
      auVar71._12_4_ = local_340._12_4_ * fVar186;
      fVar188 = auVar39._16_4_;
      auVar71._16_4_ = local_340._16_4_ * fVar188;
      fVar190 = auVar39._20_4_;
      auVar71._20_4_ = local_340._20_4_ * fVar190;
      fVar192 = auVar39._24_4_;
      auVar71._24_4_ = local_340._24_4_ * fVar192;
      auVar71._28_4_ = auVar124._28_4_;
      auVar129._8_4_ = 0x3f800000;
      auVar129._0_8_ = 0x3f8000003f800000;
      auVar129._12_4_ = 0x3f800000;
      auVar129._16_4_ = 0x3f800000;
      auVar129._20_4_ = 0x3f800000;
      auVar129._24_4_ = 0x3f800000;
      auVar129._28_4_ = 0x3f800000;
      auVar124 = vsubps_avx(auVar129,auVar71);
      fVar143 = fVar143 + fVar143 * auVar124._0_4_;
      fVar179 = fVar179 + fVar179 * auVar124._4_4_;
      fVar183 = fVar183 + fVar183 * auVar124._8_4_;
      fVar186 = fVar186 + fVar186 * auVar124._12_4_;
      fVar188 = fVar188 + fVar188 * auVar124._16_4_;
      fVar190 = fVar190 + fVar190 * auVar124._20_4_;
      fVar192 = fVar192 + fVar192 * auVar124._24_4_;
      auVar160 = vsubps_avx(local_320,auVar159);
      fVar292 = auVar160._0_4_ * fVar143;
      fVar302 = auVar160._4_4_ * fVar179;
      auVar72._4_4_ = fVar302;
      auVar72._0_4_ = fVar292;
      fVar303 = auVar160._8_4_ * fVar183;
      auVar72._8_4_ = fVar303;
      fVar304 = auVar160._12_4_ * fVar186;
      auVar72._12_4_ = fVar304;
      fVar305 = auVar160._16_4_ * fVar188;
      auVar72._16_4_ = fVar305;
      fVar306 = auVar160._20_4_ * fVar190;
      auVar72._20_4_ = fVar306;
      fVar308 = auVar160._24_4_ * fVar192;
      auVar72._24_4_ = fVar308;
      auVar72._28_4_ = auVar160._28_4_;
      auVar159 = vsubps_avx(auVar159,local_3e0);
      fVar143 = auVar159._0_4_ * fVar143;
      fVar179 = auVar159._4_4_ * fVar179;
      auVar73._4_4_ = fVar179;
      auVar73._0_4_ = fVar143;
      fVar183 = auVar159._8_4_ * fVar183;
      auVar73._8_4_ = fVar183;
      fVar186 = auVar159._12_4_ * fVar186;
      auVar73._12_4_ = fVar186;
      fVar188 = auVar159._16_4_ * fVar188;
      auVar73._16_4_ = fVar188;
      fVar190 = auVar159._20_4_ * fVar190;
      auVar73._20_4_ = fVar190;
      fVar192 = auVar159._24_4_ * fVar192;
      auVar73._24_4_ = fVar192;
      auVar73._28_4_ = auVar39._28_4_ + auVar124._28_4_;
      local_3a0 = fVar246 * (local_680._0_4_ + local_660._0_4_ * fVar292);
      fStack_39c = fVar270 * (local_680._4_4_ + local_660._4_4_ * fVar302);
      fStack_398 = fVar344 * (local_680._8_4_ + local_660._8_4_ * fVar303);
      fStack_394 = fVar408 * (local_680._12_4_ + local_660._12_4_ * fVar304);
      fStack_390 = fVar356 * (local_680._16_4_ + local_660._16_4_ * fVar305);
      fStack_38c = fVar307 * (local_680._20_4_ + local_660._20_4_ * fVar306);
      fStack_388 = fVar438 * (local_680._24_4_ + local_660._24_4_ * fVar308);
      fStack_384 = local_320._28_4_;
      local_3c0 = fVar246 * (local_680._0_4_ + local_660._0_4_ * fVar143);
      fStack_3bc = fVar270 * (local_680._4_4_ + local_660._4_4_ * fVar179);
      fStack_3b8 = fVar344 * (local_680._8_4_ + local_660._8_4_ * fVar183);
      fStack_3b4 = fVar408 * (local_680._12_4_ + local_660._12_4_ * fVar186);
      fStack_3b0 = fVar356 * (local_680._16_4_ + local_660._16_4_ * fVar188);
      fStack_3ac = fVar307 * (local_680._20_4_ + local_660._20_4_ * fVar190);
      fStack_3a8 = fVar438 * (local_680._24_4_ + local_660._24_4_ * fVar192);
      fStack_3a4 = local_320._28_4_;
      auVar280._8_4_ = 0x7f800000;
      auVar280._0_8_ = 0x7f8000007f800000;
      auVar280._12_4_ = 0x7f800000;
      auVar280._16_4_ = 0x7f800000;
      auVar280._20_4_ = 0x7f800000;
      auVar280._24_4_ = 0x7f800000;
      auVar280._28_4_ = 0x7f800000;
      auVar39 = vblendvps_avx(auVar280,auVar72,auVar126);
      auVar264 = ZEXT3264(auVar39);
      auVar281._8_4_ = 0xff800000;
      auVar281._0_8_ = 0xff800000ff800000;
      auVar281._12_4_ = 0xff800000;
      auVar281._16_4_ = 0xff800000;
      auVar281._20_4_ = 0xff800000;
      auVar281._24_4_ = 0xff800000;
      auVar281._28_4_ = 0xff800000;
      auVar164 = vblendvps_avx(auVar281,auVar73,auVar126);
      auVar124 = vmaxps_avx(local_5e0,local_2e0);
      auVar74._4_4_ = auVar124._4_4_ * 1.9073486e-06;
      auVar74._0_4_ = auVar124._0_4_ * 1.9073486e-06;
      auVar74._8_4_ = auVar124._8_4_ * 1.9073486e-06;
      auVar74._12_4_ = auVar124._12_4_ * 1.9073486e-06;
      auVar74._16_4_ = auVar124._16_4_ * 1.9073486e-06;
      auVar74._20_4_ = auVar124._20_4_ * 1.9073486e-06;
      auVar74._24_4_ = auVar124._24_4_ * 1.9073486e-06;
      auVar74._28_4_ = auVar124._28_4_;
      auVar124 = vcmpps_avx(local_300,auVar74,1);
      auVar159 = auVar126 & auVar124;
      if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar159 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar159 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar159 >> 0x7f,0) != '\0') ||
            (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar159 >> 0xbf,0) != '\0') ||
          (auVar159 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar159[0x1f] < '\0') {
        auVar206 = vandps_avx(auVar124,auVar126);
        auVar198 = vpackssdw_avx(auVar206._0_16_,auVar206._16_16_);
        auVar124 = vcmpps_avx(auVar25,ZEXT1232(ZEXT412(0)) << 0x20,2);
        auVar317._8_4_ = 0xff800000;
        auVar317._0_8_ = 0xff800000ff800000;
        auVar317._12_4_ = 0xff800000;
        auVar317._16_4_ = 0xff800000;
        auVar317._20_4_ = 0xff800000;
        auVar317._24_4_ = 0xff800000;
        auVar317._28_4_ = 0xff800000;
        auVar403._8_4_ = 0x7f800000;
        auVar403._0_8_ = 0x7f8000007f800000;
        auVar403._12_4_ = 0x7f800000;
        auVar403._16_4_ = 0x7f800000;
        auVar403._20_4_ = 0x7f800000;
        auVar403._24_4_ = 0x7f800000;
        auVar403._28_4_ = 0x7f800000;
        auVar25 = vblendvps_avx(auVar403,auVar317,auVar124);
        auVar252 = vpmovsxwd_avx(auVar198);
        auVar198 = vpunpckhwd_avx(auVar198,auVar198);
        auVar285._16_16_ = auVar198;
        auVar285._0_16_ = auVar252;
        auVar25 = vblendvps_avx(auVar39,auVar25,auVar285);
        auVar39 = vblendvps_avx(auVar317,auVar403,auVar124);
        auVar164 = vblendvps_avx(auVar164,auVar39,auVar285);
        auVar263._0_8_ = auVar206._0_8_ ^ 0xffffffffffffffff;
        auVar263._8_4_ = auVar206._8_4_ ^ 0xffffffff;
        auVar263._12_4_ = auVar206._12_4_ ^ 0xffffffff;
        auVar263._16_4_ = auVar206._16_4_ ^ 0xffffffff;
        auVar263._20_4_ = auVar206._20_4_ ^ 0xffffffff;
        auVar263._24_4_ = auVar206._24_4_ ^ 0xffffffff;
        auVar263._28_4_ = auVar206._28_4_ ^ 0xffffffff;
        auVar206 = vorps_avx(auVar124,auVar263);
        auVar206 = vandps_avx(auVar126,auVar206);
        auVar264 = ZEXT3264(auVar25);
      }
    }
    auVar332 = ZEXT3264(local_680);
    auVar25 = local_5c0 & auVar206;
    fVar143 = (float)local_9c0._0_4_;
    fVar179 = (float)local_9c0._4_4_;
    fVar183 = fStack_9b8;
    fVar186 = fStack_9b4;
    fVar188 = fStack_9b0;
    fVar190 = fStack_9ac;
    fVar192 = fStack_9a8;
    fVar292 = fStack_9a4;
    if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0x7f,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar25 >> 0xbf,0) != '\0') ||
        (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar25[0x1f] < '\0')
    {
      auVar342 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x100));
      auVar198 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x100) - (float)local_980._0_4_));
      auVar198 = vshufps_avx(auVar198,auVar198,0);
      auVar282._16_16_ = auVar198;
      auVar282._0_16_ = auVar198;
      auVar126 = vminps_avx(auVar282,auVar164);
      auVar130._0_4_ =
           (float)local_880._0_4_ * fVar309 +
           (float)local_920._0_4_ * fVar377 + (float)local_8a0._0_4_ * fVar395;
      auVar130._4_4_ =
           (float)local_880._4_4_ * fVar318 +
           (float)local_920._4_4_ * fVar388 + (float)local_8a0._4_4_ * fVar405;
      auVar130._8_4_ = fStack_878 * fVar319 + fStack_918 * fVar389 + fStack_898 * fVar409;
      auVar130._12_4_ = fStack_874 * fVar320 + fStack_914 * fVar390 + fStack_894 * fVar413;
      auVar130._16_4_ = fStack_870 * fVar321 + fStack_910 * fVar391 + fStack_890 * fVar416;
      auVar130._20_4_ = fStack_86c * fVar322 + fStack_90c * fVar392 + fStack_88c * fVar419;
      auVar130._24_4_ = fStack_868 * fVar323 + fStack_908 * fVar393 + fStack_888 * fVar422;
      auVar130._28_4_ = fVar424 + fStack_1e4 + fVar424;
      auVar124 = vrcpps_avx(auVar130);
      fVar424 = auVar124._0_4_;
      fVar302 = auVar124._4_4_;
      auVar75._4_4_ = auVar130._4_4_ * fVar302;
      auVar75._0_4_ = auVar130._0_4_ * fVar424;
      fVar303 = auVar124._8_4_;
      auVar75._8_4_ = auVar130._8_4_ * fVar303;
      fVar304 = auVar124._12_4_;
      auVar75._12_4_ = auVar130._12_4_ * fVar304;
      fVar305 = auVar124._16_4_;
      auVar75._16_4_ = auVar130._16_4_ * fVar305;
      fVar306 = auVar124._20_4_;
      auVar75._20_4_ = auVar130._20_4_ * fVar306;
      fVar308 = auVar124._24_4_;
      auVar75._24_4_ = auVar130._24_4_ * fVar308;
      auVar75._28_4_ = fStack_9a4 + auVar198._12_4_;
      auVar385._8_4_ = 0x3f800000;
      auVar385._0_8_ = 0x3f8000003f800000;
      auVar385._12_4_ = 0x3f800000;
      auVar385._16_4_ = 0x3f800000;
      auVar385._20_4_ = 0x3f800000;
      auVar385._24_4_ = 0x3f800000;
      auVar385._28_4_ = 0x3f800000;
      auVar159 = vsubps_avx(auVar385,auVar75);
      auVar315._8_4_ = 0x7fffffff;
      auVar315._0_8_ = 0x7fffffff7fffffff;
      auVar315._12_4_ = 0x7fffffff;
      auVar315._16_4_ = 0x7fffffff;
      auVar315._20_4_ = 0x7fffffff;
      auVar315._24_4_ = 0x7fffffff;
      auVar315._28_4_ = 0x7fffffff;
      auVar25 = vandps_avx(auVar130,auVar315);
      auVar365._8_4_ = 0x219392ef;
      auVar365._0_8_ = 0x219392ef219392ef;
      auVar365._12_4_ = 0x219392ef;
      auVar365._16_4_ = 0x219392ef;
      auVar365._20_4_ = 0x219392ef;
      auVar365._24_4_ = 0x219392ef;
      auVar365._28_4_ = 0x219392ef;
      auVar39 = vcmpps_avx(auVar25,auVar365,1);
      auVar329._8_4_ = 0x80000000;
      auVar329._0_8_ = 0x8000000080000000;
      auVar329._12_4_ = 0x80000000;
      auVar329._16_4_ = 0x80000000;
      auVar329._20_4_ = 0x80000000;
      auVar329._24_4_ = 0x80000000;
      auVar329._28_4_ = 0x80000000;
      auVar76._4_4_ =
           (fVar302 + fVar302 * auVar159._4_4_) *
           -(fVar318 * fVar269 + fVar388 * fVar369 + fVar405 * fVar268);
      auVar76._0_4_ =
           (fVar424 + fVar424 * auVar159._0_4_) *
           -(fVar309 * fVar248 + fVar377 * fVar358 + fVar395 * fVar245);
      auVar76._8_4_ =
           (fVar303 + fVar303 * auVar159._8_4_) *
           -(fVar319 * fVar291 + fVar389 * fVar370 + fVar409 * fVar290);
      auVar76._12_4_ =
           (fVar304 + fVar304 * auVar159._12_4_) *
           -(fVar320 * fVar404 + fVar390 * fVar371 + fVar413 * fVar394);
      auVar76._16_4_ =
           (fVar305 + fVar305 * auVar159._16_4_) *
           -(fVar321 * fVar353 + fVar391 * fVar372 + fVar416 * fVar350);
      auVar76._20_4_ =
           (fVar306 + fVar306 * auVar159._20_4_) *
           -(fVar322 * fVar426 + fVar392 * fVar373 + fVar419 * fVar425);
      auVar76._24_4_ =
           (fVar308 + fVar308 * auVar159._24_4_) *
           -(fVar323 * fVar437 + fVar393 * fVar374 + fVar422 * fVar436);
      auVar76._28_4_ = auVar124._28_4_ + auVar159._28_4_;
      auVar124 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar25 = vcmpps_avx(auVar130,auVar124,1);
      auVar25 = vorps_avx(auVar39,auVar25);
      auVar430._8_4_ = 0xff800000;
      auVar430._0_8_ = 0xff800000ff800000;
      auVar430._12_4_ = 0xff800000;
      auVar430._16_4_ = 0xff800000;
      auVar430._20_4_ = 0xff800000;
      auVar430._24_4_ = 0xff800000;
      auVar430._28_4_ = 0xff800000;
      auVar25 = vblendvps_avx(auVar76,auVar430,auVar25);
      auVar124 = vcmpps_avx(auVar130,auVar124,6);
      auVar39 = vorps_avx(auVar39,auVar124);
      auVar441._8_4_ = 0x7f800000;
      auVar441._0_8_ = 0x7f8000007f800000;
      auVar441._12_4_ = 0x7f800000;
      auVar441._16_4_ = 0x7f800000;
      auVar441._20_4_ = 0x7f800000;
      auVar441._24_4_ = 0x7f800000;
      auVar441._28_4_ = 0x7f800000;
      auVar39 = vblendvps_avx(auVar76,auVar441,auVar39);
      auVar124 = vmaxps_avx(local_360,auVar264._0_32_);
      auVar124 = vmaxps_avx(auVar124,auVar25);
      auVar39 = vminps_avx(auVar126,auVar39);
      auVar126 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar25 = vsubps_avx(auVar126,auVar27);
      auVar27 = vsubps_avx(auVar126,auVar28);
      auVar77._4_4_ = auVar27._4_4_ * -fVar406;
      auVar77._0_4_ = auVar27._0_4_ * -fVar396;
      auVar77._8_4_ = auVar27._8_4_ * -fVar410;
      auVar77._12_4_ = auVar27._12_4_ * -fVar414;
      auVar77._16_4_ = auVar27._16_4_ * -fVar417;
      auVar77._20_4_ = auVar27._20_4_ * -fVar420;
      auVar77._24_4_ = auVar27._24_4_ * -fVar423;
      auVar77._28_4_ = auVar27._28_4_;
      auVar78._4_4_ = fVar266 * auVar25._4_4_;
      auVar78._0_4_ = fVar243 * auVar25._0_4_;
      auVar78._8_4_ = fVar288 * auVar25._8_4_;
      auVar78._12_4_ = fVar354 * auVar25._12_4_;
      auVar78._16_4_ = fVar443 * auVar25._16_4_;
      auVar78._20_4_ = fVar418 * auVar25._20_4_;
      auVar78._24_4_ = fVar434 * auVar25._24_4_;
      auVar78._28_4_ = auVar25._28_4_;
      auVar25 = vsubps_avx(auVar77,auVar78);
      auVar27 = vsubps_avx(auVar126,auVar30);
      auVar79._4_4_ = fVar267 * auVar27._4_4_;
      auVar79._0_4_ = fVar244 * auVar27._0_4_;
      auVar79._8_4_ = fVar289 * auVar27._8_4_;
      auVar79._12_4_ = fVar375 * auVar27._12_4_;
      auVar79._16_4_ = fVar444 * auVar27._16_4_;
      auVar79._20_4_ = fVar421 * auVar27._20_4_;
      uVar8 = auVar27._28_4_;
      auVar79._24_4_ = fVar435 * auVar27._24_4_;
      auVar79._28_4_ = uVar8;
      auVar28 = vsubps_avx(auVar25,auVar79);
      auVar80._4_4_ = (float)local_8a0._4_4_ * -fVar406;
      auVar80._0_4_ = (float)local_8a0._0_4_ * -fVar396;
      auVar80._8_4_ = fStack_898 * -fVar410;
      auVar80._12_4_ = fStack_894 * -fVar414;
      auVar80._16_4_ = fStack_890 * -fVar417;
      auVar80._20_4_ = fStack_88c * -fVar420;
      auVar80._24_4_ = fStack_888 * -fVar423;
      auVar80._28_4_ = uVar109 ^ 0x80000000;
      auVar81._4_4_ = (float)local_920._4_4_ * fVar266;
      auVar81._0_4_ = (float)local_920._0_4_ * fVar243;
      auVar81._8_4_ = fStack_918 * fVar288;
      auVar81._12_4_ = fStack_914 * fVar354;
      auVar81._16_4_ = fStack_910 * fVar443;
      auVar81._20_4_ = fStack_90c * fVar418;
      auVar81._24_4_ = fStack_908 * fVar434;
      auVar81._28_4_ = uVar8;
      auVar366._8_4_ = 0x3f800000;
      auVar366._0_8_ = 0x3f8000003f800000;
      auVar366._12_4_ = 0x3f800000;
      auVar366._16_4_ = 0x3f800000;
      auVar366._20_4_ = 0x3f800000;
      auVar366._24_4_ = 0x3f800000;
      auVar366._28_4_ = 0x3f800000;
      auVar368 = ZEXT3264(auVar366);
      auVar25 = vsubps_avx(auVar80,auVar81);
      auVar82._4_4_ = fVar267 * (float)local_880._4_4_;
      auVar82._0_4_ = fVar244 * (float)local_880._0_4_;
      auVar82._8_4_ = fVar289 * fStack_878;
      auVar82._12_4_ = fVar375 * fStack_874;
      auVar82._16_4_ = fVar444 * fStack_870;
      auVar82._20_4_ = fVar421 * fStack_86c;
      auVar82._24_4_ = fVar435 * fStack_868;
      auVar82._28_4_ = uVar8;
      auVar30 = vsubps_avx(auVar25,auVar82);
      auVar25 = vrcpps_avx(auVar30);
      fVar243 = auVar25._0_4_;
      fVar244 = auVar25._4_4_;
      auVar83._4_4_ = auVar30._4_4_ * fVar244;
      auVar83._0_4_ = auVar30._0_4_ * fVar243;
      fVar245 = auVar25._8_4_;
      auVar83._8_4_ = auVar30._8_4_ * fVar245;
      fVar248 = auVar25._12_4_;
      auVar83._12_4_ = auVar30._12_4_ * fVar248;
      fVar266 = auVar25._16_4_;
      auVar83._16_4_ = auVar30._16_4_ * fVar266;
      fVar267 = auVar25._20_4_;
      auVar83._20_4_ = auVar30._20_4_ * fVar267;
      fVar268 = auVar25._24_4_;
      auVar83._24_4_ = auVar30._24_4_ * fVar268;
      auVar83._28_4_ = fStack_864;
      auVar126 = vsubps_avx(auVar366,auVar83);
      auVar25 = vandps_avx(auVar30,auVar315);
      auVar257._8_4_ = 0x219392ef;
      auVar257._0_8_ = 0x219392ef219392ef;
      auVar257._12_4_ = 0x219392ef;
      auVar257._16_4_ = 0x219392ef;
      auVar257._20_4_ = 0x219392ef;
      auVar257._24_4_ = 0x219392ef;
      auVar257._28_4_ = 0x219392ef;
      auVar264 = ZEXT3264(auVar257);
      auVar27 = vcmpps_avx(auVar25,auVar257,1);
      auVar84._4_4_ = (fVar244 + fVar244 * auVar126._4_4_) * -auVar28._4_4_;
      auVar84._0_4_ = (fVar243 + fVar243 * auVar126._0_4_) * -auVar28._0_4_;
      auVar84._8_4_ = (fVar245 + fVar245 * auVar126._8_4_) * -auVar28._8_4_;
      auVar84._12_4_ = (fVar248 + fVar248 * auVar126._12_4_) * -auVar28._12_4_;
      auVar84._16_4_ = (fVar266 + fVar266 * auVar126._16_4_) * -auVar28._16_4_;
      auVar84._20_4_ = (fVar267 + fVar267 * auVar126._20_4_) * -auVar28._20_4_;
      auVar84._24_4_ = (fVar268 + fVar268 * auVar126._24_4_) * -auVar28._24_4_;
      auVar84._28_4_ = auVar28._28_4_ ^ 0x80000000;
      auVar25 = vcmpps_avx(auVar30,ZEXT832(0) << 0x20,1);
      auVar25 = vorps_avx(auVar27,auVar25);
      auVar25 = vblendvps_avx(auVar84,auVar430,auVar25);
      local_8c0 = vmaxps_avx(auVar124,auVar25);
      auVar25 = vcmpps_avx(auVar30,ZEXT832(0) << 0x20,6);
      auVar25 = vorps_avx(auVar27,auVar25);
      auVar25 = vblendvps_avx(auVar84,auVar441,auVar25);
      auVar206 = vandps_avx(local_5c0,auVar206);
      local_400 = vminps_avx(auVar39,auVar25);
      auVar25 = vcmpps_avx(local_8c0,local_400,2);
      auVar27 = auVar206 & auVar25;
      if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar27 >> 0x7f,0) != '\0') ||
            (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar27 >> 0xbf,0) != '\0') ||
          (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar27[0x1f] < '\0') {
        auVar27 = vminps_avx(local_900,auVar163);
        auVar28 = vminps_avx(auVar29,auVar31);
        auVar27 = vminps_avx(auVar27,auVar28);
        auVar26 = vsubps_avx(auVar27,auVar26);
        auVar206 = vandps_avx(auVar25,auVar206);
        auVar104._4_4_ = fStack_39c;
        auVar104._0_4_ = local_3a0;
        auVar104._8_4_ = fStack_398;
        auVar104._12_4_ = fStack_394;
        auVar104._16_4_ = fStack_390;
        auVar104._20_4_ = fStack_38c;
        auVar104._24_4_ = fStack_388;
        auVar104._28_4_ = fStack_384;
        auVar25 = vminps_avx(auVar104,auVar366);
        auVar264 = ZEXT864(0) << 0x20;
        auVar25 = vmaxps_avx(auVar25,ZEXT832(0) << 0x20);
        local_1a0[0] = fVar115 + fVar141 * (auVar25._0_4_ + 0.0) * 0.125;
        local_1a0[1] = fVar139 + fVar176 * (auVar25._4_4_ + 1.0) * 0.125;
        local_1a0[2] = fVar140 + fVar180 * (auVar25._8_4_ + 2.0) * 0.125;
        local_1a0[3] = fStack_ac4 + fVar184 * (auVar25._12_4_ + 3.0) * 0.125;
        fStack_190 = fVar115 + fVar141 * (auVar25._16_4_ + 4.0) * 0.125;
        fStack_18c = fVar139 + fVar176 * (auVar25._20_4_ + 5.0) * 0.125;
        fStack_188 = fVar140 + fVar180 * (auVar25._24_4_ + 6.0) * 0.125;
        fStack_184 = fStack_ac4 + auVar25._28_4_ + 7.0;
        auVar103._4_4_ = fStack_3bc;
        auVar103._0_4_ = local_3c0;
        auVar103._8_4_ = fStack_3b8;
        auVar103._12_4_ = fStack_3b4;
        auVar103._16_4_ = fStack_3b0;
        auVar103._20_4_ = fStack_3ac;
        auVar103._24_4_ = fStack_3a8;
        auVar103._28_4_ = fStack_3a4;
        auVar25 = vminps_avx(auVar103,auVar366);
        auVar25 = vmaxps_avx(auVar25,ZEXT832(0) << 0x20);
        local_1c0[0] = fVar115 + fVar141 * (auVar25._0_4_ + 0.0) * 0.125;
        local_1c0[1] = fVar139 + fVar176 * (auVar25._4_4_ + 1.0) * 0.125;
        local_1c0[2] = fVar140 + fVar180 * (auVar25._8_4_ + 2.0) * 0.125;
        local_1c0[3] = fStack_ac4 + fVar184 * (auVar25._12_4_ + 3.0) * 0.125;
        fStack_1b0 = fVar115 + fVar141 * (auVar25._16_4_ + 4.0) * 0.125;
        fStack_1ac = fVar139 + fVar176 * (auVar25._20_4_ + 5.0) * 0.125;
        fStack_1a8 = fVar140 + fVar180 * (auVar25._24_4_ + 6.0) * 0.125;
        fStack_1a4 = fStack_ac4 + auVar25._28_4_ + 7.0;
        auVar85._4_4_ = auVar26._4_4_ * 0.99999976;
        auVar85._0_4_ = auVar26._0_4_ * 0.99999976;
        auVar85._8_4_ = auVar26._8_4_ * 0.99999976;
        auVar85._12_4_ = auVar26._12_4_ * 0.99999976;
        auVar85._16_4_ = auVar26._16_4_ * 0.99999976;
        auVar85._20_4_ = auVar26._20_4_ * 0.99999976;
        auVar85._24_4_ = auVar26._24_4_ * 0.99999976;
        auVar85._28_4_ = 0x3f7ffffc;
        auVar25 = vmaxps_avx(ZEXT832(0) << 0x20,auVar85);
        auVar86._4_4_ = auVar25._4_4_ * auVar25._4_4_;
        auVar86._0_4_ = auVar25._0_4_ * auVar25._0_4_;
        auVar86._8_4_ = auVar25._8_4_ * auVar25._8_4_;
        auVar86._12_4_ = auVar25._12_4_ * auVar25._12_4_;
        auVar86._16_4_ = auVar25._16_4_ * auVar25._16_4_;
        auVar86._20_4_ = auVar25._20_4_ * auVar25._20_4_;
        auVar86._24_4_ = auVar25._24_4_ * auVar25._24_4_;
        auVar86._28_4_ = auVar25._28_4_;
        auVar26 = vsubps_avx(auVar40,auVar86);
        auVar87._4_4_ = auVar26._4_4_ * fVar178 * 4.0;
        auVar87._0_4_ = auVar26._0_4_ * fVar142 * 4.0;
        auVar87._8_4_ = auVar26._8_4_ * fVar182 * 4.0;
        auVar87._12_4_ = auVar26._12_4_ * fVar185 * 4.0;
        auVar87._16_4_ = auVar26._16_4_ * fVar187 * 4.0;
        auVar87._20_4_ = auVar26._20_4_ * fVar189 * 4.0;
        auVar87._24_4_ = auVar26._24_4_ * fVar191 * 4.0;
        auVar87._28_4_ = auVar25._28_4_;
        auVar27 = vsubps_avx(auVar69,auVar87);
        auVar25 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,5);
        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0x7f,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar25 >> 0xbf,0) == '\0') &&
            (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar25[0x1f]) {
          auVar311 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar296 = ZEXT828(0) << 0x20;
          auVar276 = ZEXT1628(ZEXT816(0) << 0x40);
          _local_b60 = ZEXT832(0) << 0x20;
          _local_ca0 = local_b60._0_28_;
          auVar330._8_4_ = 0x7f800000;
          auVar330._0_8_ = 0x7f8000007f800000;
          auVar330._12_4_ = 0x7f800000;
          auVar330._16_4_ = 0x7f800000;
          auVar330._20_4_ = 0x7f800000;
          auVar330._24_4_ = 0x7f800000;
          auVar330._28_4_ = 0x7f800000;
          auVar386._8_4_ = 0xff800000;
          auVar386._0_8_ = 0xff800000ff800000;
          auVar386._12_4_ = 0xff800000;
          auVar386._16_4_ = 0xff800000;
          auVar386._20_4_ = 0xff800000;
          auVar386._24_4_ = 0xff800000;
          auVar386._28_4_ = 0xff800000;
          _local_ae0 = auVar44;
        }
        else {
          auVar28 = vrcpps_avx(local_340);
          fVar142 = auVar28._0_4_;
          auVar258._0_4_ = local_340._0_4_ * fVar142;
          fVar243 = auVar28._4_4_;
          auVar258._4_4_ = local_340._4_4_ * fVar243;
          fVar244 = auVar28._8_4_;
          auVar258._8_4_ = local_340._8_4_ * fVar244;
          fVar245 = auVar28._12_4_;
          auVar258._12_4_ = local_340._12_4_ * fVar245;
          fVar248 = auVar28._16_4_;
          auVar258._16_4_ = local_340._16_4_ * fVar248;
          fVar266 = auVar28._20_4_;
          auVar258._20_4_ = local_340._20_4_ * fVar266;
          fVar267 = auVar28._24_4_;
          auVar258._24_4_ = local_340._24_4_ * fVar267;
          auVar258._28_4_ = 0;
          auVar30 = vsubps_avx(auVar366,auVar258);
          auVar29 = vsqrtps_avx(auVar27);
          fVar142 = fVar142 + fVar142 * auVar30._0_4_;
          fVar243 = fVar243 + fVar243 * auVar30._4_4_;
          fVar244 = fVar244 + fVar244 * auVar30._8_4_;
          fVar245 = fVar245 + fVar245 * auVar30._12_4_;
          fVar248 = fVar248 + fVar248 * auVar30._16_4_;
          fVar266 = fVar266 + fVar266 * auVar30._20_4_;
          fVar267 = fVar267 + fVar267 * auVar30._24_4_;
          auVar31 = vsubps_avx(local_320,auVar29);
          fVar375 = auVar31._0_4_ * fVar142;
          fVar394 = auVar31._4_4_ * fVar243;
          auVar88._4_4_ = fVar394;
          auVar88._0_4_ = fVar375;
          fVar404 = auVar31._8_4_ * fVar244;
          auVar88._8_4_ = fVar404;
          fVar443 = auVar31._12_4_ * fVar245;
          auVar88._12_4_ = fVar443;
          fVar444 = auVar31._16_4_ * fVar248;
          auVar88._16_4_ = fVar444;
          fVar350 = auVar31._20_4_ * fVar266;
          auVar88._20_4_ = fVar350;
          fVar353 = auVar31._24_4_ * fVar267;
          auVar88._24_4_ = fVar353;
          auVar88._28_4_ = fStack_904;
          auVar31 = vsubps_avx(auVar29,local_3e0);
          fVar142 = auVar31._0_4_ * fVar142;
          fVar243 = auVar31._4_4_ * fVar243;
          auVar89._4_4_ = fVar243;
          auVar89._0_4_ = fVar142;
          fVar244 = auVar31._8_4_ * fVar244;
          auVar89._8_4_ = fVar244;
          fVar245 = auVar31._12_4_ * fVar245;
          auVar89._12_4_ = fVar245;
          fVar248 = auVar31._16_4_ * fVar248;
          auVar89._16_4_ = fVar248;
          fVar266 = auVar31._20_4_ * fVar266;
          auVar89._20_4_ = fVar266;
          fVar267 = auVar31._24_4_ * fVar267;
          auVar89._24_4_ = fVar267;
          auVar89._28_4_ = auVar206._28_4_;
          fVar268 = (fVar375 * local_660._0_4_ + local_680._0_4_) * fVar246;
          fVar269 = (fVar394 * local_660._4_4_ + local_680._4_4_) * fVar270;
          fVar288 = (fVar404 * local_660._8_4_ + local_680._8_4_) * fVar344;
          fVar289 = (fVar443 * local_660._12_4_ + local_680._12_4_) * fVar408;
          fVar290 = (fVar444 * local_660._16_4_ + local_680._16_4_) * fVar356;
          fVar291 = (fVar350 * local_660._20_4_ + local_680._20_4_) * fVar307;
          fVar354 = (fVar353 * local_660._24_4_ + local_680._24_4_) * fVar438;
          auVar165._0_4_ = fVar333 + fVar223 * fVar268;
          auVar165._4_4_ = fVar343 + fVar265 * fVar269;
          auVar165._8_4_ = fVar345 + fVar287 * fVar288;
          auVar165._12_4_ = fVar347 + fVar351 * fVar289;
          auVar165._16_4_ = fVar349 + fVar376 * fVar290;
          auVar165._20_4_ = fVar352 + fVar415 * fVar291;
          auVar165._24_4_ = fVar355 + fVar433 * fVar354;
          auVar165._28_4_ = fVar357 + auVar28._28_4_ + auVar30._28_4_ + local_680._28_4_;
          auVar90._4_4_ = fVar394 * (float)local_880._4_4_;
          auVar90._0_4_ = fVar375 * (float)local_880._0_4_;
          auVar90._8_4_ = fVar404 * fStack_878;
          auVar90._12_4_ = fVar443 * fStack_874;
          auVar90._16_4_ = fVar444 * fStack_870;
          auVar90._20_4_ = fVar350 * fStack_86c;
          auVar90._24_4_ = fVar353 * fStack_868;
          auVar90._28_4_ = auVar29._28_4_;
          auVar30 = vsubps_avx(auVar90,auVar165);
          auVar283._0_4_ = local_9a0 + fVar177 * fVar268;
          auVar283._4_4_ = fStack_99c + fVar247 * fVar269;
          auVar283._8_4_ = fStack_998 + fVar271 * fVar288;
          auVar283._12_4_ = fStack_994 + fVar346 * fVar289;
          auVar283._16_4_ = fStack_990 + fVar412 * fVar290;
          auVar283._20_4_ = fStack_98c + fVar407 * fVar291;
          auVar283._24_4_ = fStack_988 + fVar431 * fVar354;
          auVar283._28_4_ = fStack_984 + auVar29._28_4_;
          auVar91._4_4_ = fVar394 * (float)local_920._4_4_;
          auVar91._0_4_ = fVar375 * (float)local_920._0_4_;
          auVar91._8_4_ = fVar404 * fStack_918;
          auVar91._12_4_ = fVar443 * fStack_914;
          auVar91._16_4_ = fVar444 * fStack_910;
          auVar91._20_4_ = fVar350 * fStack_90c;
          auVar91._24_4_ = fVar353 * fStack_908;
          auVar91._28_4_ = fStack_904;
          _local_b60 = vsubps_avx(auVar91,auVar283);
          auVar259._0_4_ = fVar193 + fVar181 * fVar268;
          auVar259._4_4_ = fVar216 + fVar249 * fVar269;
          auVar259._8_4_ = fVar217 + fVar286 * fVar288;
          auVar259._12_4_ = fVar218 + fVar348 * fVar289;
          auVar259._16_4_ = fVar219 + fVar324 * fVar290;
          auVar259._20_4_ = fVar220 + fVar411 * fVar291;
          auVar259._24_4_ = fVar221 + fVar432 * fVar354;
          auVar259._28_4_ = fVar222 + auVar31._28_4_;
          auVar92._4_4_ = (float)local_8a0._4_4_ * fVar394;
          auVar92._0_4_ = (float)local_8a0._0_4_ * fVar375;
          auVar92._8_4_ = fStack_898 * fVar404;
          auVar92._12_4_ = fStack_894 * fVar443;
          auVar92._16_4_ = fStack_890 * fVar444;
          auVar92._20_4_ = fStack_88c * fVar350;
          auVar92._24_4_ = fStack_888 * fVar353;
          auVar92._28_4_ = fStack_904;
          auVar28 = vsubps_avx(auVar92,auVar259);
          _local_ca0 = auVar28._0_28_;
          fVar246 = (fVar142 * local_660._0_4_ + local_680._0_4_) * fVar246;
          fVar270 = (fVar243 * local_660._4_4_ + local_680._4_4_) * fVar270;
          fVar344 = (fVar244 * local_660._8_4_ + local_680._8_4_) * fVar344;
          fVar408 = (fVar245 * local_660._12_4_ + local_680._12_4_) * fVar408;
          fVar356 = (fVar248 * local_660._16_4_ + local_680._16_4_) * fVar356;
          fVar307 = (fVar266 * local_660._20_4_ + local_680._20_4_) * fVar307;
          fVar438 = (fVar267 * local_660._24_4_ + local_680._24_4_) * fVar438;
          auVar260._0_4_ = fVar333 + fVar223 * fVar246;
          auVar260._4_4_ = fVar343 + fVar265 * fVar270;
          auVar260._8_4_ = fVar345 + fVar287 * fVar344;
          auVar260._12_4_ = fVar347 + fVar351 * fVar408;
          auVar260._16_4_ = fVar349 + fVar376 * fVar356;
          auVar260._20_4_ = fVar352 + fVar415 * fVar307;
          auVar260._24_4_ = fVar355 + fVar433 * fVar438;
          auVar260._28_4_ = fVar357 + auVar28._28_4_ + local_680._28_4_;
          auVar93._4_4_ = fVar243 * (float)local_880._4_4_;
          auVar93._0_4_ = fVar142 * (float)local_880._0_4_;
          auVar93._8_4_ = fVar244 * fStack_878;
          auVar93._12_4_ = fVar245 * fStack_874;
          auVar93._16_4_ = fVar248 * fStack_870;
          auVar93._20_4_ = fVar266 * fStack_86c;
          auVar93._24_4_ = fVar267 * fStack_868;
          auVar93._28_4_ = fStack_864;
          auVar28 = vsubps_avx(auVar93,auVar260);
          auVar264 = ZEXT3264(auVar28);
          auVar316._0_4_ = local_9a0 + fVar177 * fVar246;
          auVar316._4_4_ = fStack_99c + fVar247 * fVar270;
          auVar316._8_4_ = fStack_998 + fVar271 * fVar344;
          auVar316._12_4_ = fStack_994 + fVar346 * fVar408;
          auVar316._16_4_ = fStack_990 + fVar412 * fVar356;
          auVar316._20_4_ = fStack_98c + fVar407 * fVar307;
          auVar316._24_4_ = fStack_988 + fVar431 * fVar438;
          auVar316._28_4_ = fStack_984 + fStack_864;
          auVar94._4_4_ = fVar243 * (float)local_920._4_4_;
          auVar94._0_4_ = fVar142 * (float)local_920._0_4_;
          auVar94._8_4_ = fVar244 * fStack_918;
          auVar94._12_4_ = fVar245 * fStack_914;
          auVar94._16_4_ = fVar248 * fStack_910;
          auVar94._20_4_ = fVar266 * fStack_90c;
          auVar94._24_4_ = fVar267 * fStack_908;
          auVar94._28_4_ = local_2c0._28_4_;
          auVar28 = vsubps_avx(auVar94,auVar316);
          auVar311 = auVar28._0_28_;
          auVar300._0_4_ = fVar193 + fVar181 * fVar246;
          auVar300._4_4_ = fVar216 + fVar249 * fVar270;
          auVar300._8_4_ = fVar217 + fVar286 * fVar344;
          auVar300._12_4_ = fVar218 + fVar348 * fVar408;
          auVar300._16_4_ = fVar219 + fVar324 * fVar356;
          auVar300._20_4_ = fVar220 + fVar411 * fVar307;
          auVar300._24_4_ = fVar221 + fVar432 * fVar438;
          auVar300._28_4_ = fVar222 + fStack_904;
          auVar95._4_4_ = (float)local_8a0._4_4_ * fVar243;
          auVar95._0_4_ = (float)local_8a0._0_4_ * fVar142;
          auVar95._8_4_ = fStack_898 * fVar244;
          auVar95._12_4_ = fStack_894 * fVar245;
          auVar95._16_4_ = fStack_890 * fVar248;
          auVar95._20_4_ = fStack_88c * fVar266;
          auVar95._24_4_ = fStack_888 * fVar267;
          auVar95._28_4_ = local_2c0._28_4_;
          auVar28 = vsubps_avx(auVar95,auVar300);
          auVar296 = auVar28._0_28_;
          auVar27 = vcmpps_avx(auVar27,ZEXT832(0) << 0x20,5);
          auVar331._8_4_ = 0x7f800000;
          auVar331._0_8_ = 0x7f8000007f800000;
          auVar331._12_4_ = 0x7f800000;
          auVar331._16_4_ = 0x7f800000;
          auVar331._20_4_ = 0x7f800000;
          auVar331._24_4_ = 0x7f800000;
          auVar331._28_4_ = 0x7f800000;
          auVar330 = vblendvps_avx(auVar331,auVar88,auVar27);
          auVar28 = vmaxps_avx(local_5e0,local_2e0);
          auVar96._4_4_ = auVar28._4_4_ * 1.9073486e-06;
          auVar96._0_4_ = auVar28._0_4_ * 1.9073486e-06;
          auVar96._8_4_ = auVar28._8_4_ * 1.9073486e-06;
          auVar96._12_4_ = auVar28._12_4_ * 1.9073486e-06;
          auVar96._16_4_ = auVar28._16_4_ * 1.9073486e-06;
          auVar96._20_4_ = auVar28._20_4_ * 1.9073486e-06;
          auVar96._24_4_ = auVar28._24_4_ * 1.9073486e-06;
          auVar96._28_4_ = auVar28._28_4_;
          auVar28 = vcmpps_avx(local_300,auVar96,1);
          auVar387._8_4_ = 0xff800000;
          auVar387._0_8_ = 0xff800000ff800000;
          auVar387._12_4_ = 0xff800000;
          auVar387._16_4_ = 0xff800000;
          auVar387._20_4_ = 0xff800000;
          auVar387._24_4_ = 0xff800000;
          auVar387._28_4_ = 0xff800000;
          auVar386 = vblendvps_avx(auVar387,auVar89,auVar27);
          auVar29 = auVar27 & auVar28;
          if ((((((((auVar29 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar29 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar29 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar29 >> 0x7f,0) != '\0') ||
                (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar29 >> 0xbf,0) != '\0') ||
              (auVar29 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar29[0x1f] < '\0') {
            auVar25 = vandps_avx(auVar28,auVar27);
            auVar198 = vpackssdw_avx(auVar25._0_16_,auVar25._16_16_);
            auVar28 = vcmpps_avx(auVar26,_DAT_01f7b000,2);
            auVar175._8_4_ = 0xff800000;
            auVar175._0_8_ = 0xff800000ff800000;
            auVar175._12_4_ = 0xff800000;
            auVar175._16_4_ = 0xff800000;
            auVar175._20_4_ = 0xff800000;
            auVar175._24_4_ = 0xff800000;
            auVar175._28_4_ = 0xff800000;
            auVar367._8_4_ = 0x7f800000;
            auVar367._0_8_ = 0x7f8000007f800000;
            auVar367._12_4_ = 0x7f800000;
            auVar367._16_4_ = 0x7f800000;
            auVar367._20_4_ = 0x7f800000;
            auVar367._24_4_ = 0x7f800000;
            auVar367._28_4_ = 0x7f800000;
            auVar26 = vblendvps_avx(auVar367,auVar175,auVar28);
            auVar252 = vpmovsxwd_avx(auVar198);
            auVar198 = vpunpckhwd_avx(auVar198,auVar198);
            auVar442._16_16_ = auVar198;
            auVar442._0_16_ = auVar252;
            auVar330 = vblendvps_avx(auVar330,auVar26,auVar442);
            auVar26 = vblendvps_avx(auVar175,auVar367,auVar28);
            auVar386 = vblendvps_avx(auVar386,auVar26,auVar442);
            auVar242._0_8_ = auVar25._0_8_ ^ 0xffffffffffffffff;
            auVar242._8_4_ = auVar25._8_4_ ^ 0xffffffff;
            auVar242._12_4_ = auVar25._12_4_ ^ 0xffffffff;
            auVar242._16_4_ = auVar25._16_4_ ^ 0xffffffff;
            auVar242._20_4_ = auVar25._20_4_ ^ 0xffffffff;
            auVar242._24_4_ = auVar25._24_4_ ^ 0xffffffff;
            auVar242._28_4_ = auVar25._28_4_ ^ 0xffffffff;
            auVar25 = vorps_avx(auVar28,auVar242);
            auVar25 = vandps_avx(auVar27,auVar25);
          }
          auVar276 = auVar30._0_28_;
          _local_ae0 = auVar206;
        }
        _local_460 = local_8c0;
        local_440 = vminps_avx(local_400,auVar330);
        _local_960 = vmaxps_avx(local_8c0,auVar386);
        _local_420 = _local_960;
        auVar329 = vcmpps_avx(local_8c0,local_440,2);
        local_7e0 = vandps_avx(auVar329,auVar206);
        auVar368 = ZEXT3264(local_7e0);
        auVar26 = vcmpps_avx(_local_960,local_400,2);
        auVar206 = vandps_avx(auVar206,auVar26);
        auVar26 = vorps_avx(local_7e0,auVar206);
        if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar26 >> 0x7f,0) != '\0') ||
              (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0xbf,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar26[0x1f] < '\0') {
          auVar332 = ZEXT3264(_local_8a0);
          auVar211._0_8_ = auVar25._0_8_ ^ 0xffffffffffffffff;
          auVar211._8_4_ = auVar25._8_4_ ^ 0xffffffff;
          auVar211._12_4_ = auVar25._12_4_ ^ 0xffffffff;
          auVar211._16_4_ = auVar25._16_4_ ^ 0xffffffff;
          auVar211._20_4_ = auVar25._20_4_ ^ 0xffffffff;
          auVar211._24_4_ = auVar25._24_4_ ^ 0xffffffff;
          auVar211._28_4_ = auVar25._28_4_ ^ 0xffffffff;
          auVar132._0_4_ =
               (float)local_880._0_4_ * auVar264._0_4_ +
               (float)local_920._0_4_ * auVar311._0_4_ + (float)local_8a0._0_4_ * auVar296._0_4_;
          auVar132._4_4_ =
               (float)local_880._4_4_ * auVar264._4_4_ +
               (float)local_920._4_4_ * auVar311._4_4_ + (float)local_8a0._4_4_ * auVar296._4_4_;
          auVar132._8_4_ =
               fStack_878 * auVar264._8_4_ +
               fStack_918 * auVar311._8_4_ + fStack_898 * auVar296._8_4_;
          auVar132._12_4_ =
               fStack_874 * auVar264._12_4_ +
               fStack_914 * auVar311._12_4_ + fStack_894 * auVar296._12_4_;
          auVar132._16_4_ =
               fStack_870 * auVar264._16_4_ +
               fStack_910 * auVar311._16_4_ + fStack_890 * auVar296._16_4_;
          auVar132._20_4_ =
               fStack_86c * auVar264._20_4_ +
               fStack_90c * auVar311._20_4_ + fStack_88c * auVar296._20_4_;
          auVar132._24_4_ =
               fStack_868 * auVar264._24_4_ +
               fStack_908 * auVar311._24_4_ + fStack_888 * auVar296._24_4_;
          auVar132._28_4_ = local_960._28_4_ + auVar206._28_4_ + auVar26._28_4_;
          auVar261._8_4_ = 0x7fffffff;
          auVar261._0_8_ = 0x7fffffff7fffffff;
          auVar261._12_4_ = 0x7fffffff;
          auVar261._16_4_ = 0x7fffffff;
          auVar261._20_4_ = 0x7fffffff;
          auVar261._24_4_ = 0x7fffffff;
          auVar261._28_4_ = 0x7fffffff;
          auVar25 = vandps_avx(auVar132,auVar261);
          auVar301._8_4_ = 0x3e99999a;
          auVar301._0_8_ = 0x3e99999a3e99999a;
          auVar301._12_4_ = 0x3e99999a;
          auVar301._16_4_ = 0x3e99999a;
          auVar301._20_4_ = 0x3e99999a;
          auVar301._24_4_ = 0x3e99999a;
          auVar301._28_4_ = 0x3e99999a;
          auVar25 = vcmpps_avx(auVar25,auVar301,1);
          local_820 = vorps_avx(auVar25,auVar211);
          auVar133._0_4_ =
               (float)local_880._0_4_ * auVar276._0_4_ +
               (float)local_920._0_4_ * (float)local_b60._0_4_ +
               (float)local_8a0._0_4_ * (float)local_ca0._0_4_;
          auVar133._4_4_ =
               (float)local_880._4_4_ * auVar276._4_4_ +
               (float)local_920._4_4_ * (float)local_b60._4_4_ +
               (float)local_8a0._4_4_ * (float)local_ca0._4_4_;
          auVar133._8_4_ =
               fStack_878 * auVar276._8_4_ + fStack_918 * fStack_b58 + fStack_898 * fStack_c98;
          auVar133._12_4_ =
               fStack_874 * auVar276._12_4_ + fStack_914 * fStack_b54 + fStack_894 * fStack_c94;
          auVar133._16_4_ =
               fStack_870 * auVar276._16_4_ + fStack_910 * fStack_b50 + fStack_890 * fStack_c90;
          auVar133._20_4_ =
               fStack_86c * auVar276._20_4_ + fStack_90c * fStack_b4c + fStack_88c * fStack_c8c;
          auVar133._24_4_ =
               fStack_868 * auVar276._24_4_ + fStack_908 * fStack_b48 + fStack_888 * fStack_c88;
          auVar133._28_4_ = local_820._28_4_ + fStack_864 + local_960._28_4_;
          auVar25 = vandps_avx(auVar133,auVar261);
          auVar25 = vcmpps_avx(auVar25,auVar301,1);
          auVar25 = vorps_avx(auVar25,auVar211);
          auVar166._8_4_ = 3;
          auVar166._0_8_ = 0x300000003;
          auVar166._12_4_ = 3;
          auVar166._16_4_ = 3;
          auVar166._20_4_ = 3;
          auVar166._24_4_ = 3;
          auVar166._28_4_ = 3;
          auVar212._8_4_ = 2;
          auVar212._0_8_ = 0x200000002;
          auVar212._12_4_ = 2;
          auVar212._16_4_ = 2;
          auVar212._20_4_ = 2;
          auVar212._24_4_ = 2;
          auVar212._28_4_ = 2;
          auVar25 = vblendvps_avx(auVar212,auVar166,auVar25);
          local_840 = ZEXT432(local_d64);
          local_860 = vpshufd_avx(ZEXT416(local_d64),0);
          auVar198 = vpcmpgtd_avx(auVar25._16_16_,local_860);
          auStack_850 = auVar32._16_16_;
          auVar252 = vpcmpgtd_avx(auVar25._0_16_,local_860);
          auVar167._16_16_ = auVar198;
          auVar167._0_16_ = auVar252;
          local_800 = vblendps_avx(ZEXT1632(auVar252),auVar167,0xf0);
          local_480 = vandnps_avx(local_800,local_7e0);
          local_940._4_4_ = local_8c0._4_4_ + (float)local_9c0._4_4_;
          local_940._0_4_ = local_8c0._0_4_ + (float)local_9c0._0_4_;
          fStack_938 = local_8c0._8_4_ + fStack_9b8;
          fStack_934 = local_8c0._12_4_ + fStack_9b4;
          fStack_930 = local_8c0._16_4_ + fStack_9b0;
          fStack_92c = local_8c0._20_4_ + fStack_9ac;
          fStack_928 = local_8c0._24_4_ + fStack_9a8;
          fStack_924 = local_8c0._28_4_ + fStack_9a4;
          local_2c0 = auVar125;
          while( true ) {
            local_c70._0_4_ = auVar144._0_4_;
            local_c70._4_4_ = auVar144._4_4_;
            fStack_c68 = auVar144._8_4_;
            fStack_c64 = auVar144._12_4_;
            if ((((((((local_480 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_480 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_480 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_480 >> 0x7f,0) == '\0') &&
                  (local_480 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_480 >> 0xbf,0) == '\0') &&
                (local_480 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_480[0x1f]) break;
            auVar168._8_4_ = 0x7f800000;
            auVar168._0_8_ = 0x7f8000007f800000;
            auVar168._12_4_ = 0x7f800000;
            auVar168._16_4_ = 0x7f800000;
            auVar168._20_4_ = 0x7f800000;
            auVar168._24_4_ = 0x7f800000;
            auVar168._28_4_ = 0x7f800000;
            auVar25 = vblendvps_avx(auVar168,local_8c0,local_480);
            auVar26 = vshufps_avx(auVar25,auVar25,0xb1);
            auVar26 = vminps_avx(auVar25,auVar26);
            auVar27 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar27 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar26 = vcmpps_avx(auVar25,auVar26,0);
            auVar27 = local_480 & auVar26;
            auVar25 = local_480;
            if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar27 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar27 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar27 >> 0x7f,0) != '\0') ||
                  (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar27 >> 0xbf,0) != '\0') ||
                (auVar27 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar27[0x1f] < '\0') {
              auVar25 = vandps_avx(auVar26,local_480);
            }
            uVar106 = vmovmskps_avx(auVar25);
            uVar109 = 0;
            if (uVar106 != 0) {
              for (; (uVar106 >> uVar109 & 1) == 0; uVar109 = uVar109 + 1) {
              }
            }
            uVar107 = (ulong)uVar109;
            *(undefined4 *)(local_480 + uVar107 * 4) = 0;
            fVar142 = local_1a0[uVar107];
            uVar109 = *(uint *)(local_460 + uVar107 * 4);
            fVar177 = auVar147._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              auVar332 = ZEXT1664(auVar332._0_16_);
              fVar177 = sqrtf((float)local_9e0._0_4_);
              uVar107 = extraout_RAX;
            }
            auVar252 = vminps_avx(_local_aa0,_local_ac0);
            auVar198 = vmaxps_avx(_local_aa0,_local_ac0);
            auVar227 = vminps_avx(auVar144,_local_b70);
            auVar119 = vminps_avx(auVar252,auVar227);
            auVar252 = vmaxps_avx(auVar144,_local_b70);
            auVar227 = vmaxps_avx(auVar198,auVar252);
            auVar226._8_4_ = 0x7fffffff;
            auVar226._0_8_ = 0x7fffffff7fffffff;
            auVar226._12_4_ = 0x7fffffff;
            auVar198 = vandps_avx(auVar119,auVar226);
            auVar252 = vandps_avx(auVar227,auVar226);
            auVar198 = vmaxps_avx(auVar198,auVar252);
            auVar252 = vmovshdup_avx(auVar198);
            auVar252 = vmaxss_avx(auVar252,auVar198);
            auVar198 = vshufpd_avx(auVar198,auVar198,1);
            auVar198 = vmaxss_avx(auVar198,auVar252);
            local_9a0 = auVar198._0_4_ * 1.9073486e-06;
            local_a20._0_4_ = fVar177 * 1.9073486e-06;
            local_900._0_16_ = vshufps_avx(auVar227,auVar227,0xff);
            auVar198 = vinsertps_avx(ZEXT416(uVar109),ZEXT416((uint)fVar142),0x10);
            auVar368 = ZEXT1664(auVar198);
            uVar112 = 0;
            while( true ) {
              auVar198 = auVar368._0_16_;
              bVar105 = (byte)uVar107;
              if (uVar112 == 5) break;
              auVar252 = vshufps_avx(auVar198,auVar198,0);
              auVar118._0_4_ = auVar252._0_4_ * (float)local_9d0._0_4_ + 0.0;
              auVar118._4_4_ = auVar252._4_4_ * (float)local_9d0._4_4_ + 0.0;
              auVar118._8_4_ = auVar252._8_4_ * fStack_9c8 + 0.0;
              auVar118._12_4_ = auVar252._12_4_ * fStack_9c4 + 0.0;
              auVar252 = vmovshdup_avx(auVar198);
              fVar244 = auVar252._0_4_;
              local_a00._0_4_ = 1.0 - fVar244;
              fVar177 = fVar244 * 3.0;
              fVar142 = fVar177 + -5.0;
              fVar181 = (float)local_a00._0_4_ * (float)local_a00._0_4_;
              auVar252 = ZEXT416((uint)(fVar244 * fVar244 * -(float)local_a00._0_4_ * 0.5));
              auVar252 = vshufps_avx(auVar252,auVar252,0);
              auVar227 = ZEXT416((uint)((fVar181 * ((float)local_a00._0_4_ * 3.0 + -5.0) + 2.0) *
                                       0.5));
              auVar227 = vshufps_avx(auVar227,auVar227,0);
              auVar119 = ZEXT416((uint)((fVar244 * fVar244 * fVar142 + 2.0) * 0.5));
              auVar119 = vshufps_avx(auVar119,auVar119,0);
              auVar149 = ZEXT416((uint)((float)local_a00._0_4_ * (float)local_a00._0_4_ * -fVar244 *
                                       0.5));
              auVar149 = vshufps_avx(auVar149,auVar149,0);
              auVar195._0_4_ =
                   auVar149._0_4_ * (float)local_aa0._0_4_ +
                   auVar119._0_4_ * (float)local_ac0._0_4_ +
                   auVar227._0_4_ * (float)local_c70._0_4_ + auVar252._0_4_ * (float)local_b70._0_4_
              ;
              auVar195._4_4_ =
                   auVar149._4_4_ * (float)local_aa0._4_4_ +
                   auVar119._4_4_ * (float)local_ac0._4_4_ +
                   auVar227._4_4_ * (float)local_c70._4_4_ + auVar252._4_4_ * (float)local_b70._4_4_
              ;
              auVar195._8_4_ =
                   auVar149._8_4_ * fStack_a98 +
                   auVar119._8_4_ * fStack_ab8 +
                   auVar227._8_4_ * fStack_c68 + auVar252._8_4_ * fStack_b68;
              auVar195._12_4_ =
                   auVar149._12_4_ * fStack_a94 +
                   auVar119._12_4_ * fStack_ab4 +
                   auVar227._12_4_ * fStack_c64 + auVar252._12_4_ * fStack_b64;
              fVar223 = (float)local_a00._0_4_ * -2.0;
              _local_ae0 = auVar195;
              auVar252 = vsubps_avx(auVar118,auVar195);
              _local_b60 = auVar252;
              auVar252 = vdpps_avx(auVar252,auVar252,0x7f);
              fVar243 = auVar252._0_4_;
              if (fVar243 < 0.0) {
                local_a00._0_16_ = ZEXT416((uint)local_a00._0_4_);
                local_a40._0_4_ = fVar244 * 9.0;
                local_a60._0_4_ = fVar142;
                local_a80._0_4_ = fVar181;
                local_8e0._0_4_ = fVar223;
                fVar245 = sqrtf(fVar243);
                uVar107 = extraout_RAX_00;
                fVar142 = (float)local_a60._0_4_;
                fVar248 = (float)local_a40._0_4_;
                fVar223 = (float)local_8e0._0_4_;
                fVar181 = (float)local_a80._0_4_;
              }
              else {
                auVar227 = vsqrtss_avx(auVar252,auVar252);
                fVar245 = auVar227._0_4_;
                fVar248 = fVar244 * 9.0;
              }
              auVar227 = ZEXT416((uint)((fVar244 * fVar244 + fVar244 * fVar223) * 0.5));
              auVar227 = vshufps_avx(auVar227,auVar227,0);
              auVar119 = ZEXT416((uint)((((float)local_a00._0_4_ + (float)local_a00._0_4_) *
                                         (fVar177 + 2.0) +
                                        (float)local_a00._0_4_ * (float)local_a00._0_4_ * -3.0) *
                                       0.5));
              auVar119 = vshufps_avx(auVar119,auVar119,0);
              auVar149 = ZEXT416((uint)((fVar142 * (fVar244 + fVar244) + fVar244 * fVar177) * 0.5));
              auVar149 = vshufps_avx(auVar149,auVar149,0);
              auVar150 = ZEXT416((uint)((fVar244 * ((float)local_a00._0_4_ + (float)local_a00._0_4_)
                                        - fVar181) * 0.5));
              auVar150 = vshufps_avx(auVar150,auVar150,0);
              auVar378._0_4_ =
                   (float)local_aa0._0_4_ * auVar150._0_4_ +
                   (float)local_ac0._0_4_ * auVar149._0_4_ +
                   (float)local_b70._0_4_ * auVar227._0_4_ + (float)local_c70._0_4_ * auVar119._0_4_
              ;
              auVar378._4_4_ =
                   (float)local_aa0._4_4_ * auVar150._4_4_ +
                   (float)local_ac0._4_4_ * auVar149._4_4_ +
                   (float)local_b70._4_4_ * auVar227._4_4_ + (float)local_c70._4_4_ * auVar119._4_4_
              ;
              auVar378._8_4_ =
                   fStack_a98 * auVar150._8_4_ +
                   fStack_ab8 * auVar149._8_4_ +
                   fStack_b68 * auVar227._8_4_ + fStack_c68 * auVar119._8_4_;
              auVar378._12_4_ =
                   fStack_a94 * auVar150._12_4_ +
                   fStack_ab4 * auVar149._12_4_ +
                   fStack_b64 * auVar227._12_4_ + fStack_c64 * auVar119._12_4_;
              auVar150 = vpermilps_avx(ZEXT416((uint)(fVar177 + -1.0)),0);
              auVar37 = vpermilps_avx(ZEXT416((uint)(fVar244 * -9.0 + 4.0)),0);
              auVar227 = vshufps_avx(ZEXT416((uint)(fVar248 + -5.0)),ZEXT416((uint)(fVar248 + -5.0))
                                     ,0);
              auVar119 = ZEXT416((uint)(fVar244 * -3.0 + 2.0));
              auVar149 = vshufps_avx(auVar119,auVar119,0);
              auVar119 = vdpps_avx(auVar378,auVar378,0x7f);
              auVar151._0_4_ =
                   (float)local_aa0._0_4_ * auVar149._0_4_ +
                   (float)local_ac0._0_4_ * auVar227._0_4_ +
                   (float)local_c70._0_4_ * auVar37._0_4_ + (float)local_b70._0_4_ * auVar150._0_4_;
              auVar151._4_4_ =
                   (float)local_aa0._4_4_ * auVar149._4_4_ +
                   (float)local_ac0._4_4_ * auVar227._4_4_ +
                   (float)local_c70._4_4_ * auVar37._4_4_ + (float)local_b70._4_4_ * auVar150._4_4_;
              auVar151._8_4_ =
                   fStack_a98 * auVar149._8_4_ +
                   fStack_ab8 * auVar227._8_4_ +
                   fStack_c68 * auVar37._8_4_ + fStack_b68 * auVar150._8_4_;
              auVar151._12_4_ =
                   fStack_a94 * auVar149._12_4_ +
                   fStack_ab4 * auVar227._12_4_ +
                   fStack_c64 * auVar37._12_4_ + fStack_b64 * auVar150._12_4_;
              auVar227 = vblendps_avx(auVar119,_DAT_01f45a50,0xe);
              auVar149 = vrsqrtss_avx(auVar227,auVar227);
              fVar177 = auVar149._0_4_;
              fVar142 = auVar119._0_4_;
              auVar149 = vdpps_avx(auVar378,auVar151,0x7f);
              auVar150 = vshufps_avx(auVar119,auVar119,0);
              auVar152._0_4_ = auVar151._0_4_ * auVar150._0_4_;
              auVar152._4_4_ = auVar151._4_4_ * auVar150._4_4_;
              auVar152._8_4_ = auVar151._8_4_ * auVar150._8_4_;
              auVar152._12_4_ = auVar151._12_4_ * auVar150._12_4_;
              auVar149 = vshufps_avx(auVar149,auVar149,0);
              auVar253._0_4_ = auVar378._0_4_ * auVar149._0_4_;
              auVar253._4_4_ = auVar378._4_4_ * auVar149._4_4_;
              auVar253._8_4_ = auVar378._8_4_ * auVar149._8_4_;
              auVar253._12_4_ = auVar378._12_4_ * auVar149._12_4_;
              auVar37 = vsubps_avx(auVar152,auVar253);
              auVar149 = vrcpss_avx(auVar227,auVar227);
              auVar227 = vmaxss_avx(ZEXT416((uint)local_9a0),
                                    ZEXT416((uint)(auVar368._0_4_ * (float)local_a20._0_4_)));
              auVar149 = ZEXT416((uint)(auVar149._0_4_ * (2.0 - fVar142 * auVar149._0_4_)));
              auVar149 = vshufps_avx(auVar149,auVar149,0);
              uVar97 = CONCAT44(auVar378._4_4_,auVar378._0_4_);
              auVar310._0_8_ = uVar97 ^ 0x8000000080000000;
              auVar310._8_4_ = -auVar378._8_4_;
              auVar310._12_4_ = -auVar378._12_4_;
              auVar150 = ZEXT416((uint)(fVar177 * 1.5 + fVar142 * -0.5 * fVar177 * fVar177 * fVar177
                                       ));
              auVar150 = vshufps_avx(auVar150,auVar150,0);
              auVar228._0_4_ = auVar150._0_4_ * auVar37._0_4_ * auVar149._0_4_;
              auVar228._4_4_ = auVar150._4_4_ * auVar37._4_4_ * auVar149._4_4_;
              auVar228._8_4_ = auVar150._8_4_ * auVar37._8_4_ * auVar149._8_4_;
              auVar228._12_4_ = auVar150._12_4_ * auVar37._12_4_ * auVar149._12_4_;
              local_a00._0_4_ = auVar378._0_4_ * auVar150._0_4_;
              local_a00._4_4_ = auVar378._4_4_ * auVar150._4_4_;
              local_a00._8_4_ = auVar378._8_4_ * auVar150._8_4_;
              local_a00._12_4_ = auVar378._12_4_ * auVar150._12_4_;
              if (fVar142 < 0.0) {
                fVar142 = sqrtf(fVar142);
                uVar107 = extraout_RAX_01;
              }
              else {
                auVar119 = vsqrtss_avx(auVar119,auVar119);
                fVar142 = auVar119._0_4_;
              }
              auVar119 = vdpps_avx(_local_b60,local_a00._0_16_,0x7f);
              fVar142 = (local_9a0 / fVar142) * (fVar245 + 1.0) +
                        auVar227._0_4_ + fVar245 * local_9a0;
              auVar149 = vdpps_avx(auVar310,local_a00._0_16_,0x7f);
              auVar150 = vdpps_avx(_local_b60,auVar228,0x7f);
              auVar37 = vdpps_avx(_local_9d0,local_a00._0_16_,0x7f);
              auVar38 = vdpps_avx(_local_b60,auVar310,0x7f);
              fVar177 = auVar149._0_4_ + auVar150._0_4_;
              fVar181 = auVar119._0_4_;
              auVar120._0_4_ = fVar181 * fVar181;
              auVar120._4_4_ = auVar119._4_4_ * auVar119._4_4_;
              auVar120._8_4_ = auVar119._8_4_ * auVar119._8_4_;
              auVar120._12_4_ = auVar119._12_4_ * auVar119._12_4_;
              auVar150 = vsubps_avx(auVar252,auVar120);
              local_a00._0_16_ = ZEXT416((uint)fVar177);
              auVar149 = vdpps_avx(_local_b60,_local_9d0,0x7f);
              fVar223 = auVar38._0_4_ - fVar181 * fVar177;
              fVar181 = auVar149._0_4_ - fVar181 * auVar37._0_4_;
              auVar149 = vrsqrtss_avx(auVar150,auVar150);
              fVar244 = auVar150._0_4_;
              fVar177 = auVar149._0_4_;
              fVar177 = fVar177 * 1.5 + fVar244 * -0.5 * fVar177 * fVar177 * fVar177;
              if (fVar244 < 0.0) {
                local_a40._0_4_ = fVar223;
                local_a60._0_4_ = fVar181;
                local_a80._0_4_ = fVar177;
                fVar244 = sqrtf(fVar244);
                uVar107 = extraout_RAX_02;
                fVar177 = (float)local_a80._0_4_;
                fVar223 = (float)local_a40._0_4_;
                fVar181 = (float)local_a60._0_4_;
              }
              else {
                auVar149 = vsqrtss_avx(auVar150,auVar150);
                fVar244 = auVar149._0_4_;
              }
              auVar332 = ZEXT1664(auVar252);
              auVar38 = vpermilps_avx(_local_ae0,0xff);
              auVar9 = vshufps_avx(auVar378,auVar378,0xff);
              fVar223 = fVar223 * fVar177 - auVar9._0_4_;
              auVar254._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
              auVar254._8_4_ = auVar37._8_4_ ^ 0x80000000;
              auVar254._12_4_ = auVar37._12_4_ ^ 0x80000000;
              auVar273._0_4_ = -fVar223;
              auVar273._4_4_ = 0x80000000;
              auVar273._8_4_ = 0x80000000;
              auVar273._12_4_ = 0x80000000;
              auVar149 = vinsertps_avx(auVar273,ZEXT416((uint)(fVar181 * fVar177)),0x1c);
              auVar37 = vmovsldup_avx(ZEXT416((uint)(local_a00._0_4_ * fVar181 * fVar177 -
                                                    auVar37._0_4_ * fVar223)));
              auVar149 = vdivps_avx(auVar149,auVar37);
              auVar150 = vinsertps_avx(local_a00._0_16_,auVar254,0x10);
              auVar150 = vdivps_avx(auVar150,auVar37);
              auVar37 = vmovsldup_avx(auVar119);
              auVar121 = ZEXT416((uint)(fVar244 - auVar38._0_4_));
              auVar38 = vmovsldup_avx(auVar121);
              auVar196._0_4_ = auVar37._0_4_ * auVar149._0_4_ + auVar38._0_4_ * auVar150._0_4_;
              auVar196._4_4_ = auVar37._4_4_ * auVar149._4_4_ + auVar38._4_4_ * auVar150._4_4_;
              auVar196._8_4_ = auVar37._8_4_ * auVar149._8_4_ + auVar38._8_4_ * auVar150._8_4_;
              auVar196._12_4_ = auVar37._12_4_ * auVar149._12_4_ + auVar38._12_4_ * auVar150._12_4_;
              auVar149 = vsubps_avx(auVar198,auVar196);
              auVar368 = ZEXT1664(auVar149);
              auVar197._8_4_ = 0x7fffffff;
              auVar197._0_8_ = 0x7fffffff7fffffff;
              auVar197._12_4_ = 0x7fffffff;
              auVar198 = vandps_avx(auVar119,auVar197);
              if (auVar198._0_4_ < fVar142) {
                auVar229._8_4_ = 0x7fffffff;
                auVar229._0_8_ = 0x7fffffff7fffffff;
                auVar229._12_4_ = 0x7fffffff;
                auVar198 = vandps_avx(auVar121,auVar229);
                if (auVar198._0_4_ <
                    (float)local_900._0_4_ * 1.9073486e-06 + auVar227._0_4_ + fVar142) {
                  bVar114 = uVar112 < 5;
                  fVar142 = auVar149._0_4_ + (float)local_980._0_4_;
                  if ((fVar7 <= fVar142) &&
                     (fVar177 = *(float *)(ray + k * 4 + 0x100), fVar142 <= fVar177)) {
                    auVar198 = vmovshdup_avx(auVar149);
                    bVar105 = 0;
                    if ((auVar198._0_4_ < 0.0) || (1.0 < auVar198._0_4_)) goto LAB_00b3e4d7;
                    auVar198 = vrsqrtss_avx(auVar252,auVar252);
                    fVar181 = auVar198._0_4_;
                    pGVar19 = (context->scene->geometries).items[local_b18].ptr;
                    if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar105 = 1, pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_00b3e4d7;
                      auVar198 = ZEXT416((uint)(fVar181 * 1.5 +
                                               fVar243 * -0.5 * fVar181 * fVar181 * fVar181));
                      auVar198 = vshufps_avx(auVar198,auVar198,0);
                      auVar199._0_4_ = auVar198._0_4_ * (float)local_b60._0_4_;
                      auVar199._4_4_ = auVar198._4_4_ * (float)local_b60._4_4_;
                      auVar199._8_4_ = auVar198._8_4_ * fStack_b58;
                      auVar199._12_4_ = auVar198._12_4_ * fStack_b54;
                      auVar153._0_4_ = auVar378._0_4_ + auVar9._0_4_ * auVar199._0_4_;
                      auVar153._4_4_ = auVar378._4_4_ + auVar9._4_4_ * auVar199._4_4_;
                      auVar153._8_4_ = auVar378._8_4_ + auVar9._8_4_ * auVar199._8_4_;
                      auVar153._12_4_ = auVar378._12_4_ + auVar9._12_4_ * auVar199._12_4_;
                      auVar198 = vshufps_avx(auVar199,auVar199,0xc9);
                      auVar227 = vshufps_avx(auVar378,auVar378,0xc9);
                      auVar200._0_4_ = auVar227._0_4_ * auVar199._0_4_;
                      auVar200._4_4_ = auVar227._4_4_ * auVar199._4_4_;
                      auVar200._8_4_ = auVar227._8_4_ * auVar199._8_4_;
                      auVar200._12_4_ = auVar227._12_4_ * auVar199._12_4_;
                      auVar230._0_4_ = auVar378._0_4_ * auVar198._0_4_;
                      auVar230._4_4_ = auVar378._4_4_ * auVar198._4_4_;
                      auVar230._8_4_ = auVar378._8_4_ * auVar198._8_4_;
                      auVar230._12_4_ = auVar378._12_4_ * auVar198._12_4_;
                      auVar119 = vsubps_avx(auVar230,auVar200);
                      auVar198 = vshufps_avx(auVar119,auVar119,0xc9);
                      auVar227 = vshufps_avx(auVar153,auVar153,0xc9);
                      auVar231._0_4_ = auVar227._0_4_ * auVar198._0_4_;
                      auVar231._4_4_ = auVar227._4_4_ * auVar198._4_4_;
                      auVar231._8_4_ = auVar227._8_4_ * auVar198._8_4_;
                      auVar231._12_4_ = auVar227._12_4_ * auVar198._12_4_;
                      auVar198 = vshufps_avx(auVar119,auVar119,0xd2);
                      auVar154._0_4_ = auVar153._0_4_ * auVar198._0_4_;
                      auVar154._4_4_ = auVar153._4_4_ * auVar198._4_4_;
                      auVar154._8_4_ = auVar153._8_4_ * auVar198._8_4_;
                      auVar154._12_4_ = auVar153._12_4_ * auVar198._12_4_;
                      auVar198 = vsubps_avx(auVar231,auVar154);
                      pRVar23 = context->user;
                      local_740 = vshufps_avx(auVar149,auVar149,0x55);
                      auStack_790 = vshufps_avx(auVar198,auVar198,0x55);
                      local_780 = vshufps_avx(auVar198,auVar198,0xaa);
                      local_760 = vshufps_avx(auVar198,auVar198,0);
                      local_7a0 = (RTCHitN  [16])auStack_790;
                      local_720 = ZEXT832(0) << 0x20;
                      local_700 = local_620._0_8_;
                      uStack_6f8 = local_620._8_8_;
                      uStack_6f0 = local_620._16_8_;
                      uStack_6e8 = local_620._24_8_;
                      local_6e0 = local_600;
                      auVar25 = vcmpps_avx(local_600,local_600,0xf);
                      local_b20[1] = auVar25;
                      *local_b20 = auVar25;
                      local_6c0 = pRVar23->instID[0];
                      local_6a0 = pRVar23->instPrimID[0];
                      *(float *)(ray + k * 4 + 0x100) = fVar142;
                      local_ba0 = *local_b28;
                      local_b90 = *local_b30;
                      local_b10.valid = (int *)local_ba0;
                      local_b10.geometryUserPtr = pGVar19->userPtr;
                      local_b10.context = context->user;
                      local_b10.hit = local_7a0;
                      local_b10.N = 8;
                      local_b10.ray = (RTCRayN *)ray;
                      local_770 = local_780;
                      local_750 = local_760;
                      local_730 = local_740;
                      uStack_6bc = local_6c0;
                      uStack_6b8 = local_6c0;
                      uStack_6b4 = local_6c0;
                      uStack_6b0 = local_6c0;
                      uStack_6ac = local_6c0;
                      uStack_6a8 = local_6c0;
                      uStack_6a4 = local_6c0;
                      uStack_69c = local_6a0;
                      uStack_698 = local_6a0;
                      uStack_694 = local_6a0;
                      uStack_690 = local_6a0;
                      uStack_68c = local_6a0;
                      uStack_688 = local_6a0;
                      uStack_684 = local_6a0;
                      if (pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar332 = ZEXT1664(auVar252);
                        auVar368 = ZEXT1664(auVar149);
                        (*pGVar19->occlusionFilterN)(&local_b10);
                      }
                      auVar198 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                      auVar252 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                      auVar213._16_16_ = auVar252;
                      auVar213._0_16_ = auVar198;
                      auVar25 = _DAT_01f7b020 & ~auVar213;
                      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar25 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar25 >> 0x7f,0) != '\0') ||
                            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar25 >> 0xbf,0) != '\0') ||
                          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar25[0x1f] < '\0') {
                        p_Var24 = context->args->filter;
                        if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar332 = ZEXT1664(auVar332._0_16_);
                          auVar368 = ZEXT1664(auVar368._0_16_);
                          (*p_Var24)(&local_b10);
                        }
                        auVar198 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                        auVar252 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                        auVar134._16_16_ = auVar252;
                        auVar134._0_16_ = auVar198;
                        auVar169._8_4_ = 0xff800000;
                        auVar169._0_8_ = 0xff800000ff800000;
                        auVar169._12_4_ = 0xff800000;
                        auVar169._16_4_ = 0xff800000;
                        auVar169._20_4_ = 0xff800000;
                        auVar169._24_4_ = 0xff800000;
                        auVar169._28_4_ = 0xff800000;
                        auVar25 = vblendvps_avx(auVar169,*(undefined1 (*) [32])
                                                          (local_b10.ray + 0x100),auVar134);
                        *(undefined1 (*) [32])(local_b10.ray + 0x100) = auVar25;
                        auVar25 = _DAT_01f7b020 & ~auVar134;
                        if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 || (auVar25 >> 0x3f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) ||
                                (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                               || SUB321(auVar25 >> 0x7f,0) != '\0') ||
                              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                             SUB321(auVar25 >> 0xbf,0) != '\0') ||
                            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar25[0x1f] < '\0') {
                          bVar105 = 1;
                          goto LAB_00b3e4d7;
                        }
                      }
                      *(float *)(ray + k * 4 + 0x100) = fVar177;
                      bVar105 = 0;
                      goto LAB_00b3e4d7;
                    }
                  }
                  bVar105 = 0;
                  goto LAB_00b3e4d7;
                }
              }
              uVar112 = uVar112 + 1;
            }
            bVar114 = false;
LAB_00b3e4d7:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar340._4_4_ = uVar8;
            auVar340._0_4_ = uVar8;
            auVar340._8_4_ = uVar8;
            auVar340._12_4_ = uVar8;
            auVar340._16_4_ = uVar8;
            auVar340._20_4_ = uVar8;
            auVar340._24_4_ = uVar8;
            auVar340._28_4_ = uVar8;
            auVar342 = ZEXT3264(auVar340);
            bVar113 = bVar113 | bVar114 & bVar105;
            auVar25 = vcmpps_avx(_local_940,auVar340,2);
            local_480 = vandps_avx(auVar25,local_480);
          }
          auVar135._0_4_ = (float)local_9c0._0_4_ + (float)local_960._0_4_;
          auVar135._4_4_ = (float)local_9c0._4_4_ + (float)local_960._4_4_;
          auVar135._8_4_ = fStack_9b8 + fStack_958;
          auVar135._12_4_ = fStack_9b4 + fStack_954;
          auVar135._16_4_ = fStack_9b0 + fStack_950;
          auVar135._20_4_ = fStack_9ac + fStack_94c;
          auVar135._24_4_ = fStack_9a8 + fStack_948;
          auVar135._28_4_ = fStack_9a4 + fStack_944;
          auVar198 = vshufps_avx(auVar342._0_16_,auVar342._0_16_,0);
          auVar170._16_16_ = auVar198;
          auVar170._0_16_ = auVar198;
          auVar25 = vcmpps_avx(auVar135,auVar170,2);
          _local_940 = vandps_avx(auVar25,auVar206);
          auVar136._8_4_ = 3;
          auVar136._0_8_ = 0x300000003;
          auVar136._12_4_ = 3;
          auVar136._16_4_ = 3;
          auVar136._20_4_ = 3;
          auVar136._24_4_ = 3;
          auVar136._28_4_ = 3;
          auVar171._8_4_ = 2;
          auVar171._0_8_ = 0x200000002;
          auVar171._12_4_ = 2;
          auVar171._16_4_ = 2;
          auVar171._20_4_ = 2;
          auVar171._24_4_ = 2;
          auVar171._28_4_ = 2;
          auVar206 = vblendvps_avx(auVar171,auVar136,local_820);
          auVar198 = vpcmpgtd_avx(auVar206._16_16_,local_860);
          auVar252 = vpshufd_avx(local_840._0_16_,0);
          auVar252 = vpcmpgtd_avx(auVar206._0_16_,auVar252);
          auVar172._16_16_ = auVar198;
          auVar172._0_16_ = auVar252;
          _local_960 = vblendps_avx(ZEXT1632(auVar252),auVar172,0xf0);
          local_4a0 = vandnps_avx(_local_960,_local_940);
          local_8c0 = _local_420;
          local_c00._4_4_ = (float)local_9c0._4_4_ + (float)local_420._4_4_;
          local_c00._0_4_ = (float)local_9c0._0_4_ + (float)local_420._0_4_;
          fStack_bf8 = fStack_9b8 + fStack_418;
          fStack_bf4 = fStack_9b4 + fStack_414;
          fStack_bf0 = fStack_9b0 + fStack_410;
          fStack_bec = fStack_9ac + fStack_40c;
          fStack_be8 = fStack_9a8 + fStack_408;
          fStack_be4 = fStack_9a4 + fStack_404;
          while( true ) {
            if ((((((((local_4a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (local_4a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (local_4a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(local_4a0 >> 0x7f,0) == '\0') &&
                  (local_4a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(local_4a0 >> 0xbf,0) == '\0') &&
                (local_4a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < local_4a0[0x1f]) break;
            auVar173._8_4_ = 0x7f800000;
            auVar173._0_8_ = 0x7f8000007f800000;
            auVar173._12_4_ = 0x7f800000;
            auVar173._16_4_ = 0x7f800000;
            auVar173._20_4_ = 0x7f800000;
            auVar173._24_4_ = 0x7f800000;
            auVar173._28_4_ = 0x7f800000;
            auVar206 = vblendvps_avx(auVar173,local_8c0,local_4a0);
            auVar25 = vshufps_avx(auVar206,auVar206,0xb1);
            auVar25 = vminps_avx(auVar206,auVar25);
            auVar26 = vshufpd_avx(auVar25,auVar25,5);
            auVar25 = vminps_avx(auVar25,auVar26);
            auVar26 = vperm2f128_avx(auVar25,auVar25,1);
            auVar25 = vminps_avx(auVar25,auVar26);
            auVar25 = vcmpps_avx(auVar206,auVar25,0);
            auVar26 = local_4a0 & auVar25;
            auVar206 = local_4a0;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar206 = vandps_avx(auVar25,local_4a0);
            }
            uVar106 = vmovmskps_avx(auVar206);
            uVar109 = 0;
            if (uVar106 != 0) {
              for (; (uVar106 >> uVar109 & 1) == 0; uVar109 = uVar109 + 1) {
              }
            }
            uVar107 = (ulong)uVar109;
            *(undefined4 *)(local_4a0 + uVar107 * 4) = 0;
            fVar142 = local_1c0[uVar107];
            uVar109 = *(uint *)(local_400 + uVar107 * 4);
            fVar177 = auVar34._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              auVar332 = ZEXT1664(auVar332._0_16_);
              fVar177 = sqrtf((float)local_9e0._0_4_);
              uVar107 = extraout_RAX_03;
            }
            auVar252 = vminps_avx(_local_aa0,_local_ac0);
            auVar198 = vmaxps_avx(_local_aa0,_local_ac0);
            auVar227 = vminps_avx(auVar144,_local_b70);
            auVar119 = vminps_avx(auVar252,auVar227);
            auVar252 = vmaxps_avx(auVar144,_local_b70);
            auVar227 = vmaxps_avx(auVar198,auVar252);
            auVar232._8_4_ = 0x7fffffff;
            auVar232._0_8_ = 0x7fffffff7fffffff;
            auVar232._12_4_ = 0x7fffffff;
            auVar198 = vandps_avx(auVar119,auVar232);
            auVar252 = vandps_avx(auVar227,auVar232);
            auVar198 = vmaxps_avx(auVar198,auVar252);
            auVar252 = vmovshdup_avx(auVar198);
            auVar252 = vmaxss_avx(auVar252,auVar198);
            auVar198 = vshufpd_avx(auVar198,auVar198,1);
            auVar198 = vmaxss_avx(auVar198,auVar252);
            local_9a0 = auVar198._0_4_ * 1.9073486e-06;
            local_a00._0_4_ = fVar177 * 1.9073486e-06;
            local_900._0_16_ = vshufps_avx(auVar227,auVar227,0xff);
            auVar198 = vinsertps_avx(ZEXT416(uVar109),ZEXT416((uint)fVar142),0x10);
            auVar368 = ZEXT1664(auVar198);
            uVar112 = 0;
            while( true ) {
              auVar198 = auVar368._0_16_;
              bVar105 = (byte)uVar107;
              if (uVar112 == 5) break;
              auVar252 = vshufps_avx(auVar198,auVar198,0);
              auVar122._0_4_ = auVar252._0_4_ * (float)local_9d0._0_4_ + 0.0;
              auVar122._4_4_ = auVar252._4_4_ * (float)local_9d0._4_4_ + 0.0;
              auVar122._8_4_ = auVar252._8_4_ * fStack_9c8 + 0.0;
              auVar122._12_4_ = auVar252._12_4_ * fStack_9c4 + 0.0;
              auVar252 = vmovshdup_avx(auVar198);
              fVar244 = auVar252._0_4_;
              fVar223 = 1.0 - fVar244;
              fVar177 = fVar244 * 3.0;
              fVar142 = fVar177 + -5.0;
              fVar181 = fVar223 * fVar223;
              auVar252 = ZEXT416((uint)(fVar244 * fVar244 * -fVar223 * 0.5));
              auVar252 = vshufps_avx(auVar252,auVar252,0);
              auVar227 = ZEXT416((uint)((fVar181 * (fVar223 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar227 = vshufps_avx(auVar227,auVar227,0);
              auVar119 = ZEXT416((uint)((fVar244 * fVar244 * fVar142 + 2.0) * 0.5));
              auVar119 = vshufps_avx(auVar119,auVar119,0);
              auVar149 = ZEXT416((uint)(fVar223 * fVar223 * -fVar244 * 0.5));
              auVar149 = vshufps_avx(auVar149,auVar149,0);
              auVar201._0_4_ =
                   auVar149._0_4_ * (float)local_aa0._0_4_ +
                   auVar119._0_4_ * (float)local_ac0._0_4_ +
                   auVar227._0_4_ * (float)local_c70._0_4_ + auVar252._0_4_ * (float)local_b70._0_4_
              ;
              auVar201._4_4_ =
                   auVar149._4_4_ * (float)local_aa0._4_4_ +
                   auVar119._4_4_ * (float)local_ac0._4_4_ +
                   auVar227._4_4_ * (float)local_c70._4_4_ + auVar252._4_4_ * (float)local_b70._4_4_
              ;
              auVar201._8_4_ =
                   auVar149._8_4_ * fStack_a98 +
                   auVar119._8_4_ * fStack_ab8 +
                   auVar227._8_4_ * fStack_c68 + auVar252._8_4_ * fStack_b68;
              auVar201._12_4_ =
                   auVar149._12_4_ * fStack_a94 +
                   auVar119._12_4_ * fStack_ab4 +
                   auVar227._12_4_ * fStack_c64 + auVar252._12_4_ * fStack_b64;
              _local_ae0 = auVar201;
              auVar252 = vsubps_avx(auVar122,auVar201);
              _local_b60 = auVar252;
              auVar252 = vdpps_avx(auVar252,auVar252,0x7f);
              fVar243 = auVar252._0_4_;
              if (fVar243 < 0.0) {
                local_a20._0_16_ = ZEXT416((uint)fVar223);
                local_a40._0_4_ = fVar244 * 9.0;
                local_a60._0_4_ = fVar142;
                local_a80._0_4_ = fVar181;
                local_8e0._0_4_ = fVar223 * -2.0;
                fVar245 = sqrtf(fVar243);
                uVar107 = extraout_RAX_04;
                fVar246 = (float)local_a40._0_4_;
                fVar248 = (float)local_8e0._0_4_;
                fVar142 = (float)local_a60._0_4_;
                fVar181 = (float)local_a80._0_4_;
                fVar223 = (float)local_a20._0_4_;
              }
              else {
                auVar227 = vsqrtss_avx(auVar252,auVar252);
                fVar245 = auVar227._0_4_;
                fVar246 = fVar244 * 9.0;
                fVar248 = fVar223 * -2.0;
              }
              auVar227 = ZEXT416((uint)((fVar244 * fVar244 + fVar244 * fVar248) * 0.5));
              auVar227 = vshufps_avx(auVar227,auVar227,0);
              auVar119 = ZEXT416((uint)(((fVar223 + fVar223) * (fVar177 + 2.0) +
                                        fVar223 * fVar223 * -3.0) * 0.5));
              auVar119 = vshufps_avx(auVar119,auVar119,0);
              auVar149 = ZEXT416((uint)((fVar142 * (fVar244 + fVar244) + fVar244 * fVar177) * 0.5));
              auVar149 = vshufps_avx(auVar149,auVar149,0);
              auVar150 = ZEXT416((uint)((fVar244 * (fVar223 + fVar223) - fVar181) * 0.5));
              auVar150 = vshufps_avx(auVar150,auVar150,0);
              auVar379._0_4_ =
                   (float)local_aa0._0_4_ * auVar150._0_4_ +
                   (float)local_ac0._0_4_ * auVar149._0_4_ +
                   (float)local_b70._0_4_ * auVar227._0_4_ + (float)local_c70._0_4_ * auVar119._0_4_
              ;
              auVar379._4_4_ =
                   (float)local_aa0._4_4_ * auVar150._4_4_ +
                   (float)local_ac0._4_4_ * auVar149._4_4_ +
                   (float)local_b70._4_4_ * auVar227._4_4_ + (float)local_c70._4_4_ * auVar119._4_4_
              ;
              auVar379._8_4_ =
                   fStack_a98 * auVar150._8_4_ +
                   fStack_ab8 * auVar149._8_4_ +
                   fStack_b68 * auVar227._8_4_ + fStack_c68 * auVar119._8_4_;
              auVar379._12_4_ =
                   fStack_a94 * auVar150._12_4_ +
                   fStack_ab4 * auVar149._12_4_ +
                   fStack_b64 * auVar227._12_4_ + fStack_c64 * auVar119._12_4_;
              auVar150 = vpermilps_avx(ZEXT416((uint)(fVar177 + -1.0)),0);
              auVar37 = vpermilps_avx(ZEXT416((uint)(fVar244 * -9.0 + 4.0)),0);
              auVar227 = vshufps_avx(ZEXT416((uint)(fVar246 + -5.0)),ZEXT416((uint)(fVar246 + -5.0))
                                     ,0);
              auVar119 = ZEXT416((uint)(fVar244 * -3.0 + 2.0));
              auVar149 = vshufps_avx(auVar119,auVar119,0);
              auVar119 = vdpps_avx(auVar379,auVar379,0x7f);
              auVar155._0_4_ =
                   (float)local_aa0._0_4_ * auVar149._0_4_ +
                   (float)local_ac0._0_4_ * auVar227._0_4_ +
                   (float)local_c70._0_4_ * auVar37._0_4_ + (float)local_b70._0_4_ * auVar150._0_4_;
              auVar155._4_4_ =
                   (float)local_aa0._4_4_ * auVar149._4_4_ +
                   (float)local_ac0._4_4_ * auVar227._4_4_ +
                   (float)local_c70._4_4_ * auVar37._4_4_ + (float)local_b70._4_4_ * auVar150._4_4_;
              auVar155._8_4_ =
                   fStack_a98 * auVar149._8_4_ +
                   fStack_ab8 * auVar227._8_4_ +
                   fStack_c68 * auVar37._8_4_ + fStack_b68 * auVar150._8_4_;
              auVar155._12_4_ =
                   fStack_a94 * auVar149._12_4_ +
                   fStack_ab4 * auVar227._12_4_ +
                   fStack_c64 * auVar37._12_4_ + fStack_b64 * auVar150._12_4_;
              auVar227 = vblendps_avx(auVar119,_DAT_01f45a50,0xe);
              auVar149 = vrsqrtss_avx(auVar227,auVar227);
              fVar177 = auVar149._0_4_;
              fVar142 = auVar119._0_4_;
              auVar149 = vdpps_avx(auVar379,auVar155,0x7f);
              auVar150 = vshufps_avx(auVar119,auVar119,0);
              auVar156._0_4_ = auVar155._0_4_ * auVar150._0_4_;
              auVar156._4_4_ = auVar155._4_4_ * auVar150._4_4_;
              auVar156._8_4_ = auVar155._8_4_ * auVar150._8_4_;
              auVar156._12_4_ = auVar155._12_4_ * auVar150._12_4_;
              auVar149 = vshufps_avx(auVar149,auVar149,0);
              auVar255._0_4_ = auVar379._0_4_ * auVar149._0_4_;
              auVar255._4_4_ = auVar379._4_4_ * auVar149._4_4_;
              auVar255._8_4_ = auVar379._8_4_ * auVar149._8_4_;
              auVar255._12_4_ = auVar379._12_4_ * auVar149._12_4_;
              auVar37 = vsubps_avx(auVar156,auVar255);
              auVar149 = vrcpss_avx(auVar227,auVar227);
              auVar227 = vmaxss_avx(ZEXT416((uint)local_9a0),
                                    ZEXT416((uint)(auVar368._0_4_ * (float)local_a00._0_4_)));
              auVar149 = ZEXT416((uint)(auVar149._0_4_ * (2.0 - fVar142 * auVar149._0_4_)));
              auVar149 = vshufps_avx(auVar149,auVar149,0);
              uVar97 = CONCAT44(auVar379._4_4_,auVar379._0_4_);
              auVar274._0_8_ = uVar97 ^ 0x8000000080000000;
              auVar274._8_4_ = -auVar379._8_4_;
              auVar274._12_4_ = -auVar379._12_4_;
              auVar150 = ZEXT416((uint)(fVar177 * 1.5 + fVar142 * -0.5 * fVar177 * fVar177 * fVar177
                                       ));
              auVar150 = vshufps_avx(auVar150,auVar150,0);
              auVar233._0_4_ = auVar150._0_4_ * auVar37._0_4_ * auVar149._0_4_;
              auVar233._4_4_ = auVar150._4_4_ * auVar37._4_4_ * auVar149._4_4_;
              auVar233._8_4_ = auVar150._8_4_ * auVar37._8_4_ * auVar149._8_4_;
              auVar233._12_4_ = auVar150._12_4_ * auVar37._12_4_ * auVar149._12_4_;
              auVar295._0_4_ = auVar379._0_4_ * auVar150._0_4_;
              auVar295._4_4_ = auVar379._4_4_ * auVar150._4_4_;
              auVar295._8_4_ = auVar379._8_4_ * auVar150._8_4_;
              auVar295._12_4_ = auVar379._12_4_ * auVar150._12_4_;
              if (fVar142 < 0.0) {
                local_a20._0_16_ = auVar295;
                fVar142 = sqrtf(fVar142);
                uVar107 = extraout_RAX_05;
                auVar295 = local_a20._0_16_;
              }
              else {
                auVar119 = vsqrtss_avx(auVar119,auVar119);
                fVar142 = auVar119._0_4_;
              }
              auVar119 = vdpps_avx(_local_b60,auVar295,0x7f);
              fVar142 = (local_9a0 / fVar142) * (fVar245 + 1.0) +
                        fVar245 * local_9a0 + auVar227._0_4_;
              auVar149 = vdpps_avx(auVar274,auVar295,0x7f);
              auVar150 = vdpps_avx(_local_b60,auVar233,0x7f);
              auVar37 = vdpps_avx(_local_9d0,auVar295,0x7f);
              auVar38 = vdpps_avx(_local_b60,auVar274,0x7f);
              fVar177 = auVar149._0_4_ + auVar150._0_4_;
              fVar181 = auVar119._0_4_;
              auVar123._0_4_ = fVar181 * fVar181;
              auVar123._4_4_ = auVar119._4_4_ * auVar119._4_4_;
              auVar123._8_4_ = auVar119._8_4_ * auVar119._8_4_;
              auVar123._12_4_ = auVar119._12_4_ * auVar119._12_4_;
              auVar150 = vsubps_avx(auVar252,auVar123);
              auVar149 = vdpps_avx(_local_b60,_local_9d0,0x7f);
              fVar223 = auVar38._0_4_ - fVar181 * fVar177;
              fVar244 = auVar149._0_4_ - fVar181 * auVar37._0_4_;
              auVar149 = vrsqrtss_avx(auVar150,auVar150);
              fVar245 = auVar150._0_4_;
              fVar181 = auVar149._0_4_;
              fVar181 = fVar181 * 1.5 + fVar245 * -0.5 * fVar181 * fVar181 * fVar181;
              if (fVar245 < 0.0) {
                local_a20._0_16_ = auVar119;
                local_a40._0_4_ = fVar223;
                local_a60._0_4_ = fVar244;
                local_a80._0_4_ = fVar181;
                fVar245 = sqrtf(fVar245);
                uVar107 = extraout_RAX_06;
                fVar181 = (float)local_a80._0_4_;
                fVar223 = (float)local_a40._0_4_;
                fVar244 = (float)local_a60._0_4_;
                auVar119 = local_a20._0_16_;
              }
              else {
                auVar149 = vsqrtss_avx(auVar150,auVar150);
                fVar245 = auVar149._0_4_;
              }
              auVar332 = ZEXT1664(auVar252);
              auVar38 = vpermilps_avx(_local_ae0,0xff);
              auVar9 = vshufps_avx(auVar379,auVar379,0xff);
              fVar223 = fVar223 * fVar181 - auVar9._0_4_;
              auVar256._0_8_ = auVar37._0_8_ ^ 0x8000000080000000;
              auVar256._8_4_ = auVar37._8_4_ ^ 0x80000000;
              auVar256._12_4_ = auVar37._12_4_ ^ 0x80000000;
              auVar275._0_4_ = -fVar223;
              auVar275._4_4_ = 0x80000000;
              auVar275._8_4_ = 0x80000000;
              auVar275._12_4_ = 0x80000000;
              auVar149 = vinsertps_avx(auVar275,ZEXT416((uint)(fVar244 * fVar181)),0x1c);
              auVar37 = vmovsldup_avx(ZEXT416((uint)(fVar177 * fVar244 * fVar181 -
                                                    auVar37._0_4_ * fVar223)));
              auVar149 = vdivps_avx(auVar149,auVar37);
              auVar150 = vinsertps_avx(ZEXT416((uint)fVar177),auVar256,0x10);
              auVar150 = vdivps_avx(auVar150,auVar37);
              auVar37 = vmovsldup_avx(auVar119);
              auVar121 = ZEXT416((uint)(fVar245 - auVar38._0_4_));
              auVar38 = vmovsldup_avx(auVar121);
              auVar202._0_4_ = auVar37._0_4_ * auVar149._0_4_ + auVar38._0_4_ * auVar150._0_4_;
              auVar202._4_4_ = auVar37._4_4_ * auVar149._4_4_ + auVar38._4_4_ * auVar150._4_4_;
              auVar202._8_4_ = auVar37._8_4_ * auVar149._8_4_ + auVar38._8_4_ * auVar150._8_4_;
              auVar202._12_4_ = auVar37._12_4_ * auVar149._12_4_ + auVar38._12_4_ * auVar150._12_4_;
              auVar149 = vsubps_avx(auVar198,auVar202);
              auVar368 = ZEXT1664(auVar149);
              auVar203._8_4_ = 0x7fffffff;
              auVar203._0_8_ = 0x7fffffff7fffffff;
              auVar203._12_4_ = 0x7fffffff;
              auVar198 = vandps_avx(auVar119,auVar203);
              if (auVar198._0_4_ < fVar142) {
                auVar234._8_4_ = 0x7fffffff;
                auVar234._0_8_ = 0x7fffffff7fffffff;
                auVar234._12_4_ = 0x7fffffff;
                auVar198 = vandps_avx(auVar121,auVar234);
                if (auVar198._0_4_ <
                    (float)local_900._0_4_ * 1.9073486e-06 + auVar227._0_4_ + fVar142) {
                  bVar114 = uVar112 < 5;
                  fVar142 = auVar149._0_4_ + (float)local_980._0_4_;
                  if ((fVar7 <= fVar142) &&
                     (fVar177 = *(float *)(ray + k * 4 + 0x100), fVar142 <= fVar177)) {
                    auVar198 = vmovshdup_avx(auVar149);
                    bVar105 = 0;
                    if (0.0 <= auVar198._0_4_) {
                      if (1.0 < auVar198._0_4_) goto LAB_00b3f11f;
                      auVar198 = vrsqrtss_avx(auVar252,auVar252);
                      fVar181 = auVar198._0_4_;
                      pGVar19 = (context->scene->geometries).items[local_b18].ptr;
                      if ((pGVar19->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (bVar105 = 1, pGVar19->occlusionFilterN == (RTCFilterFunctionN)0x0))
                        goto LAB_00b3f11f;
                        auVar198 = ZEXT416((uint)(fVar181 * 1.5 +
                                                 fVar243 * -0.5 * fVar181 * fVar181 * fVar181));
                        auVar198 = vshufps_avx(auVar198,auVar198,0);
                        auVar204._0_4_ = auVar198._0_4_ * (float)local_b60._0_4_;
                        auVar204._4_4_ = auVar198._4_4_ * (float)local_b60._4_4_;
                        auVar204._8_4_ = auVar198._8_4_ * fStack_b58;
                        auVar204._12_4_ = auVar198._12_4_ * fStack_b54;
                        auVar157._0_4_ = auVar379._0_4_ + auVar9._0_4_ * auVar204._0_4_;
                        auVar157._4_4_ = auVar379._4_4_ + auVar9._4_4_ * auVar204._4_4_;
                        auVar157._8_4_ = auVar379._8_4_ + auVar9._8_4_ * auVar204._8_4_;
                        auVar157._12_4_ = auVar379._12_4_ + auVar9._12_4_ * auVar204._12_4_;
                        auVar198 = vshufps_avx(auVar204,auVar204,0xc9);
                        auVar227 = vshufps_avx(auVar379,auVar379,0xc9);
                        auVar205._0_4_ = auVar227._0_4_ * auVar204._0_4_;
                        auVar205._4_4_ = auVar227._4_4_ * auVar204._4_4_;
                        auVar205._8_4_ = auVar227._8_4_ * auVar204._8_4_;
                        auVar205._12_4_ = auVar227._12_4_ * auVar204._12_4_;
                        auVar235._0_4_ = auVar379._0_4_ * auVar198._0_4_;
                        auVar235._4_4_ = auVar379._4_4_ * auVar198._4_4_;
                        auVar235._8_4_ = auVar379._8_4_ * auVar198._8_4_;
                        auVar235._12_4_ = auVar379._12_4_ * auVar198._12_4_;
                        auVar119 = vsubps_avx(auVar235,auVar205);
                        auVar198 = vshufps_avx(auVar119,auVar119,0xc9);
                        auVar227 = vshufps_avx(auVar157,auVar157,0xc9);
                        auVar236._0_4_ = auVar227._0_4_ * auVar198._0_4_;
                        auVar236._4_4_ = auVar227._4_4_ * auVar198._4_4_;
                        auVar236._8_4_ = auVar227._8_4_ * auVar198._8_4_;
                        auVar236._12_4_ = auVar227._12_4_ * auVar198._12_4_;
                        auVar198 = vshufps_avx(auVar119,auVar119,0xd2);
                        auVar158._0_4_ = auVar157._0_4_ * auVar198._0_4_;
                        auVar158._4_4_ = auVar157._4_4_ * auVar198._4_4_;
                        auVar158._8_4_ = auVar157._8_4_ * auVar198._8_4_;
                        auVar158._12_4_ = auVar157._12_4_ * auVar198._12_4_;
                        auVar198 = vsubps_avx(auVar236,auVar158);
                        pRVar23 = context->user;
                        local_740 = vshufps_avx(auVar149,auVar149,0x55);
                        auStack_790 = vshufps_avx(auVar198,auVar198,0x55);
                        local_780 = vshufps_avx(auVar198,auVar198,0xaa);
                        local_760 = vshufps_avx(auVar198,auVar198,0);
                        local_7a0 = (RTCHitN  [16])auStack_790;
                        local_720 = ZEXT832(0) << 0x20;
                        local_700 = local_620._0_8_;
                        uStack_6f8 = local_620._8_8_;
                        uStack_6f0 = local_620._16_8_;
                        uStack_6e8 = local_620._24_8_;
                        local_6e0 = local_600;
                        auVar206 = vcmpps_avx(local_600,local_600,0xf);
                        local_b20[1] = auVar206;
                        *local_b20 = auVar206;
                        local_6c0 = pRVar23->instID[0];
                        local_6a0 = pRVar23->instPrimID[0];
                        *(float *)(ray + k * 4 + 0x100) = fVar142;
                        local_ba0 = *local_b28;
                        local_b90 = *local_b30;
                        local_b10.valid = (int *)local_ba0;
                        local_b10.geometryUserPtr = pGVar19->userPtr;
                        local_b10.context = context->user;
                        local_b10.hit = local_7a0;
                        local_b10.N = 8;
                        local_b10.ray = (RTCRayN *)ray;
                        local_770 = local_780;
                        local_750 = local_760;
                        local_730 = local_740;
                        uStack_6bc = local_6c0;
                        uStack_6b8 = local_6c0;
                        uStack_6b4 = local_6c0;
                        uStack_6b0 = local_6c0;
                        uStack_6ac = local_6c0;
                        uStack_6a8 = local_6c0;
                        uStack_6a4 = local_6c0;
                        uStack_69c = local_6a0;
                        uStack_698 = local_6a0;
                        uStack_694 = local_6a0;
                        uStack_690 = local_6a0;
                        uStack_68c = local_6a0;
                        uStack_688 = local_6a0;
                        uStack_684 = local_6a0;
                        if (pGVar19->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar332 = ZEXT1664(auVar252);
                          auVar368 = ZEXT1664(auVar149);
                          (*pGVar19->occlusionFilterN)(&local_b10);
                        }
                        auVar198 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                        auVar252 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                        auVar214._16_16_ = auVar252;
                        auVar214._0_16_ = auVar198;
                        auVar206 = _DAT_01f7b020 & ~auVar214;
                        if ((((((((auVar206 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar206 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar206 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar206 >> 0x7f,0) != '\0')
                              || (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar206 >> 0xbf,0) != '\0') ||
                            (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar206[0x1f] < '\0') {
                          p_Var24 = context->args->filter;
                          if ((p_Var24 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar19->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar332 = ZEXT1664(auVar332._0_16_);
                            auVar368 = ZEXT1664(auVar368._0_16_);
                            (*p_Var24)(&local_b10);
                          }
                          auVar198 = vpcmpeqd_avx(local_ba0,ZEXT816(0) << 0x40);
                          auVar252 = vpcmpeqd_avx(local_b90,ZEXT816(0) << 0x40);
                          auVar137._16_16_ = auVar252;
                          auVar137._0_16_ = auVar198;
                          auVar174._8_4_ = 0xff800000;
                          auVar174._0_8_ = 0xff800000ff800000;
                          auVar174._12_4_ = 0xff800000;
                          auVar174._16_4_ = 0xff800000;
                          auVar174._20_4_ = 0xff800000;
                          auVar174._24_4_ = 0xff800000;
                          auVar174._28_4_ = 0xff800000;
                          auVar206 = vblendvps_avx(auVar174,*(undefined1 (*) [32])
                                                             (local_b10.ray + 0x100),auVar137);
                          *(undefined1 (*) [32])(local_b10.ray + 0x100) = auVar206;
                          auVar206 = _DAT_01f7b020 & ~auVar137;
                          if ((((((((auVar206 >> 0x1f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0 ||
                                   (auVar206 >> 0x3f & (undefined1  [32])0x1) !=
                                   (undefined1  [32])0x0) ||
                                  (auVar206 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(auVar206 >> 0x7f,0) != '\0') ||
                                (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                               || SUB321(auVar206 >> 0xbf,0) != '\0') ||
                              (auVar206 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0)
                              || auVar206[0x1f] < '\0') {
                            bVar105 = 1;
                            goto LAB_00b3f11f;
                          }
                        }
                        *(float *)(ray + k * 4 + 0x100) = fVar177;
                      }
                      bVar105 = 0;
                      goto LAB_00b3f11f;
                    }
                  }
                  bVar105 = 0;
                  goto LAB_00b3f11f;
                }
              }
              uVar112 = uVar112 + 1;
            }
            bVar114 = false;
LAB_00b3f11f:
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar341._4_4_ = uVar8;
            auVar341._0_4_ = uVar8;
            auVar341._8_4_ = uVar8;
            auVar341._12_4_ = uVar8;
            auVar341._16_4_ = uVar8;
            auVar341._20_4_ = uVar8;
            auVar341._24_4_ = uVar8;
            auVar341._28_4_ = uVar8;
            auVar342 = ZEXT3264(auVar341);
            bVar113 = bVar113 | bVar114 & bVar105;
            auVar206 = vcmpps_avx(_local_c00,auVar341,2);
            local_4a0 = vandps_avx(auVar206,local_4a0);
          }
          auVar206 = vandps_avx(local_800,local_7e0);
          auVar25 = vandps_avx(_local_960,_local_940);
          auVar215._0_4_ = (float)local_9c0._0_4_ + local_460._0_4_;
          auVar215._4_4_ = (float)local_9c0._4_4_ + local_460._4_4_;
          auVar215._8_4_ = fStack_9b8 + local_460._8_4_;
          auVar215._12_4_ = fStack_9b4 + local_460._12_4_;
          auVar215._16_4_ = fStack_9b0 + local_460._16_4_;
          auVar215._20_4_ = fStack_9ac + local_460._20_4_;
          auVar215._24_4_ = fStack_9a8 + local_460._24_4_;
          auVar215._28_4_ = fStack_9a4 + local_460._28_4_;
          auVar198 = vshufps_avx(auVar342._0_16_,auVar342._0_16_,0);
          auVar262._16_16_ = auVar198;
          auVar262._0_16_ = auVar198;
          auVar26 = vcmpps_avx(auVar215,auVar262,2);
          auVar206 = vandps_avx(auVar26,auVar206);
          auVar284._0_4_ = (float)local_9c0._0_4_ + local_420._0_4_;
          auVar284._4_4_ = (float)local_9c0._4_4_ + local_420._4_4_;
          auVar284._8_4_ = fStack_9b8 + local_420._8_4_;
          auVar284._12_4_ = fStack_9b4 + local_420._12_4_;
          auVar284._16_4_ = fStack_9b0 + local_420._16_4_;
          auVar284._20_4_ = fStack_9ac + local_420._20_4_;
          auVar284._24_4_ = fStack_9a8 + local_420._24_4_;
          auVar284._28_4_ = fStack_9a4 + local_420._28_4_;
          auVar26 = vcmpps_avx(auVar284,auVar262,2);
          auVar264 = ZEXT3264(auVar26);
          auVar25 = vandps_avx(auVar26,auVar25);
          auVar25 = vorps_avx(auVar206,auVar25);
          fVar143 = (float)local_9c0._0_4_;
          fVar179 = (float)local_9c0._4_4_;
          fVar183 = fStack_9b8;
          fVar186 = fStack_9b4;
          fVar188 = fStack_9b0;
          fVar190 = fStack_9ac;
          fVar192 = fStack_9a8;
          fVar292 = fStack_9a4;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar25 >> 0x7f,0) != '\0') ||
                (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar25 >> 0xbf,0) != '\0') ||
              (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar25[0x1f] < '\0') {
            uVar112 = (ulong)uVar110;
            *(undefined1 (*) [32])(auStack_180 + uVar112 * 0x60) = auVar25;
            auVar206 = vblendvps_avx(_local_420,_local_460,auVar206);
            *(undefined1 (*) [32])(auStack_160 + uVar112 * 0x60) = auVar206;
            uVar107 = vmovlps_avx(local_7b0);
            (&uStack_140)[uVar112 * 0xc] = uVar107;
            auStack_138[uVar112 * 0x18] = local_d64 + 1;
            uVar110 = uVar110 + 1;
          }
          goto LAB_00b3dab4;
        }
      }
      auVar332 = ZEXT3264(auVar329);
    }
LAB_00b3dab4:
    do {
      uVar109 = uVar110;
      if (uVar109 == 0) {
        if (bVar113 != 0) goto LAB_00b3f6b2;
        uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar138._4_4_ = uVar8;
        auVar138._0_4_ = uVar8;
        auVar138._8_4_ = uVar8;
        auVar138._12_4_ = uVar8;
        auVar138._16_4_ = uVar8;
        auVar138._20_4_ = uVar8;
        auVar138._24_4_ = uVar8;
        auVar138._28_4_ = uVar8;
        auVar206 = vcmpps_avx(local_380,auVar138,2);
        uVar110 = vmovmskps_avx(auVar206);
        uVar110 = (uint)local_968 - 1 & (uint)local_968 & uVar110;
        goto LAB_00b3c888;
      }
      uVar107 = (ulong)(uVar109 - 1);
      lVar108 = uVar107 * 0x60;
      auVar206 = *(undefined1 (*) [32])(auStack_160 + lVar108);
      auVar131._0_4_ = fVar143 + auVar206._0_4_;
      auVar131._4_4_ = fVar179 + auVar206._4_4_;
      auVar131._8_4_ = fVar183 + auVar206._8_4_;
      auVar131._12_4_ = fVar186 + auVar206._12_4_;
      auVar131._16_4_ = fVar188 + auVar206._16_4_;
      auVar131._20_4_ = fVar190 + auVar206._20_4_;
      auVar131._24_4_ = fVar192 + auVar206._24_4_;
      auVar131._28_4_ = fVar292 + auVar206._28_4_;
      uVar8 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar241._4_4_ = uVar8;
      auVar241._0_4_ = uVar8;
      auVar241._8_4_ = uVar8;
      auVar241._12_4_ = uVar8;
      auVar241._16_4_ = uVar8;
      auVar241._20_4_ = uVar8;
      auVar241._24_4_ = uVar8;
      auVar241._28_4_ = uVar8;
      auVar25 = vcmpps_avx(auVar131,auVar241,2);
      _local_7a0 = vandps_avx(auVar25,*(undefined1 (*) [32])(auStack_180 + lVar108));
      auVar25 = *(undefined1 (*) [32])(auStack_180 + lVar108) & auVar25;
      uVar110 = uVar109 - 1;
    } while ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                  (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                SUB321(auVar25 >> 0x7f,0) == '\0') &&
               (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              SUB321(auVar25 >> 0xbf,0) == '\0') &&
             (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             -1 < auVar25[0x1f]);
    auVar210._8_4_ = 0x7f800000;
    auVar210._0_8_ = 0x7f8000007f800000;
    auVar210._12_4_ = 0x7f800000;
    auVar210._16_4_ = 0x7f800000;
    auVar210._20_4_ = 0x7f800000;
    auVar210._24_4_ = 0x7f800000;
    auVar210._28_4_ = 0x7f800000;
    auVar206 = vblendvps_avx(auVar210,auVar206,_local_7a0);
    auVar25 = vshufps_avx(auVar206,auVar206,0xb1);
    auVar25 = vminps_avx(auVar206,auVar25);
    auVar26 = vshufpd_avx(auVar25,auVar25,5);
    auVar25 = vminps_avx(auVar25,auVar26);
    auVar26 = vperm2f128_avx(auVar25,auVar25,1);
    auVar25 = vminps_avx(auVar25,auVar26);
    auVar25 = vcmpps_avx(auVar206,auVar25,0);
    auVar26 = _local_7a0 & auVar25;
    auVar206 = _local_7a0;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar206 = vandps_avx(auVar25,_local_7a0);
    }
    auVar148._8_8_ = 0;
    auVar148._0_8_ = (&uStack_140)[uVar107 * 0xc];
    local_d64 = auStack_138[uVar107 * 0x18];
    uVar110 = vmovmskps_avx(auVar206);
    uVar106 = 0;
    if (uVar110 != 0) {
      for (; (uVar110 >> uVar106 & 1) == 0; uVar106 = uVar106 + 1) {
      }
    }
    *(undefined4 *)(local_7a0 + (ulong)uVar106 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar108) = _local_7a0;
    uVar110 = uVar109 - 1;
    if ((((((((_local_7a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_7a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_7a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_7a0 >> 0x7f,0) != '\0') ||
          (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_7a0 >> 0xbf,0) != '\0') ||
        (_local_7a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_7a0[0x1f] < '\0') {
      uVar110 = uVar109;
    }
    auVar198 = vshufps_avx(auVar148,auVar148,0);
    auVar252 = vshufps_avx(auVar148,auVar148,0x55);
    auVar252 = vsubps_avx(auVar252,auVar198);
    local_460._4_4_ = auVar198._4_4_ + auVar252._4_4_ * 0.14285715;
    local_460._0_4_ = auVar198._0_4_ + auVar252._0_4_ * 0.0;
    fStack_458 = auVar198._8_4_ + auVar252._8_4_ * 0.2857143;
    fStack_454 = auVar198._12_4_ + auVar252._12_4_ * 0.42857146;
    fStack_450 = auVar198._0_4_ + auVar252._0_4_ * 0.5714286;
    fStack_44c = auVar198._4_4_ + auVar252._4_4_ * 0.71428573;
    fStack_448 = auVar198._8_4_ + auVar252._8_4_ * 0.8571429;
    fStack_444 = auVar198._12_4_ + auVar252._12_4_;
    local_7b0._8_8_ = 0;
    local_7b0._0_8_ = *(ulong *)(local_460 + (ulong)uVar106 * 4);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }